

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize_x86.cpp
# Opt level: O1

void ncnn::requantize(int *intptr,char *ptr,Mat *scale_in_data,Mat *bias_data,Mat *scale_out_data,
                     int activation_type,Mat *activation_params,int elemcount,int elempack)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  float *pfVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  ulong uVar25;
  undefined1 uVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  long lVar30;
  uint uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  float fVar65;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [64];
  float fVar86;
  float fVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar113;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  float fVar111;
  float fVar112;
  undefined1 auVar110 [64];
  undefined1 auVar135 [28];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar114 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar115 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar171 [28];
  undefined1 auVar158 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar159 [16];
  undefined1 auVar194 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar207 [36];
  float fVar208;
  v4sf one;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar221 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar234 [32];
  float fVar243;
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  float fVar241;
  float fVar242;
  float fVar244;
  float fVar245;
  float fVar246;
  undefined1 in_ZMM8 [64];
  undefined1 auVar247 [36];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [28];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar260 [16];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar259 [16];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar267 [32];
  undefined1 auVar271 [16];
  undefined1 auVar274 [28];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar281 [32];
  undefined1 auVar272 [16];
  undefined1 auVar283 [32];
  undefined1 auVar273 [16];
  undefined1 in_ZMM11 [64];
  undefined1 auVar285 [64];
  undefined1 auVar287 [16];
  float fVar286;
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar288 [16];
  float fVar310;
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar289 [16];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar290 [16];
  float fVar308;
  float fVar309;
  float fVar311;
  float fVar312;
  float fVar313;
  undefined1 in_ZMM12 [64];
  undefined1 auVar307 [64];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar319 [28];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar316 [16];
  undefined1 auVar325 [32];
  undefined1 auVar317 [16];
  undefined1 auVar327 [32];
  undefined1 auVar329 [32];
  undefined1 auVar318 [16];
  undefined1 auVar331 [32];
  undefined1 in_ZMM13 [64];
  undefined1 auVar332 [64];
  undefined1 auVar333 [16];
  undefined1 auVar335 [32];
  float fVar348;
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar334 [16];
  undefined1 auVar343 [32];
  float fVar345;
  float fVar346;
  float fVar347;
  undefined1 in_ZMM14 [64];
  undefined1 auVar344 [64];
  float fVar349;
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  float fVar354;
  float fVar355;
  float fVar356;
  float fVar357;
  float fVar358;
  float fVar359;
  undefined1 auVar352 [64];
  undefined1 auVar353 [64];
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  undefined1 auVar157 [32];
  undefined1 auVar185 [32];
  undefined1 auVar195 [32];
  undefined1 auVar206 [32];
  undefined1 auVar220 [32];
  undefined1 auVar222 [32];
  undefined1 auVar225 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar233 [32];
  undefined1 auVar237 [32];
  undefined1 auVar266 [32];
  undefined1 auVar280 [32];
  undefined1 auVar282 [32];
  undefined1 auVar284 [32];
  undefined1 auVar294 [32];
  undefined1 auVar300 [32];
  undefined1 auVar306 [32];
  undefined1 auVar320 [32];
  undefined1 auVar324 [32];
  undefined1 auVar328 [32];
  undefined1 auVar330 [32];
  undefined1 auVar326 [32];
  
  fVar1 = *(float *)*(undefined1 (*) [32])scale_in_data->data;
  local_d8._4_4_ = fVar1;
  local_d8._0_4_ = fVar1;
  fStack_d0 = fVar1;
  fStack_cc = fVar1;
  fStack_c8 = fVar1;
  fStack_c4 = fVar1;
  fStack_c0 = fVar1;
  if ((elempack == 8) && (1 < scale_in_data->w)) {
    _local_d8 = SUB3228(*(undefined1 (*) [32])scale_in_data->data,0);
  }
  fVar2 = *(float *)*(undefined1 (*) [32])scale_out_data->data;
  auVar66._4_4_ = fVar2;
  auVar66._0_4_ = fVar2;
  auVar66._8_4_ = fVar2;
  auVar66._12_4_ = fVar2;
  auVar66._16_4_ = fVar2;
  auVar66._20_4_ = fVar2;
  auVar66._24_4_ = fVar2;
  auVar66._28_4_ = fVar2;
  if (elempack == 8) {
    auVar43 = ZEXT3264(auVar66);
    if (1 < scale_out_data->w) {
      auVar43 = ZEXT3264(*(undefined1 (*) [32])scale_out_data->data);
    }
  }
  else {
    auVar43 = ZEXT3264(auVar66);
  }
  auVar135 = auVar43._0_28_;
  uVar31 = elemcount * elempack;
  auVar66 = auVar43._0_32_;
  if (bias_data->w == 0) {
    uVar27 = 0;
    fVar86 = auVar43._4_4_;
    fVar111 = auVar43._8_4_;
    fVar112 = auVar43._12_4_;
    fVar113 = auVar43._16_4_;
    fVar65 = auVar43._20_4_;
    fVar345 = auVar43._24_4_;
    fVar87 = auVar43._0_4_;
    if (0xf < (int)uVar31) {
      uVar27 = uVar31 & 0x7ffffff0;
      iVar29 = 0xf;
      in_ZMM13 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar70._8_4_ = 0x3f000000;
      auVar70._0_8_ = 0x3f0000003f000000;
      auVar70._12_4_ = 0x3f000000;
      auVar70._16_4_ = 0x3f000000;
      auVar70._20_4_ = 0x3f000000;
      auVar70._24_4_ = 0x3f000000;
      auVar70._28_4_ = 0x3f000000;
      auVar43 = ZEXT1664(CONCAT412(0x7f007f,CONCAT48(0x7f007f,0x7f007f007f007f)));
      in_ZMM7 = ZEXT1664(CONCAT412(0xff81ff81,CONCAT48(0xff81ff81,0xff81ff81ff81ff81)));
      auVar256._8_4_ = 0x3f800000;
      auVar256._0_8_ = 0x3f8000003f800000;
      auVar256._12_4_ = 0x3f800000;
      auVar256._16_4_ = 0x3f800000;
      auVar256._20_4_ = 0x3f800000;
      auVar256._24_4_ = 0x3f800000;
      auVar256._28_4_ = 0x3f800000;
      do {
        auVar247 = in_ZMM11._28_36_;
        auVar66 = vcvtdq2ps_avx(*(undefined1 (*) [32])intptr);
        fVar208 = auVar66._0_4_ * (float)local_d8._0_4_;
        fVar241 = auVar66._4_4_ * (float)local_d8._4_4_;
        auVar5._4_4_ = fVar241;
        auVar5._0_4_ = fVar208;
        fVar242 = auVar66._8_4_ * fStack_d0;
        auVar5._8_4_ = fVar242;
        fVar243 = auVar66._12_4_ * fStack_cc;
        auVar5._12_4_ = fVar243;
        fVar244 = auVar66._16_4_ * fStack_c8;
        auVar5._16_4_ = fVar244;
        fVar245 = auVar66._20_4_ * fStack_c4;
        auVar5._20_4_ = fVar245;
        uVar28 = auVar66._28_4_;
        fVar246 = auVar66._24_4_ * fStack_c0;
        auVar5._24_4_ = fVar246;
        auVar5._28_4_ = uVar28;
        auVar110 = ZEXT3264(auVar5);
        switch(activation_type + -1) {
        case 0:
          auVar66 = vmaxps_avx(auVar5,_DAT_005f31a0);
          auVar110 = ZEXT3264(auVar66);
          break;
        case 1:
          auVar66 = vmaxps_avx(auVar5,ZEXT1632(ZEXT816(0) << 0x40));
          auVar247 = ZEXT436((uint)auVar66._28_4_);
          auVar5 = vminps_avx(auVar5,ZEXT1632(ZEXT816(0) << 0x40));
          fVar208 = *activation_params->data;
          in_ZMM12 = ZEXT3264(CONCAT428(fVar208,CONCAT424(fVar208,CONCAT420(fVar208,CONCAT416(
                                                  fVar208,CONCAT412(fVar208,CONCAT48(fVar208,
                                                  CONCAT44(fVar208,fVar208))))))));
          auVar110 = ZEXT3264(CONCAT428(auVar5._28_4_ + auVar66._28_4_,
                                        CONCAT424(fVar208 * auVar5._24_4_ + auVar66._24_4_,
                                                  CONCAT420(fVar208 * auVar5._20_4_ + auVar66._20_4_
                                                            ,CONCAT416(fVar208 * auVar5._16_4_ +
                                                                       auVar66._16_4_,
                                                                       CONCAT412(fVar208 * auVar5.
                                                  _12_4_ + auVar66._12_4_,
                                                  CONCAT48(fVar208 * auVar5._8_4_ + auVar66._8_4_,
                                                           CONCAT44(fVar208 * auVar5._4_4_ +
                                                                    auVar66._4_4_,
                                                                    fVar208 * auVar5._0_4_ +
                                                                    auVar66._0_4_))))))));
          break;
        case 2:
          uVar28 = *activation_params->data;
          auVar278._4_4_ = uVar28;
          auVar278._0_4_ = uVar28;
          auVar278._8_4_ = uVar28;
          auVar278._12_4_ = uVar28;
          auVar278._16_4_ = uVar28;
          auVar278._20_4_ = uVar28;
          auVar278._24_4_ = uVar28;
          auVar278._28_4_ = uVar28;
          auVar247 = ZEXT436(uVar28);
          uVar28 = *(uint *)((long)activation_params->data + 4);
          auVar298._4_4_ = uVar28;
          auVar298._0_4_ = uVar28;
          auVar298._8_4_ = uVar28;
          auVar298._12_4_ = uVar28;
          auVar298._16_4_ = uVar28;
          auVar298._20_4_ = uVar28;
          auVar298._24_4_ = uVar28;
          auVar298._28_4_ = uVar28;
          in_ZMM12 = ZEXT3264(auVar298);
          auVar66 = vmaxps_avx(auVar5,auVar278);
          auVar66 = vminps_avx(auVar66,auVar298);
          auVar110 = ZEXT3264(auVar66);
          break;
        case 3:
          auVar235._0_4_ = (uint)fVar208 ^ in_ZMM13._0_4_;
          auVar235._4_4_ = (uint)fVar241 ^ in_ZMM13._4_4_;
          auVar235._8_4_ = (uint)fVar242 ^ in_ZMM13._8_4_;
          auVar235._12_4_ = (uint)fVar243 ^ in_ZMM13._12_4_;
          auVar235._16_4_ = (uint)fVar244 ^ in_ZMM13._16_4_;
          auVar235._20_4_ = (uint)fVar245 ^ in_ZMM13._20_4_;
          auVar235._24_4_ = (uint)fVar246 ^ in_ZMM13._24_4_;
          auVar235._28_4_ = uVar28 ^ in_ZMM13._28_4_;
          auVar58._8_4_ = 0x42b0c0a5;
          auVar58._0_8_ = 0x42b0c0a542b0c0a5;
          auVar58._12_4_ = 0x42b0c0a5;
          auVar58._16_4_ = 0x42b0c0a5;
          auVar58._20_4_ = 0x42b0c0a5;
          auVar58._24_4_ = 0x42b0c0a5;
          auVar58._28_4_ = 0x42b0c0a5;
          auVar66 = vminps_avx(auVar235,auVar58);
          auVar59._8_4_ = 0xc2b0c0a5;
          auVar59._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar59._12_4_ = 0xc2b0c0a5;
          auVar59._16_4_ = 0xc2b0c0a5;
          auVar59._20_4_ = 0xc2b0c0a5;
          auVar59._24_4_ = 0xc2b0c0a5;
          auVar59._28_4_ = 0xc2b0c0a5;
          auVar5 = vmaxps_avx(auVar66,auVar59);
          auVar279._0_4_ = auVar5._0_4_ * 1.442695 + 0.5;
          auVar279._4_4_ = auVar5._4_4_ * 1.442695 + 0.5;
          auVar279._8_4_ = auVar5._8_4_ * 1.442695 + 0.5;
          auVar279._12_4_ = auVar5._12_4_ * 1.442695 + 0.5;
          auVar279._16_4_ = auVar5._16_4_ * 1.442695 + 0.5;
          auVar279._20_4_ = auVar5._20_4_ * 1.442695 + 0.5;
          auVar279._24_4_ = auVar5._24_4_ * 1.442695 + 0.5;
          auVar279._28_4_ = in_ZMM11._28_4_ + 0.5;
          auVar148 = vroundps_avx(auVar279,1);
          auVar66 = vcmpps_avx(auVar279,auVar148,1);
          auVar66 = vandps_avx(auVar66,auVar256);
          auVar66 = vsubps_avx(auVar148,auVar66);
          fVar208 = auVar5._0_4_ + auVar66._0_4_ * -0.6931472;
          fVar241 = auVar5._4_4_ + auVar66._4_4_ * -0.6931472;
          fVar242 = auVar5._8_4_ + auVar66._8_4_ * -0.6931472;
          fVar243 = auVar5._12_4_ + auVar66._12_4_ * -0.6931472;
          fVar244 = auVar5._16_4_ + auVar66._16_4_ * -0.6931472;
          fVar245 = auVar5._20_4_ + auVar66._20_4_ * -0.6931472;
          fVar246 = auVar5._24_4_ + auVar66._24_4_ * -0.6931472;
          auVar43 = ZEXT1664(CONCAT412(0x7f007f,CONCAT48(0x7f007f,0x7f007f007f007f)));
          in_ZMM13 = ZEXT3264(CONCAT428(0x80000000,
                                        CONCAT424(0x80000000,
                                                  CONCAT420(0x80000000,
                                                            CONCAT416(0x80000000,
                                                                      CONCAT412(0x80000000,
                                                                                CONCAT48(0x80000000,
                                                                                                                                                                                  
                                                  0x8000000080000000)))))));
          auVar271._0_4_ = (int)auVar66._0_4_;
          auVar271._4_4_ = (int)auVar66._4_4_;
          auVar271._8_4_ = (int)auVar66._8_4_;
          auVar271._12_4_ = (int)auVar66._12_4_;
          auVar280._16_4_ = (int)auVar66._16_4_;
          auVar280._0_16_ = auVar271;
          auVar280._20_4_ = (int)auVar66._20_4_;
          auVar280._24_4_ = (int)auVar66._24_4_;
          auVar280._28_4_ = (int)auVar66._28_4_;
          auVar333 = vpslld_avx(auVar271,0x17);
          auVar315 = vpslld_avx(auVar280._16_16_,0x17);
          auVar44._8_4_ = 0x3f800000;
          auVar44._0_8_ = 0x3f8000003f800000;
          auVar44._12_4_ = 0x3f800000;
          auVar315 = vpaddd_avx(auVar315,auVar44);
          auVar333 = vpaddd_avx(auVar333,auVar44);
          in_ZMM12 = ZEXT1664(auVar333);
          auVar247 = ZEXT436(auVar315._12_4_);
          auVar236._0_4_ =
               (fVar208 + 1.0 +
               fVar208 * fVar208 *
               (((((fVar208 * 0.00019875691 + 0.0013981999) * fVar208 + 0.008333452) * fVar208 +
                 0.041665796) * fVar208 + 0.16666666) * fVar208 + 0.5)) * auVar333._0_4_ + 1.0;
          auVar236._4_4_ =
               (fVar241 + 1.0 +
               fVar241 * fVar241 *
               (((((fVar241 * 0.00019875691 + 0.0013981999) * fVar241 + 0.008333452) * fVar241 +
                 0.041665796) * fVar241 + 0.16666666) * fVar241 + 0.5)) * auVar333._4_4_ + 1.0;
          auVar236._8_4_ =
               (fVar242 + 1.0 +
               fVar242 * fVar242 *
               (((((fVar242 * 0.00019875691 + 0.0013981999) * fVar242 + 0.008333452) * fVar242 +
                 0.041665796) * fVar242 + 0.16666666) * fVar242 + 0.5)) * auVar333._8_4_ + 1.0;
          auVar236._12_4_ =
               (fVar243 + 1.0 +
               fVar243 * fVar243 *
               (((((fVar243 * 0.00019875691 + 0.0013981999) * fVar243 + 0.008333452) * fVar243 +
                 0.041665796) * fVar243 + 0.16666666) * fVar243 + 0.5)) * auVar333._12_4_ + 1.0;
          auVar236._16_4_ =
               (fVar244 + 1.0 +
               fVar244 * fVar244 *
               (((((fVar244 * 0.00019875691 + 0.0013981999) * fVar244 + 0.008333452) * fVar244 +
                 0.041665796) * fVar244 + 0.16666666) * fVar244 + 0.5)) * auVar315._0_4_ + 1.0;
          auVar236._20_4_ =
               (fVar245 + 1.0 +
               fVar245 * fVar245 *
               (((((fVar245 * 0.00019875691 + 0.0013981999) * fVar245 + 0.008333452) * fVar245 +
                 0.041665796) * fVar245 + 0.16666666) * fVar245 + 0.5)) * auVar315._4_4_ + 1.0;
          auVar236._24_4_ =
               (fVar246 + 1.0 +
               fVar246 * fVar246 *
               (((((fVar246 * 0.00019875691 + 0.0013981999) * fVar246 + 0.008333452) * fVar246 +
                 0.041665796) * fVar246 + 0.16666666) * fVar246 + 0.5)) * auVar315._8_4_ + 1.0;
          auVar236._28_4_ = auVar5._28_4_ + auVar148._28_4_ + 1.0 + auVar148._28_4_ + 1.0;
          auVar66 = vdivps_avx(auVar256,auVar236);
          auVar110 = ZEXT3264(auVar66);
          break;
        case 4:
          auVar54._8_4_ = 0x42b0c0a5;
          auVar54._0_8_ = 0x42b0c0a542b0c0a5;
          auVar54._12_4_ = 0x42b0c0a5;
          auVar54._16_4_ = 0x42b0c0a5;
          auVar54._20_4_ = 0x42b0c0a5;
          auVar54._24_4_ = 0x42b0c0a5;
          auVar54._28_4_ = 0x42b0c0a5;
          auVar66 = vminps_avx(auVar5,auVar54);
          auVar55._8_4_ = 0xc2b0c0a5;
          auVar55._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar55._12_4_ = 0xc2b0c0a5;
          auVar55._16_4_ = 0xc2b0c0a5;
          auVar55._20_4_ = 0xc2b0c0a5;
          auVar55._24_4_ = 0xc2b0c0a5;
          auVar55._28_4_ = 0xc2b0c0a5;
          auVar5 = vmaxps_avx(auVar66,auVar55);
          auVar296._0_4_ = auVar5._0_4_ * 1.442695 + 0.5;
          auVar296._4_4_ = auVar5._4_4_ * 1.442695 + 0.5;
          auVar296._8_4_ = auVar5._8_4_ * 1.442695 + 0.5;
          auVar296._12_4_ = auVar5._12_4_ * 1.442695 + 0.5;
          auVar296._16_4_ = auVar5._16_4_ * 1.442695 + 0.5;
          auVar296._20_4_ = auVar5._20_4_ * 1.442695 + 0.5;
          auVar296._24_4_ = auVar5._24_4_ * 1.442695 + 0.5;
          auVar296._28_4_ = in_ZMM12._28_4_ + 0.5;
          auVar148 = vroundps_avx(auVar296,1);
          auVar66 = vcmpps_avx(auVar296,auVar148,1);
          auVar66 = vandps_avx(auVar66,auVar256);
          auVar66 = vsubps_avx(auVar148,auVar66);
          auVar6._4_4_ = auVar66._4_4_ * 0.6931472;
          auVar6._0_4_ = auVar66._0_4_ * 0.6931472;
          auVar6._8_4_ = auVar66._8_4_ * 0.6931472;
          auVar6._12_4_ = auVar66._12_4_ * 0.6931472;
          auVar6._16_4_ = auVar66._16_4_ * 0.6931472;
          auVar6._20_4_ = auVar66._20_4_ * 0.6931472;
          auVar6._24_4_ = auVar66._24_4_ * 0.6931472;
          auVar6._28_4_ = auVar148._28_4_;
          auVar5 = vsubps_avx(auVar5,auVar6);
          fVar346 = auVar5._0_4_;
          fVar347 = auVar5._4_4_;
          fVar348 = auVar5._8_4_;
          fVar349 = auVar5._12_4_;
          fVar354 = auVar5._16_4_;
          fVar355 = auVar5._20_4_;
          fVar356 = auVar5._24_4_;
          auVar333._0_4_ = (int)auVar66._0_4_;
          auVar333._4_4_ = (int)auVar66._4_4_;
          auVar333._8_4_ = (int)auVar66._8_4_;
          auVar333._12_4_ = (int)auVar66._12_4_;
          auVar297._16_4_ = (int)auVar66._16_4_;
          auVar297._0_16_ = auVar333;
          auVar297._20_4_ = (int)auVar66._20_4_;
          auVar297._24_4_ = (int)auVar66._24_4_;
          auVar297._28_4_ = (int)auVar66._28_4_;
          auVar333 = vpslld_avx(auVar333,0x17);
          auVar315 = vpslld_avx(auVar297._16_16_,0x17);
          auVar259._8_4_ = 0x3f800000;
          auVar259._0_8_ = 0x3f8000003f800000;
          auVar259._12_4_ = 0x3f800000;
          auVar315 = vpaddd_avx(auVar315,auVar259);
          auVar333 = vpaddd_avx(auVar333,auVar259);
          auVar275._0_4_ =
               (fVar346 + 1.0 +
               fVar346 * fVar346 *
               (((((fVar346 * 0.00019875691 + 0.0013981999) * fVar346 + 0.008333452) * fVar346 +
                 0.041665796) * fVar346 + 0.16666666) * fVar346 + 0.5)) * auVar333._0_4_ + 1.0;
          auVar275._4_4_ =
               (fVar347 + 1.0 +
               fVar347 * fVar347 *
               (((((fVar347 * 0.00019875691 + 0.0013981999) * fVar347 + 0.008333452) * fVar347 +
                 0.041665796) * fVar347 + 0.16666666) * fVar347 + 0.5)) * auVar333._4_4_ + 1.0;
          auVar275._8_4_ =
               (fVar348 + 1.0 +
               fVar348 * fVar348 *
               (((((fVar348 * 0.00019875691 + 0.0013981999) * fVar348 + 0.008333452) * fVar348 +
                 0.041665796) * fVar348 + 0.16666666) * fVar348 + 0.5)) * auVar333._8_4_ + 1.0;
          auVar275._12_4_ =
               (fVar349 + 1.0 +
               fVar349 * fVar349 *
               (((((fVar349 * 0.00019875691 + 0.0013981999) * fVar349 + 0.008333452) * fVar349 +
                 0.041665796) * fVar349 + 0.16666666) * fVar349 + 0.5)) * auVar333._12_4_ + 1.0;
          auVar275._16_4_ =
               (fVar354 + 1.0 +
               fVar354 * fVar354 *
               (((((fVar354 * 0.00019875691 + 0.0013981999) * fVar354 + 0.008333452) * fVar354 +
                 0.041665796) * fVar354 + 0.16666666) * fVar354 + 0.5)) * auVar315._0_4_ + 1.0;
          auVar275._20_4_ =
               (fVar355 + 1.0 +
               fVar355 * fVar355 *
               (((((fVar355 * 0.00019875691 + 0.0013981999) * fVar355 + 0.008333452) * fVar355 +
                 0.041665796) * fVar355 + 0.16666666) * fVar355 + 0.5)) * auVar315._4_4_ + 1.0;
          auVar275._24_4_ =
               (fVar356 + 1.0 +
               fVar356 * fVar356 *
               (((((fVar356 * 0.00019875691 + 0.0013981999) * fVar356 + 0.008333452) * fVar356 +
                 0.041665796) * fVar356 + 0.16666666) * fVar356 + 0.5)) * auVar315._8_4_ + 1.0;
          auVar275._28_4_ = auVar5._28_4_ + 1.0 + auVar148._28_4_ + 1.0;
          auVar143._8_4_ = 0x800000;
          auVar143._0_8_ = 0x80000000800000;
          auVar143._12_4_ = 0x800000;
          auVar143._16_4_ = 0x800000;
          auVar143._20_4_ = 0x800000;
          auVar143._24_4_ = 0x800000;
          auVar143._28_4_ = 0x800000;
          auVar148 = vmaxps_avx(auVar275,auVar143);
          auVar315 = vpsrld_avx(auVar148._16_16_,0x17);
          auVar144._8_4_ = 0x807fffff;
          auVar144._0_8_ = 0x807fffff807fffff;
          auVar144._12_4_ = 0x807fffff;
          auVar144._16_4_ = 0x807fffff;
          auVar144._20_4_ = 0x807fffff;
          auVar144._24_4_ = 0x807fffff;
          auVar144._28_4_ = 0x807fffff;
          auVar66 = vandps_avx(auVar148,auVar144);
          auVar6 = vorps_avx(auVar66,auVar70);
          auVar145._8_4_ = 0x3f3504f3;
          auVar145._0_8_ = 0x3f3504f33f3504f3;
          auVar145._12_4_ = 0x3f3504f3;
          auVar145._16_4_ = 0x3f3504f3;
          auVar145._20_4_ = 0x3f3504f3;
          auVar145._24_4_ = 0x3f3504f3;
          auVar145._28_4_ = 0x3f3504f3;
          auVar5 = vcmpps_avx(auVar145,auVar6,2);
          auVar66 = vandnps_avx(auVar5,auVar6);
          fVar346 = auVar6._0_4_ + -1.0 + auVar66._0_4_;
          fVar347 = auVar6._4_4_ + -1.0 + auVar66._4_4_;
          fVar348 = auVar6._8_4_ + -1.0 + auVar66._8_4_;
          fVar349 = auVar6._12_4_ + -1.0 + auVar66._12_4_;
          fVar354 = auVar6._16_4_ + -1.0 + auVar66._16_4_;
          fVar355 = auVar6._20_4_ + -1.0 + auVar66._20_4_;
          fVar356 = auVar6._24_4_ + -1.0 + auVar66._24_4_;
          auVar315 = vpsubd_avx(auVar315,auVar5._16_16_);
          auVar333 = vpsrld_avx(auVar148._0_16_,0x17);
          auVar164._8_4_ = 0xffffff81;
          auVar164._0_8_ = 0xffffff81ffffff81;
          auVar164._12_4_ = 0xffffff81;
          auVar315 = vpaddd_avx(auVar164,auVar315);
          auVar333 = vpsubd_avx(auVar333,auVar5._0_16_);
          auVar56._8_4_ = 0xc2b0c0a5;
          auVar56._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar56._12_4_ = 0xc2b0c0a5;
          auVar56._16_4_ = 0xc2b0c0a5;
          auVar56._20_4_ = 0xc2b0c0a5;
          auVar56._24_4_ = 0xc2b0c0a5;
          auVar56._28_4_ = 0xc2b0c0a5;
          auVar333 = vpaddd_avx(auVar333,auVar164);
          auVar146._16_16_ = auVar315;
          auVar146._0_16_ = auVar333;
          auVar342._8_4_ = 0x42b0c0a5;
          auVar342._0_8_ = 0x42b0c0a542b0c0a5;
          auVar342._12_4_ = 0x42b0c0a5;
          auVar342._16_4_ = 0x42b0c0a5;
          auVar342._20_4_ = 0x42b0c0a5;
          auVar342._24_4_ = 0x42b0c0a5;
          auVar342._28_4_ = 0x42b0c0a5;
          auVar5 = vcmpps_avx(auVar275,_DAT_005f31a0,2);
          auVar148 = vcvtdq2ps_avx(auVar146);
          auVar16._4_4_ =
               (fVar347 * fVar347 *
                (((((((((fVar347 * 0.070376836 + -0.1151461) * fVar347 + 0.116769984) * fVar347 +
                      -0.12420141) * fVar347 + 0.14249323) * fVar347 + -0.16668057) * fVar347 +
                   0.20000714) * fVar347 + -0.24999994) * fVar347 + 0.3333333) * fVar347 + -0.5) +
               fVar347 + auVar148._4_4_ * 0.6931472) * -2.0;
          auVar16._0_4_ =
               (fVar346 * fVar346 *
                (((((((((fVar346 * 0.070376836 + -0.1151461) * fVar346 + 0.116769984) * fVar346 +
                      -0.12420141) * fVar346 + 0.14249323) * fVar346 + -0.16668057) * fVar346 +
                   0.20000714) * fVar346 + -0.24999994) * fVar346 + 0.3333333) * fVar346 + -0.5) +
               fVar346 + auVar148._0_4_ * 0.6931472) * -2.0;
          auVar16._8_4_ =
               (fVar348 * fVar348 *
                (((((((((fVar348 * 0.070376836 + -0.1151461) * fVar348 + 0.116769984) * fVar348 +
                      -0.12420141) * fVar348 + 0.14249323) * fVar348 + -0.16668057) * fVar348 +
                   0.20000714) * fVar348 + -0.24999994) * fVar348 + 0.3333333) * fVar348 + -0.5) +
               fVar348 + auVar148._8_4_ * 0.6931472) * -2.0;
          auVar16._12_4_ =
               (fVar349 * fVar349 *
                (((((((((fVar349 * 0.070376836 + -0.1151461) * fVar349 + 0.116769984) * fVar349 +
                      -0.12420141) * fVar349 + 0.14249323) * fVar349 + -0.16668057) * fVar349 +
                   0.20000714) * fVar349 + -0.24999994) * fVar349 + 0.3333333) * fVar349 + -0.5) +
               fVar349 + auVar148._12_4_ * 0.6931472) * -2.0;
          auVar16._16_4_ =
               (fVar354 * fVar354 *
                (((((((((fVar354 * 0.070376836 + -0.1151461) * fVar354 + 0.116769984) * fVar354 +
                      -0.12420141) * fVar354 + 0.14249323) * fVar354 + -0.16668057) * fVar354 +
                   0.20000714) * fVar354 + -0.24999994) * fVar354 + 0.3333333) * fVar354 + -0.5) +
               fVar354 + auVar148._16_4_ * 0.6931472) * -2.0;
          auVar16._20_4_ =
               (fVar355 * fVar355 *
                (((((((((fVar355 * 0.070376836 + -0.1151461) * fVar355 + 0.116769984) * fVar355 +
                      -0.12420141) * fVar355 + 0.14249323) * fVar355 + -0.16668057) * fVar355 +
                   0.20000714) * fVar355 + -0.24999994) * fVar355 + 0.3333333) * fVar355 + -0.5) +
               fVar355 + auVar148._20_4_ * 0.6931472) * -2.0;
          auVar16._24_4_ =
               (fVar356 * fVar356 *
                (((((((((fVar356 * 0.070376836 + -0.1151461) * fVar356 + 0.116769984) * fVar356 +
                      -0.12420141) * fVar356 + 0.14249323) * fVar356 + -0.16668057) * fVar356 +
                   0.20000714) * fVar356 + -0.24999994) * fVar356 + 0.3333333) * fVar356 + -0.5) +
               fVar356 + auVar148._24_4_ * 0.6931472) * -2.0;
          auVar16._28_4_ = auVar6._28_4_ + -1.0 + auVar66._28_4_ + auVar148._28_4_ + 0.0;
          auVar196._8_4_ = 0x7fffffff;
          auVar196._0_8_ = 0x7fffffff7fffffff;
          auVar196._12_4_ = 0x7fffffff;
          auVar196._16_4_ = 0x7fffffff;
          auVar196._20_4_ = 0x7fffffff;
          auVar196._24_4_ = 0x7fffffff;
          auVar196._28_4_ = 0x7fffffff;
          auVar66 = vblendvps_avx(auVar16,auVar196,auVar5);
          auVar66 = vminps_avx(auVar342,auVar66);
          auVar148 = vmaxps_avx(auVar66,auVar56);
          auVar276._0_4_ = auVar148._0_4_ * 1.442695 + 0.5;
          auVar276._4_4_ = auVar148._4_4_ * 1.442695 + 0.5;
          auVar276._8_4_ = auVar148._8_4_ * 1.442695 + 0.5;
          auVar276._12_4_ = auVar148._12_4_ * 1.442695 + 0.5;
          auVar276._16_4_ = auVar148._16_4_ * 1.442695 + 0.5;
          auVar276._20_4_ = auVar148._20_4_ * 1.442695 + 0.5;
          auVar276._24_4_ = auVar148._24_4_ * 1.442695 + 0.5;
          auVar276._28_4_ = auVar5._28_4_ + 0.5;
          auVar5 = vroundps_avx(auVar276,1);
          auVar66 = vcmpps_avx(auVar276,auVar5,1);
          auVar66 = vandps_avx(auVar66,auVar256);
          auVar66 = vsubps_avx(auVar5,auVar66);
          auVar17._4_4_ = auVar66._4_4_ * 0.6931472;
          auVar17._0_4_ = auVar66._0_4_ * 0.6931472;
          auVar17._8_4_ = auVar66._8_4_ * 0.6931472;
          auVar17._12_4_ = auVar66._12_4_ * 0.6931472;
          auVar17._16_4_ = auVar66._16_4_ * 0.6931472;
          auVar17._20_4_ = auVar66._20_4_ * 0.6931472;
          auVar17._24_4_ = auVar66._24_4_ * 0.6931472;
          auVar17._28_4_ = auVar5._28_4_;
          auVar148 = vsubps_avx(auVar148,auVar17);
          fVar346 = auVar148._0_4_;
          fVar348 = auVar148._4_4_;
          fVar349 = auVar148._8_4_;
          fVar354 = auVar148._12_4_;
          fVar355 = auVar148._16_4_;
          fVar356 = auVar148._20_4_;
          fVar357 = auVar148._24_4_;
          in_ZMM7 = ZEXT1664(CONCAT412(0xff81ff81,CONCAT48(0xff81ff81,0xff81ff81ff81ff81)));
          in_ZMM13 = ZEXT3264(CONCAT428(0x80000000,
                                        CONCAT424(0x80000000,
                                                  CONCAT420(0x80000000,
                                                            CONCAT416(0x80000000,
                                                                      CONCAT412(0x80000000,
                                                                                CONCAT48(0x80000000,
                                                                                                                                                                                  
                                                  0x8000000080000000)))))));
          auVar315._0_4_ = (int)auVar66._0_4_;
          auVar315._4_4_ = (int)auVar66._4_4_;
          auVar315._8_4_ = (int)auVar66._8_4_;
          auVar315._12_4_ = (int)auVar66._12_4_;
          auVar277._16_4_ = (int)auVar66._16_4_;
          auVar277._0_16_ = auVar315;
          auVar277._20_4_ = (int)auVar66._20_4_;
          auVar277._24_4_ = (int)auVar66._24_4_;
          auVar277._28_4_ = (int)auVar66._28_4_;
          auVar333 = vpslld_avx(auVar315,0x17);
          auVar315 = vpslld_avx(auVar277._16_16_,0x17);
          auVar315 = vpaddd_avx(auVar315,auVar259);
          auVar333 = vpaddd_avx(auVar333,auVar259);
          in_ZMM12 = ZEXT1664(auVar333);
          fVar347 = auVar315._12_4_;
          auVar147._0_4_ =
               auVar333._0_4_ *
               (fVar346 * fVar346 *
                (((((fVar346 * 0.00019875691 + 0.0013981999) * fVar346 + 0.008333452) * fVar346 +
                  0.041665796) * fVar346 + 0.16666666) * fVar346 + 0.5) + fVar346 + 1.0) + 1.0;
          auVar147._4_4_ =
               auVar333._4_4_ *
               (fVar348 * fVar348 *
                (((((fVar348 * 0.00019875691 + 0.0013981999) * fVar348 + 0.008333452) * fVar348 +
                  0.041665796) * fVar348 + 0.16666666) * fVar348 + 0.5) + fVar348 + 1.0) + 1.0;
          auVar147._8_4_ =
               auVar333._8_4_ *
               (fVar349 * fVar349 *
                (((((fVar349 * 0.00019875691 + 0.0013981999) * fVar349 + 0.008333452) * fVar349 +
                  0.041665796) * fVar349 + 0.16666666) * fVar349 + 0.5) + fVar349 + 1.0) + 1.0;
          auVar147._12_4_ =
               auVar333._12_4_ *
               (fVar354 * fVar354 *
                (((((fVar354 * 0.00019875691 + 0.0013981999) * fVar354 + 0.008333452) * fVar354 +
                  0.041665796) * fVar354 + 0.16666666) * fVar354 + 0.5) + fVar354 + 1.0) + 1.0;
          auVar147._16_4_ =
               auVar315._0_4_ *
               (fVar355 * fVar355 *
                (((((fVar355 * 0.00019875691 + 0.0013981999) * fVar355 + 0.008333452) * fVar355 +
                  0.041665796) * fVar355 + 0.16666666) * fVar355 + 0.5) + fVar355 + 1.0) + 1.0;
          auVar147._20_4_ =
               auVar315._4_4_ *
               (fVar356 * fVar356 *
                (((((fVar356 * 0.00019875691 + 0.0013981999) * fVar356 + 0.008333452) * fVar356 +
                  0.041665796) * fVar356 + 0.16666666) * fVar356 + 0.5) + fVar356 + 1.0) + 1.0;
          auVar147._24_4_ =
               auVar315._8_4_ *
               (fVar357 * fVar357 *
                (((((fVar357 * 0.00019875691 + 0.0013981999) * fVar357 + 0.008333452) * fVar357 +
                  0.041665796) * fVar357 + 0.16666666) * fVar357 + 0.5) + fVar357 + 1.0) + 1.0;
          auVar147._28_4_ = auVar5._28_4_ + auVar148._28_4_ + 1.0 + 1.0;
          auVar57._8_4_ = 0x40000000;
          auVar57._0_8_ = 0x4000000040000000;
          auVar57._12_4_ = 0x40000000;
          auVar57._16_4_ = 0x40000000;
          auVar57._20_4_ = 0x40000000;
          auVar57._24_4_ = 0x40000000;
          auVar57._28_4_ = 0x40000000;
          auVar66 = vdivps_avx(auVar57,auVar147);
          auVar135._0_4_ = auVar66._0_4_ + -1.0;
          auVar135._4_4_ = auVar66._4_4_ + -1.0;
          auVar135._8_4_ = auVar66._8_4_ + -1.0;
          auVar135._12_4_ = auVar66._12_4_ + -1.0;
          auVar135._16_4_ = auVar66._16_4_ + -1.0;
          auVar135._20_4_ = auVar66._20_4_ + -1.0;
          auVar135._24_4_ = auVar66._24_4_ + -1.0;
          goto LAB_004a6e29;
        case 5:
          fVar346 = *activation_params->data;
          fVar347 = *(float *)((long)activation_params->data + 4);
          auVar148._0_4_ = fVar347 + fVar208 * fVar346;
          auVar148._4_4_ = fVar347 + fVar241 * fVar346;
          auVar148._8_4_ = fVar347 + fVar242 * fVar346;
          auVar148._12_4_ = fVar347 + fVar243 * fVar346;
          auVar148._16_4_ = fVar347 + fVar244 * fVar346;
          auVar148._20_4_ = fVar347 + fVar245 * fVar346;
          auVar148._24_4_ = fVar347 + fVar246 * fVar346;
          auVar148._28_4_ = fVar347 + fVar346;
          auVar66 = vmaxps_avx(auVar148,_DAT_005f31a0);
          auVar66 = vminps_avx(auVar256,auVar66);
          auVar135 = auVar66._0_28_;
LAB_004a6e29:
          auVar247 = ZEXT436((uint)fVar347);
          auVar110 = ZEXT3264(CONCAT428(uVar28,CONCAT424(fVar246 * auVar135._24_4_,
                                                         CONCAT420(fVar245 * auVar135._20_4_,
                                                                   CONCAT416(fVar244 * auVar135.
                                                  _16_4_,CONCAT412(fVar243 * auVar135._12_4_,
                                                                   CONCAT48(fVar242 * auVar135._8_4_
                                                                            ,CONCAT44(fVar241 * 
                                                  auVar135._4_4_,fVar208 * auVar135._0_4_))))))));
        }
        auVar66 = vcvtdq2ps_avx(*(undefined1 (*) [32])((long)intptr + 0x20));
        auVar207 = ZEXT436(auVar66._28_4_);
        auVar274._0_4_ = auVar66._0_4_ * (float)local_d8._0_4_;
        auVar274._4_4_ = auVar66._4_4_ * (float)local_d8._4_4_;
        auVar274._8_4_ = auVar66._8_4_ * fStack_d0;
        auVar274._12_4_ = auVar66._12_4_ * fStack_cc;
        auVar274._16_4_ = auVar66._16_4_ * fStack_c8;
        auVar274._20_4_ = auVar66._20_4_ * fStack_c4;
        auVar274._24_4_ = auVar66._24_4_ * fStack_c0;
        auVar352._28_36_ = auVar247;
        auVar352._0_28_ = auVar274;
        auVar66 = auVar352._0_32_;
        switch(activation_type + -1) {
        case 0:
          auVar66 = vmaxps_avx(auVar66,_DAT_005f31a0);
          auVar274 = auVar66._0_28_;
          break;
        case 1:
          auVar5 = vmaxps_avx(auVar66,ZEXT1632(ZEXT816(0) << 0x40));
          auVar207 = ZEXT436(auVar5._28_4_);
          auVar66 = vminps_avx(auVar66,ZEXT1632(ZEXT816(0) << 0x40));
          fVar208 = *activation_params->data;
          in_ZMM12 = ZEXT3264(CONCAT428(fVar208,CONCAT424(fVar208,CONCAT420(fVar208,CONCAT416(
                                                  fVar208,CONCAT412(fVar208,CONCAT48(fVar208,
                                                  CONCAT44(fVar208,fVar208))))))));
          auVar274._0_4_ = fVar208 * auVar66._0_4_ + auVar5._0_4_;
          auVar274._4_4_ = fVar208 * auVar66._4_4_ + auVar5._4_4_;
          auVar274._8_4_ = fVar208 * auVar66._8_4_ + auVar5._8_4_;
          auVar274._12_4_ = fVar208 * auVar66._12_4_ + auVar5._12_4_;
          auVar274._16_4_ = fVar208 * auVar66._16_4_ + auVar5._16_4_;
          auVar274._20_4_ = fVar208 * auVar66._20_4_ + auVar5._20_4_;
          auVar274._24_4_ = fVar208 * auVar66._24_4_ + auVar5._24_4_;
          break;
        case 2:
          uVar3 = *activation_params->data;
          auVar153._4_4_ = uVar3;
          auVar153._0_4_ = uVar3;
          auVar153._8_4_ = uVar3;
          auVar153._12_4_ = uVar3;
          auVar153._16_4_ = uVar3;
          auVar153._20_4_ = uVar3;
          auVar153._24_4_ = uVar3;
          auVar153._28_4_ = uVar3;
          uVar3 = *(undefined4 *)((long)activation_params->data + 4);
          auVar302._4_4_ = uVar3;
          auVar302._0_4_ = uVar3;
          auVar302._8_4_ = uVar3;
          auVar302._12_4_ = uVar3;
          auVar302._16_4_ = uVar3;
          auVar302._20_4_ = uVar3;
          auVar302._24_4_ = uVar3;
          auVar302._28_4_ = uVar3;
          in_ZMM12 = ZEXT3264(auVar302);
          auVar66 = vmaxps_avx(auVar66,auVar153);
          auVar207 = ZEXT436(auVar66._28_4_);
          auVar66 = vminps_avx(auVar302,auVar66);
          auVar274 = auVar66._0_28_;
          break;
        case 3:
          auVar154._0_4_ = (uint)auVar274._0_4_ ^ in_ZMM13._0_4_;
          auVar154._4_4_ = (uint)auVar274._4_4_ ^ in_ZMM13._4_4_;
          auVar154._8_4_ = (uint)auVar274._8_4_ ^ in_ZMM13._8_4_;
          auVar154._12_4_ = (uint)auVar274._12_4_ ^ in_ZMM13._12_4_;
          auVar154._16_4_ = (uint)auVar274._16_4_ ^ in_ZMM13._16_4_;
          auVar154._20_4_ = (uint)auVar274._20_4_ ^ in_ZMM13._20_4_;
          auVar154._24_4_ = (uint)auVar274._24_4_ ^ in_ZMM13._24_4_;
          auVar154._28_4_ = (uint)auVar247._0_4_ ^ in_ZMM13._28_4_;
          auVar63._8_4_ = 0x42b0c0a5;
          auVar63._0_8_ = 0x42b0c0a542b0c0a5;
          auVar63._12_4_ = 0x42b0c0a5;
          auVar63._16_4_ = 0x42b0c0a5;
          auVar63._20_4_ = 0x42b0c0a5;
          auVar63._24_4_ = 0x42b0c0a5;
          auVar63._28_4_ = 0x42b0c0a5;
          auVar66 = vminps_avx(auVar154,auVar63);
          auVar64._8_4_ = 0xc2b0c0a5;
          auVar64._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar64._12_4_ = 0xc2b0c0a5;
          auVar64._16_4_ = 0xc2b0c0a5;
          auVar64._20_4_ = 0xc2b0c0a5;
          auVar64._24_4_ = 0xc2b0c0a5;
          auVar64._28_4_ = 0xc2b0c0a5;
          auVar5 = vmaxps_avx(auVar66,auVar64);
          auVar281._0_4_ = auVar5._0_4_ * 1.442695 + 0.5;
          auVar281._4_4_ = auVar5._4_4_ * 1.442695 + 0.5;
          auVar281._8_4_ = auVar5._8_4_ * 1.442695 + 0.5;
          auVar281._12_4_ = auVar5._12_4_ * 1.442695 + 0.5;
          auVar281._16_4_ = auVar5._16_4_ * 1.442695 + 0.5;
          auVar281._20_4_ = auVar5._20_4_ * 1.442695 + 0.5;
          auVar281._24_4_ = auVar5._24_4_ * 1.442695 + 0.5;
          auVar281._28_4_ = auVar247._0_4_ + 0.5;
          auVar148 = vroundps_avx(auVar281,1);
          auVar66 = vcmpps_avx(auVar281,auVar148,1);
          auVar66 = vandps_avx(auVar66,auVar256);
          auVar66 = vsubps_avx(auVar148,auVar66);
          in_ZMM7 = ZEXT1664(CONCAT412(0xff81ff81,CONCAT48(0xff81ff81,0xff81ff81ff81ff81)));
          fVar208 = auVar66._0_4_ * -0.6931472 + auVar5._0_4_;
          fVar241 = auVar66._4_4_ * -0.6931472 + auVar5._4_4_;
          fVar242 = auVar66._8_4_ * -0.6931472 + auVar5._8_4_;
          fVar243 = auVar66._12_4_ * -0.6931472 + auVar5._12_4_;
          fVar244 = auVar66._16_4_ * -0.6931472 + auVar5._16_4_;
          fVar245 = auVar66._20_4_ * -0.6931472 + auVar5._20_4_;
          fVar246 = auVar66._24_4_ * -0.6931472 + auVar5._24_4_;
          auVar43 = ZEXT1664(CONCAT412(0x7f007f,CONCAT48(0x7f007f,0x7f007f007f007f)));
          in_ZMM13 = ZEXT3264(CONCAT428(0x80000000,
                                        CONCAT424(0x80000000,
                                                  CONCAT420(0x80000000,
                                                            CONCAT416(0x80000000,
                                                                      CONCAT412(0x80000000,
                                                                                CONCAT48(0x80000000,
                                                                                                                                                                                  
                                                  0x8000000080000000)))))));
          auVar272._0_4_ = (int)auVar66._0_4_;
          auVar272._4_4_ = (int)auVar66._4_4_;
          auVar272._8_4_ = (int)auVar66._8_4_;
          auVar272._12_4_ = (int)auVar66._12_4_;
          auVar282._16_4_ = (int)auVar66._16_4_;
          auVar282._0_16_ = auVar272;
          auVar282._20_4_ = (int)auVar66._20_4_;
          auVar282._24_4_ = (int)auVar66._24_4_;
          auVar282._28_4_ = (int)auVar66._28_4_;
          auVar333 = vpslld_avx(auVar272,0x17);
          auVar315 = vpslld_avx(auVar282._16_16_,0x17);
          auVar46._8_4_ = 0x3f800000;
          auVar46._0_8_ = 0x3f8000003f800000;
          auVar46._12_4_ = 0x3f800000;
          auVar315 = vpaddd_avx(auVar315,auVar46);
          auVar333 = vpaddd_avx(auVar333,auVar46);
          in_ZMM12 = ZEXT1664(auVar333);
          auVar155._0_4_ =
               auVar333._0_4_ *
               (fVar208 * fVar208 *
                (((((fVar208 * 0.00019875691 + 0.0013981999) * fVar208 + 0.008333452) * fVar208 +
                  0.041665796) * fVar208 + 0.16666666) * fVar208 + 0.5) + fVar208 + 1.0) + 1.0;
          auVar155._4_4_ =
               auVar333._4_4_ *
               (fVar241 * fVar241 *
                (((((fVar241 * 0.00019875691 + 0.0013981999) * fVar241 + 0.008333452) * fVar241 +
                  0.041665796) * fVar241 + 0.16666666) * fVar241 + 0.5) + fVar241 + 1.0) + 1.0;
          auVar155._8_4_ =
               auVar333._8_4_ *
               (fVar242 * fVar242 *
                (((((fVar242 * 0.00019875691 + 0.0013981999) * fVar242 + 0.008333452) * fVar242 +
                  0.041665796) * fVar242 + 0.16666666) * fVar242 + 0.5) + fVar242 + 1.0) + 1.0;
          auVar155._12_4_ =
               auVar333._12_4_ *
               (fVar243 * fVar243 *
                (((((fVar243 * 0.00019875691 + 0.0013981999) * fVar243 + 0.008333452) * fVar243 +
                  0.041665796) * fVar243 + 0.16666666) * fVar243 + 0.5) + fVar243 + 1.0) + 1.0;
          auVar155._16_4_ =
               auVar315._0_4_ *
               (fVar244 * fVar244 *
                (((((fVar244 * 0.00019875691 + 0.0013981999) * fVar244 + 0.008333452) * fVar244 +
                  0.041665796) * fVar244 + 0.16666666) * fVar244 + 0.5) + fVar244 + 1.0) + 1.0;
          auVar155._20_4_ =
               auVar315._4_4_ *
               (fVar245 * fVar245 *
                (((((fVar245 * 0.00019875691 + 0.0013981999) * fVar245 + 0.008333452) * fVar245 +
                  0.041665796) * fVar245 + 0.16666666) * fVar245 + 0.5) + fVar245 + 1.0) + 1.0;
          auVar155._24_4_ =
               auVar315._8_4_ *
               (fVar246 * fVar246 *
                (((((fVar246 * 0.00019875691 + 0.0013981999) * fVar246 + 0.008333452) * fVar246 +
                  0.041665796) * fVar246 + 0.16666666) * fVar246 + 0.5) + fVar246 + 1.0) + 1.0;
          auVar155._28_4_ = auVar148._28_4_ + auVar148._28_4_ + auVar5._28_4_ + 1.0 + 1.0;
          auVar207 = ZEXT436((uint)auVar155._28_4_);
          auVar66 = vdivps_avx(auVar256,auVar155);
          auVar274 = auVar66._0_28_;
          break;
        case 4:
          auVar60._8_4_ = 0x42b0c0a5;
          auVar60._0_8_ = 0x42b0c0a542b0c0a5;
          auVar60._12_4_ = 0x42b0c0a5;
          auVar60._16_4_ = 0x42b0c0a5;
          auVar60._20_4_ = 0x42b0c0a5;
          auVar60._24_4_ = 0x42b0c0a5;
          auVar60._28_4_ = 0x42b0c0a5;
          auVar66 = vminps_avx(auVar66,auVar60);
          auVar61._8_4_ = 0xc2b0c0a5;
          auVar61._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar61._12_4_ = 0xc2b0c0a5;
          auVar61._16_4_ = 0xc2b0c0a5;
          auVar61._20_4_ = 0xc2b0c0a5;
          auVar61._24_4_ = 0xc2b0c0a5;
          auVar61._28_4_ = 0xc2b0c0a5;
          auVar5 = vmaxps_avx(auVar66,auVar61);
          auVar299._0_4_ = auVar5._0_4_ * 1.442695 + 0.5;
          auVar299._4_4_ = auVar5._4_4_ * 1.442695 + 0.5;
          auVar299._8_4_ = auVar5._8_4_ * 1.442695 + 0.5;
          auVar299._12_4_ = auVar5._12_4_ * 1.442695 + 0.5;
          auVar299._16_4_ = auVar5._16_4_ * 1.442695 + 0.5;
          auVar299._20_4_ = auVar5._20_4_ * 1.442695 + 0.5;
          auVar299._24_4_ = auVar5._24_4_ * 1.442695 + 0.5;
          auVar299._28_4_ = in_ZMM12._28_4_ + 0.5;
          auVar148 = vroundps_avx(auVar299,1);
          auVar66 = vcmpps_avx(auVar299,auVar148,1);
          auVar66 = vandps_avx(auVar66,auVar256);
          auVar66 = vsubps_avx(auVar148,auVar66);
          auVar18._4_4_ = auVar66._4_4_ * 0.6931472;
          auVar18._0_4_ = auVar66._0_4_ * 0.6931472;
          auVar18._8_4_ = auVar66._8_4_ * 0.6931472;
          auVar18._12_4_ = auVar66._12_4_ * 0.6931472;
          auVar18._16_4_ = auVar66._16_4_ * 0.6931472;
          auVar18._20_4_ = auVar66._20_4_ * 0.6931472;
          auVar18._24_4_ = auVar66._24_4_ * 0.6931472;
          auVar18._28_4_ = auVar148._28_4_;
          auVar5 = vsubps_avx(auVar5,auVar18);
          fVar208 = auVar5._0_4_;
          fVar241 = auVar5._4_4_;
          fVar242 = auVar5._8_4_;
          fVar243 = auVar5._12_4_;
          fVar244 = auVar5._16_4_;
          fVar245 = auVar5._20_4_;
          fVar246 = auVar5._24_4_;
          auVar289._0_4_ = (int)auVar66._0_4_;
          auVar289._4_4_ = (int)auVar66._4_4_;
          auVar289._8_4_ = (int)auVar66._8_4_;
          auVar289._12_4_ = (int)auVar66._12_4_;
          auVar300._16_4_ = (int)auVar66._16_4_;
          auVar300._0_16_ = auVar289;
          auVar300._20_4_ = (int)auVar66._20_4_;
          auVar300._24_4_ = (int)auVar66._24_4_;
          auVar300._28_4_ = (int)auVar66._28_4_;
          auVar333 = vpslld_avx(auVar289,0x17);
          auVar315 = vpslld_avx(auVar300._16_16_,0x17);
          auVar45._8_4_ = 0x3f800000;
          auVar45._0_8_ = 0x3f8000003f800000;
          auVar45._12_4_ = 0x3f800000;
          auVar315 = vpaddd_avx(auVar315,auVar45);
          auVar333 = vpaddd_avx(auVar333,auVar45);
          auVar301._0_4_ =
               auVar333._0_4_ *
               (fVar208 * fVar208 *
                (((((fVar208 * 0.00019875691 + 0.0013981999) * fVar208 + 0.008333452) * fVar208 +
                  0.041665796) * fVar208 + 0.16666666) * fVar208 + 0.5) + fVar208 + 1.0) + 1.0;
          auVar301._4_4_ =
               auVar333._4_4_ *
               (fVar241 * fVar241 *
                (((((fVar241 * 0.00019875691 + 0.0013981999) * fVar241 + 0.008333452) * fVar241 +
                  0.041665796) * fVar241 + 0.16666666) * fVar241 + 0.5) + fVar241 + 1.0) + 1.0;
          auVar301._8_4_ =
               auVar333._8_4_ *
               (fVar242 * fVar242 *
                (((((fVar242 * 0.00019875691 + 0.0013981999) * fVar242 + 0.008333452) * fVar242 +
                  0.041665796) * fVar242 + 0.16666666) * fVar242 + 0.5) + fVar242 + 1.0) + 1.0;
          auVar301._12_4_ =
               auVar333._12_4_ *
               (fVar243 * fVar243 *
                (((((fVar243 * 0.00019875691 + 0.0013981999) * fVar243 + 0.008333452) * fVar243 +
                  0.041665796) * fVar243 + 0.16666666) * fVar243 + 0.5) + fVar243 + 1.0) + 1.0;
          auVar301._16_4_ =
               auVar315._0_4_ *
               (fVar244 * fVar244 *
                (((((fVar244 * 0.00019875691 + 0.0013981999) * fVar244 + 0.008333452) * fVar244 +
                  0.041665796) * fVar244 + 0.16666666) * fVar244 + 0.5) + fVar244 + 1.0) + 1.0;
          auVar301._20_4_ =
               auVar315._4_4_ *
               (fVar245 * fVar245 *
                (((((fVar245 * 0.00019875691 + 0.0013981999) * fVar245 + 0.008333452) * fVar245 +
                  0.041665796) * fVar245 + 0.16666666) * fVar245 + 0.5) + fVar245 + 1.0) + 1.0;
          auVar301._24_4_ =
               auVar315._8_4_ *
               (fVar246 * fVar246 *
                (((((fVar246 * 0.00019875691 + 0.0013981999) * fVar246 + 0.008333452) * fVar246 +
                  0.041665796) * fVar246 + 0.16666666) * fVar246 + 0.5) + fVar246 + 1.0) + 1.0;
          auVar301._28_4_ = auVar148._28_4_ + auVar5._28_4_ + 1.0 + 1.0;
          auVar149._8_4_ = 0x800000;
          auVar149._0_8_ = 0x80000000800000;
          auVar149._12_4_ = 0x800000;
          auVar149._16_4_ = 0x800000;
          auVar149._20_4_ = 0x800000;
          auVar149._24_4_ = 0x800000;
          auVar149._28_4_ = 0x800000;
          auVar148 = vmaxps_avx(auVar301,auVar149);
          auVar315 = vpsrld_avx(auVar148._16_16_,0x17);
          auVar263._8_4_ = 0x807fffff;
          auVar263._0_8_ = 0x807fffff807fffff;
          auVar263._12_4_ = 0x807fffff;
          auVar263._16_4_ = 0x807fffff;
          auVar263._20_4_ = 0x807fffff;
          auVar263._24_4_ = 0x807fffff;
          auVar263._28_4_ = 0x807fffff;
          auVar66 = vandps_avx(auVar263,auVar148);
          auVar6 = vorps_avx(auVar66,auVar70);
          auVar264._8_4_ = 0x3f3504f3;
          auVar264._0_8_ = 0x3f3504f33f3504f3;
          auVar264._12_4_ = 0x3f3504f3;
          auVar264._16_4_ = 0x3f3504f3;
          auVar264._20_4_ = 0x3f3504f3;
          auVar264._24_4_ = 0x3f3504f3;
          auVar264._28_4_ = 0x3f3504f3;
          auVar5 = vcmpps_avx(auVar264,auVar6,2);
          auVar66 = vandnps_avx(auVar5,auVar6);
          fVar208 = auVar6._0_4_ + -1.0 + auVar66._0_4_;
          fVar241 = auVar6._4_4_ + -1.0 + auVar66._4_4_;
          fVar242 = auVar6._8_4_ + -1.0 + auVar66._8_4_;
          fVar243 = auVar6._12_4_ + -1.0 + auVar66._12_4_;
          fVar244 = auVar6._16_4_ + -1.0 + auVar66._16_4_;
          fVar245 = auVar6._20_4_ + -1.0 + auVar66._20_4_;
          fVar246 = auVar6._24_4_ + -1.0 + auVar66._24_4_;
          auVar315 = vpsubd_avx(auVar315,auVar5._16_16_);
          auVar333 = vpsrld_avx(auVar148._0_16_,0x17);
          auVar334._8_4_ = 0xffffff81;
          auVar334._0_8_ = 0xffffff81ffffff81;
          auVar334._12_4_ = 0xffffff81;
          auVar315 = vpaddd_avx(auVar315,auVar334);
          auVar333 = vpsubd_avx(auVar333,auVar5._0_16_);
          auVar351._8_4_ = 0xc2b0c0a5;
          auVar351._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar351._12_4_ = 0xc2b0c0a5;
          auVar351._16_4_ = 0xc2b0c0a5;
          auVar351._20_4_ = 0xc2b0c0a5;
          auVar351._24_4_ = 0xc2b0c0a5;
          auVar351._28_4_ = 0xc2b0c0a5;
          auVar333 = vpaddd_avx(auVar334,auVar333);
          auVar150._16_16_ = auVar315;
          auVar150._0_16_ = auVar333;
          auVar343._8_4_ = 0x42b0c0a5;
          auVar343._0_8_ = 0x42b0c0a542b0c0a5;
          auVar343._12_4_ = 0x42b0c0a5;
          auVar343._16_4_ = 0x42b0c0a5;
          auVar343._20_4_ = 0x42b0c0a5;
          auVar343._24_4_ = 0x42b0c0a5;
          auVar343._28_4_ = 0x42b0c0a5;
          auVar5 = vcmpps_avx(auVar301,_DAT_005f31a0,2);
          auVar148 = vcvtdq2ps_avx(auVar150);
          auVar19._4_4_ =
               (fVar241 * fVar241 *
                (((((((((fVar241 * 0.070376836 + -0.1151461) * fVar241 + 0.116769984) * fVar241 +
                      -0.12420141) * fVar241 + 0.14249323) * fVar241 + -0.16668057) * fVar241 +
                   0.20000714) * fVar241 + -0.24999994) * fVar241 + 0.3333333) * fVar241 + -0.5) +
               fVar241 + auVar148._4_4_ * 0.6931472) * -2.0;
          auVar19._0_4_ =
               (fVar208 * fVar208 *
                (((((((((fVar208 * 0.070376836 + -0.1151461) * fVar208 + 0.116769984) * fVar208 +
                      -0.12420141) * fVar208 + 0.14249323) * fVar208 + -0.16668057) * fVar208 +
                   0.20000714) * fVar208 + -0.24999994) * fVar208 + 0.3333333) * fVar208 + -0.5) +
               fVar208 + auVar148._0_4_ * 0.6931472) * -2.0;
          auVar19._8_4_ =
               (fVar242 * fVar242 *
                (((((((((fVar242 * 0.070376836 + -0.1151461) * fVar242 + 0.116769984) * fVar242 +
                      -0.12420141) * fVar242 + 0.14249323) * fVar242 + -0.16668057) * fVar242 +
                   0.20000714) * fVar242 + -0.24999994) * fVar242 + 0.3333333) * fVar242 + -0.5) +
               fVar242 + auVar148._8_4_ * 0.6931472) * -2.0;
          auVar19._12_4_ =
               (fVar243 * fVar243 *
                (((((((((fVar243 * 0.070376836 + -0.1151461) * fVar243 + 0.116769984) * fVar243 +
                      -0.12420141) * fVar243 + 0.14249323) * fVar243 + -0.16668057) * fVar243 +
                   0.20000714) * fVar243 + -0.24999994) * fVar243 + 0.3333333) * fVar243 + -0.5) +
               fVar243 + auVar148._12_4_ * 0.6931472) * -2.0;
          auVar19._16_4_ =
               (fVar244 * fVar244 *
                (((((((((fVar244 * 0.070376836 + -0.1151461) * fVar244 + 0.116769984) * fVar244 +
                      -0.12420141) * fVar244 + 0.14249323) * fVar244 + -0.16668057) * fVar244 +
                   0.20000714) * fVar244 + -0.24999994) * fVar244 + 0.3333333) * fVar244 + -0.5) +
               fVar244 + auVar148._16_4_ * 0.6931472) * -2.0;
          auVar19._20_4_ =
               (fVar245 * fVar245 *
                (((((((((fVar245 * 0.070376836 + -0.1151461) * fVar245 + 0.116769984) * fVar245 +
                      -0.12420141) * fVar245 + 0.14249323) * fVar245 + -0.16668057) * fVar245 +
                   0.20000714) * fVar245 + -0.24999994) * fVar245 + 0.3333333) * fVar245 + -0.5) +
               fVar245 + auVar148._20_4_ * 0.6931472) * -2.0;
          auVar19._24_4_ =
               (fVar246 * fVar246 *
                (((((((((fVar246 * 0.070376836 + -0.1151461) * fVar246 + 0.116769984) * fVar246 +
                      -0.12420141) * fVar246 + 0.14249323) * fVar246 + -0.16668057) * fVar246 +
                   0.20000714) * fVar246 + -0.24999994) * fVar246 + 0.3333333) * fVar246 + -0.5) +
               fVar246 + auVar148._24_4_ * 0.6931472) * -2.0;
          auVar19._28_4_ = auVar6._28_4_ + -1.0 + auVar66._28_4_ + auVar148._28_4_ + 0.0;
          auVar197._8_4_ = 0x7fffffff;
          auVar197._0_8_ = 0x7fffffff7fffffff;
          auVar197._12_4_ = 0x7fffffff;
          auVar197._16_4_ = 0x7fffffff;
          auVar197._20_4_ = 0x7fffffff;
          auVar197._24_4_ = 0x7fffffff;
          auVar197._28_4_ = 0x7fffffff;
          auVar66 = vblendvps_avx(auVar19,auVar197,auVar5);
          auVar66 = vminps_avx(auVar343,auVar66);
          auVar5 = vmaxps_avx(auVar351,auVar66);
          in_ZMM7 = ZEXT1664(CONCAT412(0xff81ff81,CONCAT48(0xff81ff81,0xff81ff81ff81ff81)));
          auVar265._0_4_ = auVar5._0_4_ * 1.442695 + 0.5;
          auVar265._4_4_ = auVar5._4_4_ * 1.442695 + 0.5;
          auVar265._8_4_ = auVar5._8_4_ * 1.442695 + 0.5;
          auVar265._12_4_ = auVar5._12_4_ * 1.442695 + 0.5;
          auVar265._16_4_ = auVar5._16_4_ * 1.442695 + 0.5;
          auVar265._20_4_ = auVar5._20_4_ * 1.442695 + 0.5;
          auVar265._24_4_ = auVar5._24_4_ * 1.442695 + 0.5;
          auVar265._28_4_ = 0x3f000000;
          auVar148 = vroundps_avx(auVar265,1);
          auVar66 = vcmpps_avx(auVar265,auVar148,1);
          auVar66 = vandps_avx(auVar66,auVar256);
          auVar66 = vsubps_avx(auVar148,auVar66);
          auVar20._4_4_ = auVar66._4_4_ * 0.6931472;
          auVar20._0_4_ = auVar66._0_4_ * 0.6931472;
          auVar20._8_4_ = auVar66._8_4_ * 0.6931472;
          auVar20._12_4_ = auVar66._12_4_ * 0.6931472;
          auVar20._16_4_ = auVar66._16_4_ * 0.6931472;
          auVar20._20_4_ = auVar66._20_4_ * 0.6931472;
          auVar20._24_4_ = auVar66._24_4_ * 0.6931472;
          auVar20._28_4_ = auVar148._28_4_;
          auVar5 = vsubps_avx(auVar5,auVar20);
          fVar208 = auVar5._0_4_;
          fVar241 = auVar5._4_4_;
          fVar242 = auVar5._8_4_;
          fVar243 = auVar5._12_4_;
          fVar244 = auVar5._16_4_;
          fVar245 = auVar5._20_4_;
          fVar246 = auVar5._24_4_;
          auVar43 = ZEXT1664(CONCAT412(0x7f007f,CONCAT48(0x7f007f,0x7f007f007f007f)));
          in_ZMM13 = ZEXT3264(CONCAT428(0x80000000,
                                        CONCAT424(0x80000000,
                                                  CONCAT420(0x80000000,
                                                            CONCAT416(0x80000000,
                                                                      CONCAT412(0x80000000,
                                                                                CONCAT48(0x80000000,
                                                                                                                                                                                  
                                                  0x8000000080000000)))))));
          auVar260._0_4_ = (int)auVar66._0_4_;
          auVar260._4_4_ = (int)auVar66._4_4_;
          auVar260._8_4_ = (int)auVar66._8_4_;
          auVar260._12_4_ = (int)auVar66._12_4_;
          auVar266._16_4_ = (int)auVar66._16_4_;
          auVar266._0_16_ = auVar260;
          auVar266._20_4_ = (int)auVar66._20_4_;
          auVar266._24_4_ = (int)auVar66._24_4_;
          auVar266._28_4_ = (int)auVar66._28_4_;
          auVar333 = vpslld_avx(auVar260,0x17);
          auVar315 = vpslld_avx(auVar266._16_16_,0x17);
          auVar315 = vpaddd_avx(auVar315,auVar45);
          auVar333 = vpaddd_avx(auVar333,auVar45);
          in_ZMM12 = ZEXT1664(auVar333);
          auVar151._0_4_ =
               auVar333._0_4_ *
               (fVar208 * fVar208 *
                (((((fVar208 * 0.00019875691 + 0.0013981999) * fVar208 + 0.008333452) * fVar208 +
                  0.041665796) * fVar208 + 0.16666666) * fVar208 + 0.5) + fVar208 + 1.0) + 1.0;
          auVar151._4_4_ =
               auVar333._4_4_ *
               (fVar241 * fVar241 *
                (((((fVar241 * 0.00019875691 + 0.0013981999) * fVar241 + 0.008333452) * fVar241 +
                  0.041665796) * fVar241 + 0.16666666) * fVar241 + 0.5) + fVar241 + 1.0) + 1.0;
          auVar151._8_4_ =
               auVar333._8_4_ *
               (fVar242 * fVar242 *
                (((((fVar242 * 0.00019875691 + 0.0013981999) * fVar242 + 0.008333452) * fVar242 +
                  0.041665796) * fVar242 + 0.16666666) * fVar242 + 0.5) + fVar242 + 1.0) + 1.0;
          auVar151._12_4_ =
               auVar333._12_4_ *
               (fVar243 * fVar243 *
                (((((fVar243 * 0.00019875691 + 0.0013981999) * fVar243 + 0.008333452) * fVar243 +
                  0.041665796) * fVar243 + 0.16666666) * fVar243 + 0.5) + fVar243 + 1.0) + 1.0;
          auVar151._16_4_ =
               auVar315._0_4_ *
               (fVar244 * fVar244 *
                (((((fVar244 * 0.00019875691 + 0.0013981999) * fVar244 + 0.008333452) * fVar244 +
                  0.041665796) * fVar244 + 0.16666666) * fVar244 + 0.5) + fVar244 + 1.0) + 1.0;
          auVar151._20_4_ =
               auVar315._4_4_ *
               (fVar245 * fVar245 *
                (((((fVar245 * 0.00019875691 + 0.0013981999) * fVar245 + 0.008333452) * fVar245 +
                  0.041665796) * fVar245 + 0.16666666) * fVar245 + 0.5) + fVar245 + 1.0) + 1.0;
          auVar151._24_4_ =
               auVar315._8_4_ *
               (fVar246 * fVar246 *
                (((((fVar246 * 0.00019875691 + 0.0013981999) * fVar246 + 0.008333452) * fVar246 +
                  0.041665796) * fVar246 + 0.16666666) * fVar246 + 0.5) + fVar246 + 1.0) + 1.0;
          auVar151._28_4_ = auVar148._28_4_ + auVar5._28_4_ + 1.0 + 1.0;
          auVar62._8_4_ = 0x40000000;
          auVar62._0_8_ = 0x4000000040000000;
          auVar62._12_4_ = 0x40000000;
          auVar62._16_4_ = 0x40000000;
          auVar62._20_4_ = 0x40000000;
          auVar62._24_4_ = 0x40000000;
          auVar62._28_4_ = 0x40000000;
          auVar66 = vdivps_avx(auVar62,auVar151);
          auVar152._0_4_ = auVar66._0_4_ + -1.0;
          auVar152._4_4_ = auVar66._4_4_ + -1.0;
          auVar152._8_4_ = auVar66._8_4_ + -1.0;
          auVar152._12_4_ = auVar66._12_4_ + -1.0;
          auVar152._16_4_ = auVar66._16_4_ + -1.0;
          auVar152._20_4_ = auVar66._20_4_ + -1.0;
          auVar152._24_4_ = auVar66._24_4_ + -1.0;
          auVar152._28_4_ = auVar66._28_4_ + -1.0;
          goto LAB_004a7327;
        case 5:
          fVar208 = *activation_params->data;
          fVar241 = *(float *)((long)activation_params->data + 4);
          auVar156._0_4_ = fVar241 + auVar274._0_4_ * fVar208;
          auVar156._4_4_ = fVar241 + auVar274._4_4_ * fVar208;
          auVar156._8_4_ = fVar241 + auVar274._8_4_ * fVar208;
          auVar156._12_4_ = fVar241 + auVar274._12_4_ * fVar208;
          auVar156._16_4_ = fVar241 + auVar274._16_4_ * fVar208;
          auVar156._20_4_ = fVar241 + auVar274._20_4_ * fVar208;
          auVar156._24_4_ = fVar241 + auVar274._24_4_ * fVar208;
          auVar156._28_4_ = fVar241 + fVar208;
          auVar66 = vmaxps_avx(auVar156,_DAT_005f31a0);
          auVar152 = vminps_avx(auVar256,auVar66);
LAB_004a7327:
          auVar207 = ZEXT436(auVar152._28_4_);
          auVar274._0_4_ = auVar274._0_4_ * auVar152._0_4_;
          auVar274._4_4_ = auVar274._4_4_ * auVar152._4_4_;
          auVar274._8_4_ = auVar274._8_4_ * auVar152._8_4_;
          auVar274._12_4_ = auVar274._12_4_ * auVar152._12_4_;
          auVar274._16_4_ = auVar274._16_4_ * auVar152._16_4_;
          auVar274._20_4_ = auVar274._20_4_ * auVar152._20_4_;
          auVar274._24_4_ = auVar274._24_4_ * auVar152._24_4_;
        }
        auVar85._0_4_ = auVar110._0_4_ * fVar87;
        auVar85._4_4_ = auVar110._4_4_ * fVar86;
        auVar85._8_4_ = auVar110._8_4_ * fVar111;
        auVar85._12_4_ = auVar110._12_4_ * fVar112;
        auVar85._16_4_ = auVar110._16_4_ * fVar113;
        auVar85._20_4_ = auVar110._20_4_ * fVar65;
        auVar85._24_4_ = auVar110._24_4_ * fVar345;
        auVar85._28_36_ = auVar207;
        auVar285._0_4_ = auVar274._0_4_ * fVar87;
        auVar285._4_4_ = auVar274._4_4_ * fVar86;
        auVar285._8_4_ = auVar274._8_4_ * fVar111;
        auVar285._12_4_ = auVar274._12_4_ * fVar112;
        auVar285._16_4_ = auVar274._16_4_ * fVar113;
        auVar285._20_4_ = auVar274._20_4_ * fVar65;
        auVar285._28_36_ = auVar110._28_36_;
        auVar285._24_4_ = auVar274._24_4_ * fVar345;
        auVar66 = vandps_avx(in_ZMM13._0_32_,auVar85._0_32_);
        auVar5 = vandps_avx(auVar285._0_32_,in_ZMM13._0_32_);
        auVar66 = vorps_avx(auVar66,auVar70);
        auVar5 = vorps_avx(auVar5,auVar70);
        auVar116._0_4_ = (int)(auVar66._0_4_ + auVar85._0_4_);
        auVar116._4_4_ = (int)(auVar66._4_4_ + auVar85._4_4_);
        auVar116._8_4_ = (int)(auVar66._8_4_ + auVar85._8_4_);
        auVar116._12_4_ = (int)(auVar66._12_4_ + auVar85._12_4_);
        auVar157._16_4_ = (int)(auVar66._16_4_ + auVar85._16_4_);
        auVar157._0_16_ = auVar116;
        auVar157._20_4_ = (int)(auVar66._20_4_ + auVar85._20_4_);
        auVar157._24_4_ = (int)(auVar66._24_4_ + auVar85._24_4_);
        auVar157._28_4_ = (int)(auVar66._28_4_ + auVar207._0_4_);
        auVar215._0_4_ = (int)(auVar285._0_4_ + auVar5._0_4_);
        auVar215._4_4_ = (int)(auVar285._4_4_ + auVar5._4_4_);
        auVar215._8_4_ = (int)(auVar285._8_4_ + auVar5._8_4_);
        auVar215._12_4_ = (int)(auVar285._12_4_ + auVar5._12_4_);
        auVar237._16_4_ = (int)(auVar285._16_4_ + auVar5._16_4_);
        auVar237._0_16_ = auVar215;
        auVar237._20_4_ = (int)(auVar285._20_4_ + auVar5._20_4_);
        auVar237._24_4_ = (int)(auVar285._24_4_ + auVar5._24_4_);
        auVar237._28_4_ = (int)(auVar110._28_4_ + auVar5._28_4_);
        in_ZMM11 = ZEXT1664(auVar237._16_16_);
        auVar315 = vpackssdw_avx(auVar116,auVar157._16_16_);
        auVar333 = vpackssdw_avx(auVar215,auVar237._16_16_);
        auVar315 = vpminsw_avx(auVar315,auVar43._0_16_);
        auVar333 = vpminsw_avx(auVar333,auVar43._0_16_);
        auVar315 = vpmaxsw_avx(auVar315,in_ZMM7._0_16_);
        auVar333 = vpmaxsw_avx(auVar333,in_ZMM7._0_16_);
        auVar315 = vpacksswb_avx(auVar315,auVar333);
        *(undefined1 (*) [16])ptr = auVar315;
        intptr = (int *)((long)intptr + 0x40);
        ptr = (char *)((long)ptr + 0x10);
        iVar29 = iVar29 + 0x10;
      } while (iVar29 < (int)uVar31);
    }
    if ((int)(uVar27 | 7) < (int)uVar31) {
      pfVar4 = (float *)activation_params->data;
      auVar43 = ZEXT3264(CONCAT428(0x80000000,
                                   CONCAT424(0x80000000,
                                             CONCAT420(0x80000000,
                                                       CONCAT416(0x80000000,
                                                                 CONCAT412(0x80000000,
                                                                           CONCAT48(0x80000000,
                                                                                                                                                                        
                                                  0x8000000080000000)))))));
      auVar71._8_4_ = 0x3f000000;
      auVar71._0_8_ = 0x3f0000003f000000;
      auVar71._12_4_ = 0x3f000000;
      auVar71._16_4_ = 0x3f000000;
      auVar71._20_4_ = 0x3f000000;
      auVar71._24_4_ = 0x3f000000;
      auVar71._28_4_ = 0x3f000000;
      auVar85 = ZEXT1664(CONCAT412(0x7f007f,CONCAT48(0x7f007f,0x7f007f007f007f)));
      auVar110 = ZEXT1664(CONCAT412(0xff81ff81,CONCAT48(0xff81ff81,0xff81ff81ff81ff81)));
      auVar352 = ZEXT1664((undefined1  [16])0x0);
      auVar285 = ZEXT3264(CONCAT428(0x42b0c0a5,
                                    CONCAT424(0x42b0c0a5,
                                              CONCAT420(0x42b0c0a5,
                                                        CONCAT416(0x42b0c0a5,
                                                                  CONCAT412(0x42b0c0a5,
                                                                            CONCAT48(0x42b0c0a5,
                                                                                                                                                                          
                                                  0x42b0c0a542b0c0a5)))))));
      auVar267._8_4_ = 0x3f800000;
      auVar267._0_8_ = 0x3f8000003f800000;
      auVar267._12_4_ = 0x3f800000;
      auVar267._16_4_ = 0x3f800000;
      auVar267._20_4_ = 0x3f800000;
      auVar267._24_4_ = 0x3f800000;
      auVar267._28_4_ = 0x3f800000;
      uVar28 = uVar27;
      do {
        auVar247 = in_ZMM7._28_36_;
        auVar66 = vcvtdq2ps_avx(*(undefined1 (*) [32])intptr);
        auVar252._0_4_ = auVar66._0_4_ * (float)local_d8._0_4_;
        auVar252._4_4_ = auVar66._4_4_ * (float)local_d8._4_4_;
        auVar252._8_4_ = auVar66._8_4_ * fStack_d0;
        auVar252._12_4_ = auVar66._12_4_ * fStack_cc;
        auVar252._16_4_ = auVar66._16_4_ * fStack_c8;
        auVar252._20_4_ = auVar66._20_4_ * fStack_c4;
        auVar252._24_4_ = auVar66._24_4_ * fStack_c0;
        auVar21._28_4_ = auVar66._28_4_;
        auVar21._0_28_ = auVar252;
        auVar70 = auVar352._0_32_;
        auVar256 = auVar285._0_32_;
        switch(activation_type) {
        case 1:
          auVar66 = vmaxps_avx(auVar21,auVar70);
          auVar252 = auVar66._0_28_;
          break;
        case 2:
          auVar66 = vmaxps_avx(auVar21,auVar70);
          in_ZMM12 = ZEXT3264(auVar66);
          auVar70 = vminps_avx(auVar21,auVar70);
          fVar208 = *pfVar4;
          in_ZMM13 = ZEXT3264(CONCAT428(fVar208,CONCAT424(fVar208,CONCAT420(fVar208,CONCAT416(
                                                  fVar208,CONCAT412(fVar208,CONCAT48(fVar208,
                                                  CONCAT44(fVar208,fVar208))))))));
          auVar252._0_4_ = fVar208 * auVar70._0_4_ + auVar66._0_4_;
          auVar252._4_4_ = fVar208 * auVar70._4_4_ + auVar66._4_4_;
          auVar252._8_4_ = fVar208 * auVar70._8_4_ + auVar66._8_4_;
          auVar252._12_4_ = fVar208 * auVar70._12_4_ + auVar66._12_4_;
          auVar252._16_4_ = fVar208 * auVar70._16_4_ + auVar66._16_4_;
          auVar252._20_4_ = fVar208 * auVar70._20_4_ + auVar66._20_4_;
          auVar252._24_4_ = fVar208 * auVar70._24_4_ + auVar66._24_4_;
          break;
        case 3:
          fVar208 = *pfVar4;
          auVar304._4_4_ = fVar208;
          auVar304._0_4_ = fVar208;
          auVar304._8_4_ = fVar208;
          auVar304._12_4_ = fVar208;
          auVar304._16_4_ = fVar208;
          auVar304._20_4_ = fVar208;
          auVar304._24_4_ = fVar208;
          auVar304._28_4_ = fVar208;
          in_ZMM12 = ZEXT3264(auVar304);
          fVar208 = pfVar4[1];
          auVar331._4_4_ = fVar208;
          auVar331._0_4_ = fVar208;
          auVar331._8_4_ = fVar208;
          auVar331._12_4_ = fVar208;
          auVar331._16_4_ = fVar208;
          auVar331._20_4_ = fVar208;
          auVar331._24_4_ = fVar208;
          auVar331._28_4_ = fVar208;
          in_ZMM13 = ZEXT3264(auVar331);
          auVar66 = vmaxps_avx(auVar21,auVar304);
          auVar66 = vminps_avx(auVar66,auVar331);
          auVar252 = auVar66._0_28_;
          break;
        case 4:
          auVar257._0_4_ = (uint)auVar252._0_4_ ^ auVar43._0_4_;
          auVar257._4_4_ = (uint)auVar252._4_4_ ^ auVar43._4_4_;
          auVar257._8_4_ = (uint)auVar252._8_4_ ^ auVar43._8_4_;
          auVar257._12_4_ = (uint)auVar252._12_4_ ^ auVar43._12_4_;
          auVar257._16_4_ = (uint)auVar252._16_4_ ^ auVar43._16_4_;
          auVar257._20_4_ = (uint)auVar252._20_4_ ^ auVar43._20_4_;
          auVar257._24_4_ = (uint)auVar252._24_4_ ^ auVar43._24_4_;
          auVar257._28_4_ = auVar66._28_4_ ^ auVar43._28_4_;
          auVar66 = vminps_avx(auVar257,auVar256);
          auVar204._8_4_ = 0xc2b0c0a5;
          auVar204._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar204._12_4_ = 0xc2b0c0a5;
          auVar204._16_4_ = 0xc2b0c0a5;
          auVar204._20_4_ = 0xc2b0c0a5;
          auVar204._24_4_ = 0xc2b0c0a5;
          auVar204._28_4_ = 0xc2b0c0a5;
          auVar247 = ZEXT436(0xc2b0c0a5);
          auVar70 = vmaxps_avx(auVar66,auVar204);
          auVar305._0_4_ = auVar70._0_4_ * 1.442695 + 0.5;
          auVar305._4_4_ = auVar70._4_4_ * 1.442695 + 0.5;
          auVar305._8_4_ = auVar70._8_4_ * 1.442695 + 0.5;
          auVar305._12_4_ = auVar70._12_4_ * 1.442695 + 0.5;
          auVar305._16_4_ = auVar70._16_4_ * 1.442695 + 0.5;
          auVar305._20_4_ = auVar70._20_4_ * 1.442695 + 0.5;
          auVar305._24_4_ = auVar70._24_4_ * 1.442695 + 0.5;
          auVar305._28_4_ = in_ZMM12._28_4_ + 0.5;
          auVar256 = vroundps_avx(auVar305,1);
          auVar66 = vcmpps_avx(auVar305,auVar256,1);
          auVar66 = vandps_avx(auVar66,auVar267);
          auVar66 = vsubps_avx(auVar256,auVar66);
          fVar208 = auVar70._0_4_ + auVar66._0_4_ * -0.6931472;
          fVar241 = auVar70._4_4_ + auVar66._4_4_ * -0.6931472;
          fVar242 = auVar70._8_4_ + auVar66._8_4_ * -0.6931472;
          fVar243 = auVar70._12_4_ + auVar66._12_4_ * -0.6931472;
          fVar244 = auVar70._16_4_ + auVar66._16_4_ * -0.6931472;
          fVar245 = auVar70._20_4_ + auVar66._20_4_ * -0.6931472;
          fVar246 = auVar70._24_4_ + auVar66._24_4_ * -0.6931472;
          auVar290._0_4_ = (int)auVar66._0_4_;
          auVar290._4_4_ = (int)auVar66._4_4_;
          auVar290._8_4_ = (int)auVar66._8_4_;
          auVar290._12_4_ = (int)auVar66._12_4_;
          auVar306._16_4_ = (int)auVar66._16_4_;
          auVar306._0_16_ = auVar290;
          auVar306._20_4_ = (int)auVar66._20_4_;
          auVar306._24_4_ = (int)auVar66._24_4_;
          auVar306._28_4_ = (int)auVar66._28_4_;
          auVar333 = vpslld_avx(auVar290,0x17);
          auVar315 = vpslld_avx(auVar306._16_16_,0x17);
          auVar73._8_4_ = 0x3f800000;
          auVar73._0_8_ = 0x3f8000003f800000;
          auVar73._12_4_ = 0x3f800000;
          auVar315 = vpaddd_avx(auVar315,auVar73);
          auVar333 = vpaddd_avx(auVar333,auVar73);
          in_ZMM13 = ZEXT1664(auVar333);
          in_ZMM12 = ZEXT3264(CONCAT1616(auVar315,auVar333));
          auVar258._0_4_ =
               (fVar208 + 1.0 +
               fVar208 * fVar208 *
               (((((fVar208 * 0.00019875691 + 0.0013981999) * fVar208 + 0.008333452) * fVar208 +
                 0.041665796) * fVar208 + 0.16666666) * fVar208 + 0.5)) * auVar333._0_4_ + 1.0;
          auVar258._4_4_ =
               (fVar241 + 1.0 +
               fVar241 * fVar241 *
               (((((fVar241 * 0.00019875691 + 0.0013981999) * fVar241 + 0.008333452) * fVar241 +
                 0.041665796) * fVar241 + 0.16666666) * fVar241 + 0.5)) * auVar333._4_4_ + 1.0;
          auVar258._8_4_ =
               (fVar242 + 1.0 +
               fVar242 * fVar242 *
               (((((fVar242 * 0.00019875691 + 0.0013981999) * fVar242 + 0.008333452) * fVar242 +
                 0.041665796) * fVar242 + 0.16666666) * fVar242 + 0.5)) * auVar333._8_4_ + 1.0;
          auVar258._12_4_ =
               (fVar243 + 1.0 +
               fVar243 * fVar243 *
               (((((fVar243 * 0.00019875691 + 0.0013981999) * fVar243 + 0.008333452) * fVar243 +
                 0.041665796) * fVar243 + 0.16666666) * fVar243 + 0.5)) * auVar333._12_4_ + 1.0;
          auVar258._16_4_ =
               (fVar244 + 1.0 +
               fVar244 * fVar244 *
               (((((fVar244 * 0.00019875691 + 0.0013981999) * fVar244 + 0.008333452) * fVar244 +
                 0.041665796) * fVar244 + 0.16666666) * fVar244 + 0.5)) * auVar315._0_4_ + 1.0;
          auVar258._20_4_ =
               (fVar245 + 1.0 +
               fVar245 * fVar245 *
               (((((fVar245 * 0.00019875691 + 0.0013981999) * fVar245 + 0.008333452) * fVar245 +
                 0.041665796) * fVar245 + 0.16666666) * fVar245 + 0.5)) * auVar315._4_4_ + 1.0;
          auVar258._24_4_ =
               (fVar246 + 1.0 +
               fVar246 * fVar246 *
               (((((fVar246 * 0.00019875691 + 0.0013981999) * fVar246 + 0.008333452) * fVar246 +
                 0.041665796) * fVar246 + 0.16666666) * fVar246 + 0.5)) * auVar315._8_4_ + 1.0;
          auVar258._28_4_ = auVar70._28_4_ + auVar256._28_4_ + 1.0 + auVar256._28_4_ + 1.0;
          auVar66 = vdivps_avx(auVar267,auVar258);
          auVar252 = auVar66._0_28_;
          break;
        case 5:
          auVar66 = vminps_avx(auVar21,auVar256);
          auVar238._8_4_ = 0xc2b0c0a5;
          auVar238._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar238._12_4_ = 0xc2b0c0a5;
          auVar238._16_4_ = 0xc2b0c0a5;
          auVar238._20_4_ = 0xc2b0c0a5;
          auVar238._24_4_ = 0xc2b0c0a5;
          auVar238._28_4_ = 0xc2b0c0a5;
          auVar70 = vmaxps_avx(auVar66,auVar238);
          auVar329._0_4_ = auVar70._0_4_ * 1.442695 + 0.5;
          auVar329._4_4_ = auVar70._4_4_ * 1.442695 + 0.5;
          auVar329._8_4_ = auVar70._8_4_ * 1.442695 + 0.5;
          auVar329._12_4_ = auVar70._12_4_ * 1.442695 + 0.5;
          auVar329._16_4_ = auVar70._16_4_ * 1.442695 + 0.5;
          auVar329._20_4_ = auVar70._20_4_ * 1.442695 + 0.5;
          auVar329._24_4_ = auVar70._24_4_ * 1.442695 + 0.5;
          auVar329._28_4_ = in_ZMM13._28_4_ + 0.5;
          auVar5 = vroundps_avx(auVar329,1);
          auVar66 = vcmpps_avx(auVar329,auVar5,1);
          auVar66 = vandps_avx(auVar66,auVar267);
          auVar66 = vsubps_avx(auVar5,auVar66);
          auVar22._4_4_ = auVar66._4_4_ * 0.6931472;
          auVar22._0_4_ = auVar66._0_4_ * 0.6931472;
          auVar22._8_4_ = auVar66._8_4_ * 0.6931472;
          auVar22._12_4_ = auVar66._12_4_ * 0.6931472;
          auVar22._16_4_ = auVar66._16_4_ * 0.6931472;
          auVar22._20_4_ = auVar66._20_4_ * 0.6931472;
          auVar22._24_4_ = auVar66._24_4_ * 0.6931472;
          auVar22._28_4_ = auVar5._28_4_;
          auVar70 = vsubps_avx(auVar70,auVar22);
          fVar208 = auVar70._0_4_;
          fVar241 = auVar70._4_4_;
          fVar242 = auVar70._8_4_;
          fVar243 = auVar70._12_4_;
          fVar244 = auVar70._16_4_;
          fVar245 = auVar70._20_4_;
          fVar246 = auVar70._24_4_;
          auVar318._0_4_ = (int)auVar66._0_4_;
          auVar318._4_4_ = (int)auVar66._4_4_;
          auVar318._8_4_ = (int)auVar66._8_4_;
          auVar318._12_4_ = (int)auVar66._12_4_;
          auVar330._16_4_ = (int)auVar66._16_4_;
          auVar330._0_16_ = auVar318;
          auVar330._20_4_ = (int)auVar66._20_4_;
          auVar330._24_4_ = (int)auVar66._24_4_;
          auVar330._28_4_ = (int)auVar66._28_4_;
          auVar333 = vpslld_avx(auVar318,0x17);
          auVar315 = vpslld_avx(auVar330._16_16_,0x17);
          auVar72._8_4_ = 0x3f800000;
          auVar72._0_8_ = 0x3f8000003f800000;
          auVar72._12_4_ = 0x3f800000;
          auVar315 = vpaddd_avx(auVar315,auVar72);
          auVar333 = vpaddd_avx(auVar333,auVar72);
          auVar303._0_4_ =
               (fVar208 + 1.0 +
               fVar208 * fVar208 *
               (((((fVar208 * 0.00019875691 + 0.0013981999) * fVar208 + 0.008333452) * fVar208 +
                 0.041665796) * fVar208 + 0.16666666) * fVar208 + 0.5)) * auVar333._0_4_ + 1.0;
          auVar303._4_4_ =
               (fVar241 + 1.0 +
               fVar241 * fVar241 *
               (((((fVar241 * 0.00019875691 + 0.0013981999) * fVar241 + 0.008333452) * fVar241 +
                 0.041665796) * fVar241 + 0.16666666) * fVar241 + 0.5)) * auVar333._4_4_ + 1.0;
          auVar303._8_4_ =
               (fVar242 + 1.0 +
               fVar242 * fVar242 *
               (((((fVar242 * 0.00019875691 + 0.0013981999) * fVar242 + 0.008333452) * fVar242 +
                 0.041665796) * fVar242 + 0.16666666) * fVar242 + 0.5)) * auVar333._8_4_ + 1.0;
          auVar303._12_4_ =
               (fVar243 + 1.0 +
               fVar243 * fVar243 *
               (((((fVar243 * 0.00019875691 + 0.0013981999) * fVar243 + 0.008333452) * fVar243 +
                 0.041665796) * fVar243 + 0.16666666) * fVar243 + 0.5)) * auVar333._12_4_ + 1.0;
          auVar303._16_4_ =
               (fVar244 + 1.0 +
               fVar244 * fVar244 *
               (((((fVar244 * 0.00019875691 + 0.0013981999) * fVar244 + 0.008333452) * fVar244 +
                 0.041665796) * fVar244 + 0.16666666) * fVar244 + 0.5)) * auVar315._0_4_ + 1.0;
          auVar303._20_4_ =
               (fVar245 + 1.0 +
               fVar245 * fVar245 *
               (((((fVar245 * 0.00019875691 + 0.0013981999) * fVar245 + 0.008333452) * fVar245 +
                 0.041665796) * fVar245 + 0.16666666) * fVar245 + 0.5)) * auVar315._4_4_ + 1.0;
          auVar303._24_4_ =
               (fVar246 + 1.0 +
               fVar246 * fVar246 *
               (((((fVar246 * 0.00019875691 + 0.0013981999) * fVar246 + 0.008333452) * fVar246 +
                 0.041665796) * fVar246 + 0.16666666) * fVar246 + 0.5)) * auVar315._8_4_ + 1.0;
          auVar303._28_4_ = auVar70._28_4_ + 1.0 + auVar5._28_4_ + 1.0;
          auVar198._8_4_ = 0x800000;
          auVar198._0_8_ = 0x80000000800000;
          auVar198._12_4_ = 0x800000;
          auVar198._16_4_ = 0x800000;
          auVar198._20_4_ = 0x800000;
          auVar198._24_4_ = 0x800000;
          auVar198._28_4_ = 0x800000;
          auVar5 = vmaxps_avx(auVar303,auVar198);
          auVar315 = vpsrld_avx(auVar5._16_16_,0x17);
          auVar199._8_4_ = 0x807fffff;
          auVar199._0_8_ = 0x807fffff807fffff;
          auVar199._12_4_ = 0x807fffff;
          auVar199._16_4_ = 0x807fffff;
          auVar199._20_4_ = 0x807fffff;
          auVar199._24_4_ = 0x807fffff;
          auVar199._28_4_ = 0x807fffff;
          auVar66 = vandps_avx(auVar5,auVar199);
          auVar148 = vorps_avx(auVar66,auVar71);
          auVar200._8_4_ = 0x3f3504f3;
          auVar200._0_8_ = 0x3f3504f33f3504f3;
          auVar200._12_4_ = 0x3f3504f3;
          auVar200._16_4_ = 0x3f3504f3;
          auVar200._20_4_ = 0x3f3504f3;
          auVar200._24_4_ = 0x3f3504f3;
          auVar200._28_4_ = 0x3f3504f3;
          auVar70 = vcmpps_avx(auVar200,auVar148,2);
          auVar66 = vandnps_avx(auVar70,auVar148);
          fVar208 = auVar148._0_4_ + -1.0 + auVar66._0_4_;
          fVar241 = auVar148._4_4_ + -1.0 + auVar66._4_4_;
          fVar242 = auVar148._8_4_ + -1.0 + auVar66._8_4_;
          fVar243 = auVar148._12_4_ + -1.0 + auVar66._12_4_;
          fVar244 = auVar148._16_4_ + -1.0 + auVar66._16_4_;
          fVar245 = auVar148._20_4_ + -1.0 + auVar66._20_4_;
          fVar246 = auVar148._24_4_ + -1.0 + auVar66._24_4_;
          fVar357 = auVar148._28_4_ + -1.0 + auVar66._28_4_;
          auVar315 = vpsubd_avx(auVar315,auVar70._16_16_);
          auVar285 = ZEXT3264(auVar256);
          auVar352 = ZEXT864(0) << 0x20;
          auVar333 = vpsrld_avx(auVar5._0_16_,0x17);
          auVar216._8_4_ = 0xffffff81;
          auVar216._0_8_ = 0xffffff81ffffff81;
          auVar216._12_4_ = 0xffffff81;
          auVar315 = vpaddd_avx(auVar216,auVar315);
          auVar333 = vpsubd_avx(auVar333,auVar70._0_16_);
          auVar333 = vpaddd_avx(auVar333,auVar216);
          auVar201._16_16_ = auVar315;
          auVar201._0_16_ = auVar333;
          auVar66 = vcmpps_avx(auVar303,ZEXT832(0) << 0x20,2);
          auVar70 = vcvtdq2ps_avx(auVar201);
          auVar23._4_4_ =
               (fVar241 * fVar241 *
                (((((((((fVar241 * 0.070376836 + -0.1151461) * fVar241 + 0.116769984) * fVar241 +
                      -0.12420141) * fVar241 + 0.14249323) * fVar241 + -0.16668057) * fVar241 +
                   0.20000714) * fVar241 + -0.24999994) * fVar241 + 0.3333333) * fVar241 + -0.5) +
               fVar241 + auVar70._4_4_ * 0.6931472) * -2.0;
          auVar23._0_4_ =
               (fVar208 * fVar208 *
                (((((((((fVar208 * 0.070376836 + -0.1151461) * fVar208 + 0.116769984) * fVar208 +
                      -0.12420141) * fVar208 + 0.14249323) * fVar208 + -0.16668057) * fVar208 +
                   0.20000714) * fVar208 + -0.24999994) * fVar208 + 0.3333333) * fVar208 + -0.5) +
               fVar208 + auVar70._0_4_ * 0.6931472) * -2.0;
          auVar23._8_4_ =
               (fVar242 * fVar242 *
                (((((((((fVar242 * 0.070376836 + -0.1151461) * fVar242 + 0.116769984) * fVar242 +
                      -0.12420141) * fVar242 + 0.14249323) * fVar242 + -0.16668057) * fVar242 +
                   0.20000714) * fVar242 + -0.24999994) * fVar242 + 0.3333333) * fVar242 + -0.5) +
               fVar242 + auVar70._8_4_ * 0.6931472) * -2.0;
          auVar23._12_4_ =
               (fVar243 * fVar243 *
                (((((((((fVar243 * 0.070376836 + -0.1151461) * fVar243 + 0.116769984) * fVar243 +
                      -0.12420141) * fVar243 + 0.14249323) * fVar243 + -0.16668057) * fVar243 +
                   0.20000714) * fVar243 + -0.24999994) * fVar243 + 0.3333333) * fVar243 + -0.5) +
               fVar243 + auVar70._12_4_ * 0.6931472) * -2.0;
          auVar23._16_4_ =
               (fVar244 * fVar244 *
                (((((((((fVar244 * 0.070376836 + -0.1151461) * fVar244 + 0.116769984) * fVar244 +
                      -0.12420141) * fVar244 + 0.14249323) * fVar244 + -0.16668057) * fVar244 +
                   0.20000714) * fVar244 + -0.24999994) * fVar244 + 0.3333333) * fVar244 + -0.5) +
               fVar244 + auVar70._16_4_ * 0.6931472) * -2.0;
          auVar23._20_4_ =
               (fVar245 * fVar245 *
                (((((((((fVar245 * 0.070376836 + -0.1151461) * fVar245 + 0.116769984) * fVar245 +
                      -0.12420141) * fVar245 + 0.14249323) * fVar245 + -0.16668057) * fVar245 +
                   0.20000714) * fVar245 + -0.24999994) * fVar245 + 0.3333333) * fVar245 + -0.5) +
               fVar245 + auVar70._20_4_ * 0.6931472) * -2.0;
          auVar23._24_4_ =
               (fVar246 * fVar246 *
                (((((((((fVar246 * 0.070376836 + -0.1151461) * fVar246 + 0.116769984) * fVar246 +
                      -0.12420141) * fVar246 + 0.14249323) * fVar246 + -0.16668057) * fVar246 +
                   0.20000714) * fVar246 + -0.24999994) * fVar246 + 0.3333333) * fVar246 + -0.5) +
               fVar246 + auVar70._24_4_ * 0.6931472) * -2.0;
          auVar23._28_4_ = fVar357 + auVar70._28_4_ + 0.0;
          auVar239._8_4_ = 0x7fffffff;
          auVar239._0_8_ = 0x7fffffff7fffffff;
          auVar239._12_4_ = 0x7fffffff;
          auVar239._16_4_ = 0x7fffffff;
          auVar239._20_4_ = 0x7fffffff;
          auVar239._24_4_ = 0x7fffffff;
          auVar239._28_4_ = 0x7fffffff;
          auVar66 = vblendvps_avx(auVar23,auVar239,auVar66);
          auVar66 = vminps_avx(auVar256,auVar66);
          auVar240._8_4_ = 0xc2b0c0a5;
          auVar240._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar240._12_4_ = 0xc2b0c0a5;
          auVar240._16_4_ = 0xc2b0c0a5;
          auVar240._20_4_ = 0xc2b0c0a5;
          auVar240._24_4_ = 0xc2b0c0a5;
          auVar240._28_4_ = 0xc2b0c0a5;
          auVar70 = vmaxps_avx(auVar240,auVar66);
          auVar85 = ZEXT1664(auVar85._0_16_);
          auVar110 = ZEXT1664(auVar110._0_16_);
          auVar43 = ZEXT3264(CONCAT428(0x80000000,
                                       CONCAT424(0x80000000,
                                                 CONCAT420(0x80000000,
                                                           CONCAT416(0x80000000,
                                                                     CONCAT412(0x80000000,
                                                                               CONCAT48(0x80000000,
                                                                                                                                                                                
                                                  0x8000000080000000)))))));
          auVar283._0_4_ = auVar70._0_4_ * 1.442695 + 0.5;
          auVar283._4_4_ = auVar70._4_4_ * 1.442695 + 0.5;
          auVar283._8_4_ = auVar70._8_4_ * 1.442695 + 0.5;
          auVar283._12_4_ = auVar70._12_4_ * 1.442695 + 0.5;
          auVar283._16_4_ = auVar70._16_4_ * 1.442695 + 0.5;
          auVar283._20_4_ = auVar70._20_4_ * 1.442695 + 0.5;
          auVar283._24_4_ = auVar70._24_4_ * 1.442695 + 0.5;
          auVar283._28_4_ = 0x3f000000;
          auVar256 = vroundps_avx(auVar283,1);
          auVar66 = vcmpps_avx(auVar283,auVar256,1);
          auVar66 = vandps_avx(auVar66,auVar267);
          auVar66 = vsubps_avx(auVar256,auVar66);
          auVar24._4_4_ = auVar66._4_4_ * 0.6931472;
          auVar24._0_4_ = auVar66._0_4_ * 0.6931472;
          auVar24._8_4_ = auVar66._8_4_ * 0.6931472;
          auVar24._12_4_ = auVar66._12_4_ * 0.6931472;
          auVar24._16_4_ = auVar66._16_4_ * 0.6931472;
          auVar24._20_4_ = auVar66._20_4_ * 0.6931472;
          auVar24._24_4_ = auVar66._24_4_ * 0.6931472;
          auVar24._28_4_ = auVar256._28_4_;
          auVar70 = vsubps_avx(auVar70,auVar24);
          fVar208 = auVar70._0_4_;
          fVar241 = auVar70._4_4_;
          fVar242 = auVar70._8_4_;
          fVar243 = auVar70._12_4_;
          fVar244 = auVar70._16_4_;
          fVar245 = auVar70._20_4_;
          fVar246 = auVar70._24_4_;
          fVar346 = ((((fVar208 * 0.00019875691 + 0.0013981999) * fVar208 + 0.008333452) * fVar208 +
                     0.041665796) * fVar208 + 0.16666666) * fVar208 + 0.5;
          fVar347 = ((((fVar241 * 0.00019875691 + 0.0013981999) * fVar241 + 0.008333452) * fVar241 +
                     0.041665796) * fVar241 + 0.16666666) * fVar241 + 0.5;
          fVar348 = ((((fVar242 * 0.00019875691 + 0.0013981999) * fVar242 + 0.008333452) * fVar242 +
                     0.041665796) * fVar242 + 0.16666666) * fVar242 + 0.5;
          fVar349 = ((((fVar243 * 0.00019875691 + 0.0013981999) * fVar243 + 0.008333452) * fVar243 +
                     0.041665796) * fVar243 + 0.16666666) * fVar243 + 0.5;
          fVar354 = ((((fVar244 * 0.00019875691 + 0.0013981999) * fVar244 + 0.008333452) * fVar244 +
                     0.041665796) * fVar244 + 0.16666666) * fVar244 + 0.5;
          fVar355 = ((((fVar245 * 0.00019875691 + 0.0013981999) * fVar245 + 0.008333452) * fVar245 +
                     0.041665796) * fVar245 + 0.16666666) * fVar245 + 0.5;
          fVar356 = ((((fVar246 * 0.00019875691 + 0.0013981999) * fVar246 + 0.008333452) * fVar246 +
                     0.041665796) * fVar246 + 0.16666666) * fVar246 + 0.5;
          in_ZMM13 = ZEXT3264(CONCAT428(fVar357 + 0.0013981999 + 0.008333452 + 0.041665796 +
                                        0.16666666 + 0.5,
                                        CONCAT424(fVar356,CONCAT420(fVar355,CONCAT416(fVar354,
                                                  CONCAT412(fVar349,CONCAT48(fVar348,CONCAT44(
                                                  fVar347,fVar346))))))));
          auVar273._0_4_ = (int)auVar66._0_4_;
          auVar273._4_4_ = (int)auVar66._4_4_;
          auVar273._8_4_ = (int)auVar66._8_4_;
          auVar273._12_4_ = (int)auVar66._12_4_;
          auVar284._16_4_ = (int)auVar66._16_4_;
          auVar284._0_16_ = auVar273;
          auVar284._20_4_ = (int)auVar66._20_4_;
          auVar284._24_4_ = (int)auVar66._24_4_;
          auVar284._28_4_ = (int)auVar66._28_4_;
          auVar333 = vpslld_avx(auVar273,0x17);
          auVar315 = vpslld_avx(auVar284._16_16_,0x17);
          auVar315 = vpaddd_avx(auVar315,auVar72);
          auVar333 = vpaddd_avx(auVar333,auVar72);
          in_ZMM12 = ZEXT1664(auVar333);
          auVar202._0_4_ = auVar333._0_4_ * (fVar208 * fVar208 * fVar346 + fVar208 + 1.0) + 1.0;
          auVar202._4_4_ = auVar333._4_4_ * (fVar241 * fVar241 * fVar347 + fVar241 + 1.0) + 1.0;
          auVar202._8_4_ = auVar333._8_4_ * (fVar242 * fVar242 * fVar348 + fVar242 + 1.0) + 1.0;
          auVar202._12_4_ = auVar333._12_4_ * (fVar243 * fVar243 * fVar349 + fVar243 + 1.0) + 1.0;
          auVar202._16_4_ = auVar315._0_4_ * (fVar244 * fVar244 * fVar354 + fVar244 + 1.0) + 1.0;
          auVar202._20_4_ = auVar315._4_4_ * (fVar245 * fVar245 * fVar355 + fVar245 + 1.0) + 1.0;
          auVar202._24_4_ = auVar315._8_4_ * (fVar246 * fVar246 * fVar356 + fVar246 + 1.0) + 1.0;
          auVar202._28_4_ = auVar256._28_4_ + auVar70._28_4_ + 1.0 + 1.0;
          auVar84._8_4_ = 0x40000000;
          auVar84._0_8_ = 0x4000000040000000;
          auVar84._12_4_ = 0x40000000;
          auVar84._16_4_ = 0x40000000;
          auVar84._20_4_ = 0x40000000;
          auVar84._24_4_ = 0x40000000;
          auVar84._28_4_ = 0x40000000;
          auVar66 = vdivps_avx(auVar84,auVar202);
          auVar203._0_4_ = auVar66._0_4_ + -1.0;
          auVar203._4_4_ = auVar66._4_4_ + -1.0;
          auVar203._8_4_ = auVar66._8_4_ + -1.0;
          auVar203._12_4_ = auVar66._12_4_ + -1.0;
          auVar203._16_4_ = auVar66._16_4_ + -1.0;
          auVar203._20_4_ = auVar66._20_4_ + -1.0;
          auVar203._24_4_ = auVar66._24_4_ + -1.0;
          auVar203._28_4_ = auVar66._28_4_ + -1.0;
          goto LAB_004a78d5;
        case 6:
          fVar208 = *pfVar4;
          fVar241 = pfVar4[1];
          auVar205._0_4_ = fVar241 + auVar252._0_4_ * fVar208;
          auVar205._4_4_ = fVar241 + auVar252._4_4_ * fVar208;
          auVar205._8_4_ = fVar241 + auVar252._8_4_ * fVar208;
          auVar205._12_4_ = fVar241 + auVar252._12_4_ * fVar208;
          auVar205._16_4_ = fVar241 + auVar252._16_4_ * fVar208;
          auVar205._20_4_ = fVar241 + auVar252._20_4_ * fVar208;
          auVar205._24_4_ = fVar241 + auVar252._24_4_ * fVar208;
          auVar205._28_4_ = fVar241 + fVar208;
          auVar66 = vmaxps_avx(auVar205,auVar70);
          auVar203 = vminps_avx(auVar267,auVar66);
LAB_004a78d5:
          auVar247 = ZEXT436(auVar203._28_4_);
          auVar252._0_4_ = auVar252._0_4_ * auVar203._0_4_;
          auVar252._4_4_ = auVar252._4_4_ * auVar203._4_4_;
          auVar252._8_4_ = auVar252._8_4_ * auVar203._8_4_;
          auVar252._12_4_ = auVar252._12_4_ * auVar203._12_4_;
          auVar252._16_4_ = auVar252._16_4_ * auVar203._16_4_;
          auVar252._20_4_ = auVar252._20_4_ * auVar203._20_4_;
          auVar252._24_4_ = auVar252._24_4_ * auVar203._24_4_;
        }
        auVar307._0_4_ = auVar252._0_4_ * fVar87;
        auVar307._4_4_ = auVar252._4_4_ * fVar86;
        auVar307._8_4_ = auVar252._8_4_ * fVar111;
        auVar307._12_4_ = auVar252._12_4_ * fVar112;
        auVar307._16_4_ = auVar252._16_4_ * fVar113;
        auVar307._20_4_ = auVar252._20_4_ * fVar65;
        auVar307._24_4_ = auVar252._24_4_ * fVar345;
        auVar307._28_36_ = auVar247;
        auVar66 = vandps_avx(auVar307._0_32_,auVar43._0_32_);
        auVar66 = vorps_avx(auVar66,auVar71);
        auVar161._0_4_ = (int)(auVar66._0_4_ + auVar307._0_4_);
        auVar161._4_4_ = (int)(auVar66._4_4_ + auVar307._4_4_);
        auVar161._8_4_ = (int)(auVar66._8_4_ + auVar307._8_4_);
        auVar161._12_4_ = (int)(auVar66._12_4_ + auVar307._12_4_);
        auVar206._16_4_ = (int)(auVar66._16_4_ + auVar307._16_4_);
        auVar206._0_16_ = auVar161;
        auVar206._20_4_ = (int)(auVar66._20_4_ + auVar307._20_4_);
        auVar206._24_4_ = (int)(auVar66._24_4_ + auVar307._24_4_);
        auVar206._28_4_ = (int)(auVar66._28_4_ + auVar247._0_4_);
        auVar315 = vpackssdw_avx(auVar161,auVar206._16_16_);
        auVar315 = vpminsw_avx(auVar85._0_16_,auVar315);
        auVar315 = vpmaxsw_avx(auVar315,auVar110._0_16_);
        auVar315 = vpacksswb_avx(auVar315,auVar315);
        in_ZMM7 = ZEXT1664(auVar315);
        *(long *)*(undefined1 (*) [16])ptr = auVar315._0_8_;
        intptr = (int *)((long)intptr + 0x20);
        ptr = *(undefined1 (*) [16])ptr + 8;
        uVar27 = uVar28 + 8;
        iVar29 = uVar28 + 0xf;
        uVar28 = uVar27;
      } while (iVar29 < (int)uVar31);
    }
    if ((int)(uVar27 | 3) < (int)uVar31) {
      auVar43 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
      auVar41._8_4_ = 0x3f000000;
      auVar41._0_8_ = 0x3f0000003f000000;
      auVar41._12_4_ = 0x3f000000;
      auVar110 = ZEXT1664(CONCAT412(0x7f007f,CONCAT48(0x7f007f,0x7f007f007f007f)));
      auVar352 = ZEXT1664(CONCAT412(0xff81ff81,CONCAT48(0xff81ff81,0xff81ff81ff81ff81)));
      auVar85 = ZEXT1664((undefined1  [16])0x0);
      auVar285 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
      auVar307 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
      auVar332 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
      auVar218._8_4_ = 0x3f800000;
      auVar218._0_8_ = 0x3f8000003f800000;
      auVar218._12_4_ = 0x3f800000;
      auVar344 = ZEXT1664(CONCAT412(0x39506967,CONCAT48(0x39506967,0x3950696739506967)));
      auVar353 = ZEXT1664(CONCAT412(0x3ab743ce,CONCAT48(0x3ab743ce,0x3ab743ce3ab743ce)));
      uVar28 = uVar27;
      do {
        auVar315 = vcvtdq2ps_avx(*(undefined1 (*) [16])*(undefined1 (*) [32])intptr);
        auVar250._0_4_ = fVar1 * auVar315._0_4_;
        auVar250._4_4_ = fVar1 * auVar315._4_4_;
        auVar250._8_4_ = fVar1 * auVar315._8_4_;
        auVar250._12_4_ = fVar1 * auVar315._12_4_;
        auVar315 = auVar85._0_16_;
        fVar87 = auVar332._0_4_;
        fVar86 = auVar332._4_4_;
        fVar111 = auVar332._8_4_;
        fVar112 = auVar332._12_4_;
        fVar113 = auVar344._0_4_;
        fVar65 = auVar344._4_4_;
        fVar345 = auVar344._8_4_;
        fVar208 = auVar344._12_4_;
        auVar259 = auVar307._0_16_;
        auVar333 = auVar285._0_16_;
        fVar241 = auVar353._0_4_;
        fVar242 = auVar353._4_4_;
        fVar243 = auVar353._8_4_;
        fVar244 = auVar353._12_4_;
        switch(activation_type) {
        case 1:
          auVar250 = vmaxps_avx(auVar250,auVar315);
          break;
        case 2:
          auVar333 = vmaxps_avx(auVar250,auVar315);
          auVar315 = vminps_avx(auVar250,auVar315);
          fVar87 = *activation_params->data;
          auVar250._0_4_ = auVar315._0_4_ * fVar87 + auVar333._0_4_;
          auVar250._4_4_ = auVar315._4_4_ * fVar87 + auVar333._4_4_;
          auVar250._8_4_ = auVar315._8_4_ * fVar87 + auVar333._8_4_;
          auVar250._12_4_ = auVar315._12_4_ * fVar87 + auVar333._12_4_;
          break;
        case 3:
          uVar3 = *activation_params->data;
          auVar101._4_4_ = uVar3;
          auVar101._0_4_ = uVar3;
          auVar101._8_4_ = uVar3;
          auVar101._12_4_ = uVar3;
          uVar3 = *(undefined4 *)((long)activation_params->data + 4);
          auVar132._4_4_ = uVar3;
          auVar132._0_4_ = uVar3;
          auVar132._8_4_ = uVar3;
          auVar132._12_4_ = uVar3;
          auVar315 = vmaxps_avx(auVar250,auVar101);
          auVar250 = vminps_avx(auVar315,auVar132);
          break;
        case 4:
          auVar102._0_4_ = (uint)auVar250._0_4_ ^ auVar43._0_4_;
          auVar102._4_4_ = (uint)auVar250._4_4_ ^ auVar43._4_4_;
          auVar102._8_4_ = (uint)auVar250._8_4_ ^ auVar43._8_4_;
          auVar102._12_4_ = (uint)auVar250._12_4_ ^ auVar43._12_4_;
          auVar315 = vminps_avx(auVar333,auVar102);
          auVar259 = vmaxps_avx(auVar259,auVar315);
          auVar133._0_4_ = fVar87 * auVar259._0_4_ + 0.5;
          auVar133._4_4_ = fVar86 * auVar259._4_4_ + 0.5;
          auVar133._8_4_ = fVar111 * auVar259._8_4_ + 0.5;
          auVar133._12_4_ = fVar112 * auVar259._12_4_ + 0.5;
          auVar251._0_4_ = (int)auVar133._0_4_;
          auVar251._4_4_ = (int)auVar133._4_4_;
          auVar251._8_4_ = (int)auVar133._8_4_;
          auVar251._12_4_ = (int)auVar133._12_4_;
          auVar333 = vcvtdq2ps_avx(auVar251);
          auVar315 = vcmpps_avx(auVar133,auVar333,1);
          auVar315 = vandps_avx(auVar218,auVar315);
          auVar315 = vsubps_avx(auVar333,auVar315);
          fVar87 = auVar315._0_4_ * -0.6931472 + auVar259._0_4_;
          fVar86 = auVar315._4_4_ * -0.6931472 + auVar259._4_4_;
          fVar111 = auVar315._8_4_ * -0.6931472 + auVar259._8_4_;
          fVar112 = auVar315._12_4_ * -0.6931472 + auVar259._12_4_;
          auVar110 = ZEXT1664(CONCAT412(0x7f007f,CONCAT48(0x7f007f,0x7f007f007f007f)));
          auVar352 = ZEXT1664(CONCAT412(0xff81ff81,CONCAT48(0xff81ff81,0xff81ff81ff81ff81)));
          auVar43 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
          auVar134._0_4_ = (int)auVar315._0_4_;
          auVar134._4_4_ = (int)auVar315._4_4_;
          auVar134._8_4_ = (int)auVar315._8_4_;
          auVar134._12_4_ = (int)auVar315._12_4_;
          auVar315 = vpslld_avx(auVar134,0x17);
          auVar315 = vpaddd_avx(auVar218,auVar315);
          auVar103._0_4_ =
               (fVar87 + 1.0 +
               fVar87 * fVar87 *
               (((((fVar241 + fVar113 * fVar87) * fVar87 + 0.008333452) * fVar87 + 0.041665796) *
                 fVar87 + 0.16666666) * fVar87 + 0.5)) * auVar315._0_4_ + 1.0;
          auVar103._4_4_ =
               (fVar86 + 1.0 +
               fVar86 * fVar86 *
               (((((fVar242 + fVar65 * fVar86) * fVar86 + 0.008333452) * fVar86 + 0.041665796) *
                 fVar86 + 0.16666666) * fVar86 + 0.5)) * auVar315._4_4_ + 1.0;
          auVar103._8_4_ =
               (fVar111 + 1.0 +
               fVar111 * fVar111 *
               (((((fVar243 + fVar345 * fVar111) * fVar111 + 0.008333452) * fVar111 + 0.041665796) *
                 fVar111 + 0.16666666) * fVar111 + 0.5)) * auVar315._8_4_ + 1.0;
          auVar103._12_4_ =
               (fVar112 + 1.0 +
               fVar112 * fVar112 *
               (((((fVar244 + fVar208 * fVar112) * fVar112 + 0.008333452) * fVar112 + 0.041665796) *
                 fVar112 + 0.16666666) * fVar112 + 0.5)) * auVar315._12_4_ + 1.0;
          auVar250 = vdivps_avx(auVar218,auVar103);
          break;
        case 5:
          auVar315 = vminps_avx(auVar250,auVar333);
          auVar44 = vmaxps_avx(auVar259,auVar315);
          auVar126._0_4_ = fVar87 * auVar44._0_4_ + 0.5;
          auVar126._4_4_ = fVar86 * auVar44._4_4_ + 0.5;
          auVar126._8_4_ = fVar111 * auVar44._8_4_ + 0.5;
          auVar126._12_4_ = fVar112 * auVar44._12_4_ + 0.5;
          auVar167._0_4_ = (int)auVar126._0_4_;
          auVar167._4_4_ = (int)auVar126._4_4_;
          auVar167._8_4_ = (int)auVar126._8_4_;
          auVar167._12_4_ = (int)auVar126._12_4_;
          auVar164 = vcvtdq2ps_avx(auVar167);
          auVar315 = vcmpps_avx(auVar126,auVar164,1);
          auVar315 = vandps_avx(auVar218,auVar315);
          auVar315 = vsubps_avx(auVar164,auVar315);
          auVar168._0_4_ = auVar315._0_4_ * 0.6931472;
          auVar168._4_4_ = auVar315._4_4_ * 0.6931472;
          auVar168._8_4_ = auVar315._8_4_ * 0.6931472;
          auVar168._12_4_ = auVar315._12_4_ * 0.6931472;
          auVar164 = vsubps_avx(auVar44,auVar168);
          fVar245 = auVar164._0_4_;
          fVar246 = auVar164._4_4_;
          fVar346 = auVar164._8_4_;
          fVar347 = auVar164._12_4_;
          auVar127._0_4_ = (int)auVar315._0_4_;
          auVar127._4_4_ = (int)auVar315._4_4_;
          auVar127._8_4_ = (int)auVar315._8_4_;
          auVar127._12_4_ = (int)auVar315._12_4_;
          auVar315 = vpslld_avx(auVar127,0x17);
          auVar315 = vpaddd_avx(auVar218,auVar315);
          auVar98._0_4_ =
               (fVar245 + 1.0 +
               (((((fVar113 * fVar245 + fVar241) * fVar245 + 0.008333452) * fVar245 + 0.041665796) *
                 fVar245 + 0.16666666) * fVar245 + 0.5) * fVar245 * fVar245) * auVar315._0_4_ + 1.0;
          auVar98._4_4_ =
               (fVar246 + 1.0 +
               (((((fVar65 * fVar246 + fVar242) * fVar246 + 0.008333452) * fVar246 + 0.041665796) *
                 fVar246 + 0.16666666) * fVar246 + 0.5) * fVar246 * fVar246) * auVar315._4_4_ + 1.0;
          auVar98._8_4_ =
               (fVar346 + 1.0 +
               (((((fVar345 * fVar346 + fVar243) * fVar346 + 0.008333452) * fVar346 + 0.041665796) *
                 fVar346 + 0.16666666) * fVar346 + 0.5) * fVar346 * fVar346) * auVar315._8_4_ + 1.0;
          auVar98._12_4_ =
               (fVar347 + 1.0 +
               (((((fVar208 * fVar347 + fVar244) * fVar347 + 0.008333452) * fVar347 + 0.041665796) *
                 fVar347 + 0.16666666) * fVar347 + 0.5) * fVar347 * fVar347) * auVar315._12_4_ + 1.0
          ;
          auVar78._8_4_ = 0x800000;
          auVar78._0_8_ = 0x80000000800000;
          auVar78._12_4_ = 0x800000;
          auVar315 = vmaxps_avx(auVar98,auVar78);
          auVar164 = vpsrld_avx(auVar315,0x17);
          auVar79._8_4_ = 0xffffff82;
          auVar79._0_8_ = 0xffffff82ffffff82;
          auVar79._12_4_ = 0xffffff82;
          auVar164 = vpaddd_avx(auVar164,auVar79);
          auVar80._8_4_ = 0x807fffff;
          auVar80._0_8_ = 0x807fffff807fffff;
          auVar80._12_4_ = 0x807fffff;
          auVar315 = vandps_avx(auVar315,auVar80);
          auVar271 = vorps_avx(auVar315,auVar41);
          auVar44 = vcvtdq2ps_avx(auVar164);
          auVar81._8_4_ = 0x3f3504f3;
          auVar81._0_8_ = 0x3f3504f33f3504f3;
          auVar81._12_4_ = 0x3f3504f3;
          auVar164 = vcmpps_avx(auVar271,auVar81,1);
          auVar315 = vandps_avx(auVar164,auVar271);
          fVar245 = auVar315._0_4_ + auVar271._0_4_ + -1.0;
          fVar246 = auVar315._4_4_ + auVar271._4_4_ + -1.0;
          fVar346 = auVar315._8_4_ + auVar271._8_4_ + -1.0;
          fVar347 = auVar315._12_4_ + auVar271._12_4_ + -1.0;
          auVar315 = vandps_avx(auVar164,auVar218);
          auVar164 = vsubps_avx(auVar44,auVar315);
          auVar285 = ZEXT1664(auVar333);
          auVar307 = ZEXT1664(auVar259);
          auVar332 = ZEXT1664(auVar332._0_16_);
          auVar344 = ZEXT1664(auVar344._0_16_);
          auVar353 = ZEXT1664(auVar353._0_16_);
          auVar85 = ZEXT1664(ZEXT816(0));
          auVar315 = vcmpps_avx(auVar98,ZEXT816(0),2);
          auVar128._0_4_ =
               (fVar245 * fVar245 *
                (((((((((fVar245 * 0.070376836 + -0.1151461) * fVar245 + 0.116769984) * fVar245 +
                      -0.12420141) * fVar245 + 0.14249323) * fVar245 + -0.16668057) * fVar245 +
                   0.20000714) * fVar245 + -0.24999994) * fVar245 + 0.3333333) * fVar245 + -0.5) +
               auVar164._0_4_ * 0.6931472 + fVar245) * -2.0;
          auVar128._4_4_ =
               (fVar246 * fVar246 *
                (((((((((fVar246 * 0.070376836 + -0.1151461) * fVar246 + 0.116769984) * fVar246 +
                      -0.12420141) * fVar246 + 0.14249323) * fVar246 + -0.16668057) * fVar246 +
                   0.20000714) * fVar246 + -0.24999994) * fVar246 + 0.3333333) * fVar246 + -0.5) +
               auVar164._4_4_ * 0.6931472 + fVar246) * -2.0;
          auVar128._8_4_ =
               (fVar346 * fVar346 *
                (((((((((fVar346 * 0.070376836 + -0.1151461) * fVar346 + 0.116769984) * fVar346 +
                      -0.12420141) * fVar346 + 0.14249323) * fVar346 + -0.16668057) * fVar346 +
                   0.20000714) * fVar346 + -0.24999994) * fVar346 + 0.3333333) * fVar346 + -0.5) +
               auVar164._8_4_ * 0.6931472 + fVar346) * -2.0;
          auVar128._12_4_ =
               (fVar347 * fVar347 *
                (((((((((fVar347 * 0.070376836 + -0.1151461) * fVar347 + 0.116769984) * fVar347 +
                      -0.12420141) * fVar347 + 0.14249323) * fVar347 + -0.16668057) * fVar347 +
                   0.20000714) * fVar347 + -0.24999994) * fVar347 + 0.3333333) * fVar347 + -0.5) +
               auVar164._12_4_ * 0.6931472 + fVar347) * -2.0;
          auVar50._8_4_ = 0x7fffffff;
          auVar50._0_8_ = 0x7fffffff7fffffff;
          auVar50._12_4_ = 0x7fffffff;
          auVar315 = vblendvps_avx(auVar128,auVar50,auVar315);
          auVar315 = vminps_avx(auVar333,auVar315);
          auVar259 = vmaxps_avx(auVar259,auVar315);
          auVar129._0_4_ = fVar87 * auVar259._0_4_ + 0.5;
          auVar129._4_4_ = fVar86 * auVar259._4_4_ + 0.5;
          auVar129._8_4_ = fVar111 * auVar259._8_4_ + 0.5;
          auVar129._12_4_ = fVar112 * auVar259._12_4_ + 0.5;
          auVar169._0_4_ = (int)auVar129._0_4_;
          auVar169._4_4_ = (int)auVar129._4_4_;
          auVar169._8_4_ = (int)auVar129._8_4_;
          auVar169._12_4_ = (int)auVar129._12_4_;
          auVar333 = vcvtdq2ps_avx(auVar169);
          auVar315 = vcmpps_avx(auVar129,auVar333,1);
          auVar315 = vandps_avx(auVar218,auVar315);
          auVar315 = vsubps_avx(auVar333,auVar315);
          auVar170._0_4_ = auVar315._0_4_ * 0.6931472;
          auVar170._4_4_ = auVar315._4_4_ * 0.6931472;
          auVar170._8_4_ = auVar315._8_4_ * 0.6931472;
          auVar170._12_4_ = auVar315._12_4_ * 0.6931472;
          auVar333 = vsubps_avx(auVar259,auVar170);
          fVar87 = auVar333._0_4_;
          fVar86 = auVar333._4_4_;
          fVar111 = auVar333._8_4_;
          fVar112 = auVar333._12_4_;
          auVar110 = ZEXT1664(CONCAT412(0x7f007f,CONCAT48(0x7f007f,0x7f007f007f007f)));
          auVar352 = ZEXT1664(CONCAT412(0xff81ff81,CONCAT48(0xff81ff81,0xff81ff81ff81ff81)));
          auVar43 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
          auVar130._0_4_ = (int)auVar315._0_4_;
          auVar130._4_4_ = (int)auVar315._4_4_;
          auVar130._8_4_ = (int)auVar315._8_4_;
          auVar130._12_4_ = (int)auVar315._12_4_;
          auVar315 = vpslld_avx(auVar130,0x17);
          auVar315 = vpaddd_avx(auVar218,auVar315);
          auVar99._0_4_ =
               (fVar87 + 1.0 +
               (((((fVar113 * fVar87 + fVar241) * fVar87 + 0.008333452) * fVar87 + 0.041665796) *
                 fVar87 + 0.16666666) * fVar87 + 0.5) * fVar87 * fVar87) * auVar315._0_4_ + 1.0;
          auVar99._4_4_ =
               (fVar86 + 1.0 +
               (((((fVar65 * fVar86 + fVar242) * fVar86 + 0.008333452) * fVar86 + 0.041665796) *
                 fVar86 + 0.16666666) * fVar86 + 0.5) * fVar86 * fVar86) * auVar315._4_4_ + 1.0;
          auVar99._8_4_ =
               (fVar111 + 1.0 +
               (((((fVar345 * fVar111 + fVar243) * fVar111 + 0.008333452) * fVar111 + 0.041665796) *
                 fVar111 + 0.16666666) * fVar111 + 0.5) * fVar111 * fVar111) * auVar315._8_4_ + 1.0;
          auVar99._12_4_ =
               (fVar112 + 1.0 +
               (((((fVar208 * fVar112 + fVar244) * fVar112 + 0.008333452) * fVar112 + 0.041665796) *
                 fVar112 + 0.16666666) * fVar112 + 0.5) * fVar112 * fVar112) * auVar315._12_4_ + 1.0
          ;
          auVar131._8_4_ = 0x40000000;
          auVar131._0_8_ = 0x4000000040000000;
          auVar131._12_4_ = 0x40000000;
          auVar315 = vdivps_avx(auVar131,auVar99);
          auVar100._0_4_ = auVar315._0_4_ + -1.0;
          auVar100._4_4_ = auVar315._4_4_ + -1.0;
          auVar100._8_4_ = auVar315._8_4_ + -1.0;
          auVar100._12_4_ = auVar315._12_4_ + -1.0;
          goto LAB_004a84cb;
        case 6:
          fVar87 = *activation_params->data;
          fVar86 = *(float *)((long)activation_params->data + 4);
          auVar104._0_4_ = auVar250._0_4_ * fVar87 + fVar86;
          auVar104._4_4_ = auVar250._4_4_ * fVar87 + fVar86;
          auVar104._8_4_ = auVar250._8_4_ * fVar87 + fVar86;
          auVar104._12_4_ = auVar250._12_4_ * fVar87 + fVar86;
          auVar315 = vmaxps_avx(auVar104,auVar315);
          auVar100 = vminps_avx(auVar218,auVar315);
LAB_004a84cb:
          auVar250._0_4_ = auVar250._0_4_ * auVar100._0_4_;
          auVar250._4_4_ = auVar250._4_4_ * auVar100._4_4_;
          auVar250._8_4_ = auVar250._8_4_ * auVar100._8_4_;
          auVar250._12_4_ = auVar250._12_4_ * auVar100._12_4_;
        }
        auVar105._0_4_ = auVar250._0_4_ * fVar2;
        auVar105._4_4_ = auVar250._4_4_ * fVar2;
        auVar105._8_4_ = auVar250._8_4_ * fVar2;
        auVar105._12_4_ = auVar250._12_4_ * fVar2;
        auVar315 = vandps_avx(auVar105,auVar43._0_16_);
        auVar315 = vorps_avx(auVar315,auVar41);
        auVar106._0_4_ = (int)(auVar105._0_4_ + auVar315._0_4_);
        auVar106._4_4_ = (int)(auVar105._4_4_ + auVar315._4_4_);
        auVar106._8_4_ = (int)(auVar105._8_4_ + auVar315._8_4_);
        auVar106._12_4_ = (int)(auVar105._12_4_ + auVar315._12_4_);
        auVar315 = vpackssdw_avx(auVar106,auVar106);
        auVar315 = vpminsw_avx(auVar315,auVar110._0_16_);
        auVar315 = vpmaxsw_avx(auVar315,auVar352._0_16_);
        auVar315 = vpacksswb_avx(auVar315,auVar315);
        *(int *)*(undefined1 (*) [16])ptr = auVar315._0_4_;
        intptr = (int *)(*(undefined1 (*) [32])intptr + 0x10);
        ptr = *(undefined1 (*) [16])ptr + 4;
        uVar27 = uVar28 + 4;
        iVar29 = uVar28 + 7;
        uVar28 = uVar27;
      } while (iVar29 < (int)uVar31);
    }
    if (uVar31 - uVar27 != 0 && (int)uVar27 <= (int)uVar31) {
      lVar30 = 0;
      auVar43 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
      auVar110 = ZEXT1664(CONCAT412(0x3effffff,CONCAT48(0x3effffff,0x3effffff3effffff)));
      do {
        fVar87 = fVar1 * (float)*(int *)(*(undefined1 (*) [32])intptr + lVar30 * 4);
        auVar315 = ZEXT416((uint)fVar87);
        fVar86 = fVar87;
        switch(activation_type) {
        case 1:
          auVar315 = vmaxss_avx(auVar315,ZEXT416(0));
          fVar86 = auVar315._0_4_;
          break;
        case 2:
          auVar33._0_12_ = ZEXT812(0);
          auVar33._12_4_ = 0;
          auVar315 = vcmpss_avx(auVar33,auVar315,1);
          auVar52._8_4_ = 0x3f800000;
          auVar52._0_8_ = 0x3f8000003f800000;
          auVar52._12_4_ = 0x3f800000;
          auVar315 = vblendvps_avx(ZEXT416(*activation_params->data),auVar52,auVar315);
          fVar112 = auVar315._0_4_;
LAB_004a86a0:
          fVar86 = fVar112 * fVar87;
          break;
        case 3:
          fVar87 = *(float *)((long)activation_params->data + 4);
          auVar315 = vmaxss_avx(auVar315,ZEXT416(*activation_params->data));
          fVar86 = auVar315._0_4_;
          if (fVar87 < auVar315._0_4_) {
            fVar86 = fVar87;
          }
          break;
        case 4:
          auVar315 = vminss_avx(auVar315,ZEXT416(0x42b0c0a5));
          auVar42._0_4_ = auVar315._0_4_ ^ auVar43._0_4_;
          auVar42._4_4_ = auVar315._4_4_ ^ auVar43._4_4_;
          auVar42._8_4_ = auVar315._8_4_ ^ auVar43._8_4_;
          auVar42._12_4_ = auVar315._12_4_ ^ auVar43._12_4_;
          auVar315 = vcmpss_avx(auVar315,ZEXT416(0xc2b0c0a5),1);
          auVar51._8_4_ = 0x42b0c0a5;
          auVar51._0_8_ = 0x42b0c0a542b0c0a5;
          auVar51._12_4_ = 0x42b0c0a5;
          auVar315 = vblendvps_avx(auVar42,auVar51,auVar315);
          fVar87 = expf(auVar315._0_4_);
          auVar110 = ZEXT1664(CONCAT412(0x3effffff,CONCAT48(0x3effffff,0x3effffff3effffff)));
          auVar43 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
          fVar86 = 1.0 / (fVar87 + 1.0);
          break;
        case 5:
          fVar86 = expf(fVar87);
          fVar86 = logf(fVar86 + 1.0);
          fVar86 = tanhf(fVar86);
          auVar110 = ZEXT1664(CONCAT412(0x3effffff,CONCAT48(0x3effffff,0x3effffff3effffff)));
          auVar43 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
          fVar86 = fVar86 * fVar87;
          break;
        case 6:
          fVar111 = *activation_params->data;
          fVar112 = *(float *)((long)activation_params->data + 4);
          fVar113 = (float)((uint)fVar112 ^ auVar43._0_4_) / fVar111;
          fVar86 = 0.0;
          if ((fVar113 <= fVar87) && (fVar86 = fVar87, fVar87 <= fVar113 + 1.0 / fVar111)) {
            fVar112 = fVar111 * fVar87 + fVar112;
            goto LAB_004a86a0;
          }
        }
        auVar315 = vandps_avx(ZEXT416((uint)(fVar86 * fVar2)),auVar43._0_16_);
        auVar315 = vorps_avx(auVar315,auVar110._0_16_);
        auVar315 = ZEXT416((uint)(fVar86 * fVar2 + auVar315._0_4_));
        auVar315 = vroundss_avx(auVar315,auVar315,0xb);
        iVar29 = (int)auVar315._0_4_;
        if (iVar29 < -0x7e) {
          iVar29 = -0x7f;
        }
        uVar26 = (undefined1)iVar29;
        if (0x7e < iVar29) {
          uVar26 = 0x7f;
        }
        (*(undefined1 (*) [16])ptr)[lVar30] = uVar26;
        lVar30 = lVar30 + 1;
      } while (uVar31 - uVar27 != (int)lVar30);
    }
  }
  else {
    fVar87 = *(float *)*(undefined1 (*) [32])bias_data->data;
    auVar53._4_4_ = fVar87;
    auVar53._0_4_ = fVar87;
    auVar53._8_4_ = fVar87;
    auVar53._12_4_ = fVar87;
    auVar53._16_4_ = fVar87;
    auVar53._20_4_ = fVar87;
    auVar53._24_4_ = fVar87;
    auVar53._28_4_ = fVar87;
    if (1 < bias_data->w && elempack == 8) {
      auVar53 = *(undefined1 (*) [32])bias_data->data;
    }
    uVar27 = 0;
    fVar86 = auVar53._0_4_;
    fVar111 = auVar53._4_4_;
    fVar112 = auVar53._8_4_;
    fVar113 = auVar53._12_4_;
    fVar65 = auVar53._16_4_;
    fVar345 = auVar53._20_4_;
    fVar208 = auVar53._24_4_;
    fVar241 = auVar53._28_4_;
    if (0xf < (int)uVar31) {
      uVar27 = uVar31 & 0x7ffffff0;
      iVar29 = 0xf;
      auVar82._8_4_ = 0x3f000000;
      auVar82._0_8_ = 0x3f0000003f000000;
      auVar82._12_4_ = 0x3f000000;
      auVar82._16_4_ = 0x3f000000;
      auVar82._20_4_ = 0x3f000000;
      auVar82._24_4_ = 0x3f000000;
      auVar82._28_4_ = 0x3f000000;
      auVar110 = ZEXT1664(CONCAT412(0x7f007f,CONCAT48(0x7f007f,0x7f007f007f007f)));
      auVar352 = ZEXT1664(CONCAT412(0xff81ff81,CONCAT48(0xff81ff81,0xff81ff81ff81ff81)));
      auVar261._8_4_ = 0x3f800000;
      auVar261._0_8_ = 0x3f8000003f800000;
      auVar261._12_4_ = 0x3f800000;
      auVar261._16_4_ = 0x3f800000;
      auVar261._20_4_ = 0x3f800000;
      auVar261._24_4_ = 0x3f800000;
      auVar261._28_4_ = 0x3f800000;
      do {
        auVar247 = in_ZMM8._28_36_;
        auVar70 = vcvtdq2ps_avx(*(undefined1 (*) [32])intptr);
        auVar291._0_4_ = auVar70._0_4_ * (float)local_d8._0_4_ + fVar86;
        auVar291._4_4_ = auVar70._4_4_ * (float)local_d8._4_4_ + fVar111;
        auVar291._8_4_ = auVar70._8_4_ * fStack_d0 + fVar112;
        auVar291._12_4_ = auVar70._12_4_ * fStack_cc + fVar113;
        auVar291._16_4_ = auVar70._16_4_ * fStack_c8 + fVar65;
        auVar291._20_4_ = auVar70._20_4_ * fStack_c4 + fVar345;
        auVar291._24_4_ = auVar70._24_4_ * fStack_c0 + fVar208;
        auVar291._28_4_ = auVar70._28_4_ + fVar241;
        in_ZMM12 = ZEXT3264(auVar291);
        switch(activation_type + -1) {
        case 0:
          auVar70 = vmaxps_avx(auVar291,_DAT_005f31a0);
          in_ZMM12 = ZEXT3264(auVar70);
          break;
        case 1:
          auVar70 = vmaxps_avx(auVar291,ZEXT1632(ZEXT816(0) << 0x40));
          auVar256 = vminps_avx(auVar291,ZEXT1632(ZEXT816(0) << 0x40));
          fVar242 = *activation_params->data;
          in_ZMM14 = ZEXT3264(CONCAT428(fVar242,CONCAT424(fVar242,CONCAT420(fVar242,CONCAT416(
                                                  fVar242,CONCAT412(fVar242,CONCAT48(fVar242,
                                                  CONCAT44(fVar242,fVar242))))))));
          in_ZMM12 = ZEXT3264(CONCAT428(auVar256._28_4_ + auVar70._28_4_,
                                        CONCAT424(fVar242 * auVar256._24_4_ + auVar70._24_4_,
                                                  CONCAT420(fVar242 * auVar256._20_4_ +
                                                            auVar70._20_4_,
                                                            CONCAT416(fVar242 * auVar256._16_4_ +
                                                                      auVar70._16_4_,
                                                                      CONCAT412(fVar242 * auVar256.
                                                  _12_4_ + auVar70._12_4_,
                                                  CONCAT48(fVar242 * auVar256._8_4_ + auVar70._8_4_,
                                                           CONCAT44(fVar242 * auVar256._4_4_ +
                                                                    auVar70._4_4_,
                                                                    fVar242 * auVar256._0_4_ +
                                                                    auVar70._0_4_))))))));
          break;
        case 2:
          uVar3 = *activation_params->data;
          auVar322._4_4_ = uVar3;
          auVar322._0_4_ = uVar3;
          auVar322._8_4_ = uVar3;
          auVar322._12_4_ = uVar3;
          auVar322._16_4_ = uVar3;
          auVar322._20_4_ = uVar3;
          auVar322._24_4_ = uVar3;
          auVar322._28_4_ = uVar3;
          uVar3 = *(undefined4 *)((long)activation_params->data + 4);
          auVar336._4_4_ = uVar3;
          auVar336._0_4_ = uVar3;
          auVar336._8_4_ = uVar3;
          auVar336._12_4_ = uVar3;
          auVar336._16_4_ = uVar3;
          auVar336._20_4_ = uVar3;
          auVar336._24_4_ = uVar3;
          auVar336._28_4_ = uVar3;
          in_ZMM14 = ZEXT3264(auVar336);
          auVar70 = vmaxps_avx(auVar291,auVar322);
          auVar70 = vminps_avx(auVar70,auVar336);
          in_ZMM12 = ZEXT3264(auVar70);
          break;
        case 3:
          uVar25 = CONCAT44(auVar291._4_4_,auVar291._0_4_);
          auVar292._0_8_ = uVar25 ^ 0x8000000080000000;
          auVar292._8_4_ = -auVar291._8_4_;
          auVar292._12_4_ = -auVar291._12_4_;
          auVar292._16_4_ = -auVar291._16_4_;
          auVar292._20_4_ = -auVar291._20_4_;
          auVar292._24_4_ = -auVar291._24_4_;
          auVar292._28_4_ = -auVar291._28_4_;
          auVar107._8_4_ = 0x42b0c0a5;
          auVar107._0_8_ = 0x42b0c0a542b0c0a5;
          auVar107._12_4_ = 0x42b0c0a5;
          auVar107._16_4_ = 0x42b0c0a5;
          auVar107._20_4_ = 0x42b0c0a5;
          auVar107._24_4_ = 0x42b0c0a5;
          auVar107._28_4_ = 0x42b0c0a5;
          auVar70 = vminps_avx(auVar292,auVar107);
          auVar110 = ZEXT1664(CONCAT412(0x7f007f,CONCAT48(0x7f007f,0x7f007f007f007f)));
          auVar140._8_4_ = 0xc2b0c0a5;
          auVar140._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar140._12_4_ = 0xc2b0c0a5;
          auVar140._16_4_ = 0xc2b0c0a5;
          auVar140._20_4_ = 0xc2b0c0a5;
          auVar140._24_4_ = 0xc2b0c0a5;
          auVar140._28_4_ = 0xc2b0c0a5;
          auVar256 = vmaxps_avx(auVar70,auVar140);
          auVar323._0_4_ = auVar256._0_4_ * 1.442695 + 0.5;
          auVar323._4_4_ = auVar256._4_4_ * 1.442695 + 0.5;
          auVar323._8_4_ = auVar256._8_4_ * 1.442695 + 0.5;
          auVar323._12_4_ = auVar256._12_4_ * 1.442695 + 0.5;
          auVar323._16_4_ = auVar256._16_4_ * 1.442695 + 0.5;
          auVar323._20_4_ = auVar256._20_4_ * 1.442695 + 0.5;
          auVar323._24_4_ = auVar256._24_4_ * 1.442695 + 0.5;
          auVar323._28_4_ = in_ZMM13._28_4_ + 0.5;
          auVar5 = vroundps_avx(auVar323,1);
          auVar70 = vcmpps_avx(auVar323,auVar5,1);
          auVar70 = vandps_avx(auVar70,auVar261);
          auVar70 = vsubps_avx(auVar5,auVar70);
          fVar242 = auVar256._0_4_ + auVar70._0_4_ * -0.6931472;
          fVar243 = auVar256._4_4_ + auVar70._4_4_ * -0.6931472;
          fVar244 = auVar256._8_4_ + auVar70._8_4_ * -0.6931472;
          fVar245 = auVar256._12_4_ + auVar70._12_4_ * -0.6931472;
          fVar246 = auVar256._16_4_ + auVar70._16_4_ * -0.6931472;
          fVar346 = auVar256._20_4_ + auVar70._20_4_ * -0.6931472;
          fVar347 = auVar256._24_4_ + auVar70._24_4_ * -0.6931472;
          auVar352 = ZEXT1664(CONCAT412(0xff81ff81,CONCAT48(0xff81ff81,0xff81ff81ff81ff81)));
          auVar316._0_4_ = (int)auVar70._0_4_;
          auVar316._4_4_ = (int)auVar70._4_4_;
          auVar316._8_4_ = (int)auVar70._8_4_;
          auVar316._12_4_ = (int)auVar70._12_4_;
          auVar324._16_4_ = (int)auVar70._16_4_;
          auVar324._0_16_ = auVar316;
          auVar324._20_4_ = (int)auVar70._20_4_;
          auVar324._24_4_ = (int)auVar70._24_4_;
          auVar324._28_4_ = (int)auVar70._28_4_;
          auVar333 = vpslld_avx(auVar316,0x17);
          auVar315 = vpslld_avx(auVar324._16_16_,0x17);
          auVar36._8_4_ = 0x3f800000;
          auVar36._0_8_ = 0x3f8000003f800000;
          auVar36._12_4_ = 0x3f800000;
          auVar315 = vpaddd_avx(auVar315,auVar36);
          auVar333 = vpaddd_avx(auVar333,auVar36);
          in_ZMM14 = ZEXT1664(auVar333);
          auVar43 = ZEXT3264(auVar66);
          auVar293._0_4_ =
               (fVar242 + 1.0 +
               fVar242 * fVar242 *
               (((((fVar242 * 0.00019875691 + 0.0013981999) * fVar242 + 0.008333452) * fVar242 +
                 0.041665796) * fVar242 + 0.16666666) * fVar242 + 0.5)) * auVar333._0_4_ + 1.0;
          auVar293._4_4_ =
               (fVar243 + 1.0 +
               fVar243 * fVar243 *
               (((((fVar243 * 0.00019875691 + 0.0013981999) * fVar243 + 0.008333452) * fVar243 +
                 0.041665796) * fVar243 + 0.16666666) * fVar243 + 0.5)) * auVar333._4_4_ + 1.0;
          auVar293._8_4_ =
               (fVar244 + 1.0 +
               fVar244 * fVar244 *
               (((((fVar244 * 0.00019875691 + 0.0013981999) * fVar244 + 0.008333452) * fVar244 +
                 0.041665796) * fVar244 + 0.16666666) * fVar244 + 0.5)) * auVar333._8_4_ + 1.0;
          auVar293._12_4_ =
               (fVar245 + 1.0 +
               fVar245 * fVar245 *
               (((((fVar245 * 0.00019875691 + 0.0013981999) * fVar245 + 0.008333452) * fVar245 +
                 0.041665796) * fVar245 + 0.16666666) * fVar245 + 0.5)) * auVar333._12_4_ + 1.0;
          auVar293._16_4_ =
               (fVar246 + 1.0 +
               fVar246 * fVar246 *
               (((((fVar246 * 0.00019875691 + 0.0013981999) * fVar246 + 0.008333452) * fVar246 +
                 0.041665796) * fVar246 + 0.16666666) * fVar246 + 0.5)) * auVar315._0_4_ + 1.0;
          auVar293._20_4_ =
               (fVar346 + 1.0 +
               fVar346 * fVar346 *
               (((((fVar346 * 0.00019875691 + 0.0013981999) * fVar346 + 0.008333452) * fVar346 +
                 0.041665796) * fVar346 + 0.16666666) * fVar346 + 0.5)) * auVar315._4_4_ + 1.0;
          auVar293._24_4_ =
               (fVar347 + 1.0 +
               fVar347 * fVar347 *
               (((((fVar347 * 0.00019875691 + 0.0013981999) * fVar347 + 0.008333452) * fVar347 +
                 0.041665796) * fVar347 + 0.16666666) * fVar347 + 0.5)) * auVar315._8_4_ + 1.0;
          auVar293._28_4_ = auVar256._28_4_ + auVar5._28_4_ + 1.0 + auVar5._28_4_ + 1.0;
          auVar70 = vdivps_avx(auVar261,auVar293);
          in_ZMM12 = ZEXT3264(auVar70);
          break;
        case 4:
          auVar253._8_4_ = 0x42b0c0a5;
          auVar253._0_8_ = 0x42b0c0a542b0c0a5;
          auVar253._12_4_ = 0x42b0c0a5;
          auVar253._16_4_ = 0x42b0c0a5;
          auVar253._20_4_ = 0x42b0c0a5;
          auVar253._24_4_ = 0x42b0c0a5;
          auVar253._28_4_ = 0x42b0c0a5;
          auVar70 = vminps_avx(auVar291,auVar253);
          auVar136._8_4_ = 0xc2b0c0a5;
          auVar136._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar136._12_4_ = 0xc2b0c0a5;
          auVar136._16_4_ = 0xc2b0c0a5;
          auVar136._20_4_ = 0xc2b0c0a5;
          auVar136._24_4_ = 0xc2b0c0a5;
          auVar136._28_4_ = 0xc2b0c0a5;
          auVar256 = vmaxps_avx(auVar70,auVar136);
          auVar335._0_4_ = auVar256._0_4_ * 1.442695 + 0.5;
          auVar335._4_4_ = auVar256._4_4_ * 1.442695 + 0.5;
          auVar335._8_4_ = auVar256._8_4_ * 1.442695 + 0.5;
          auVar335._12_4_ = auVar256._12_4_ * 1.442695 + 0.5;
          auVar335._16_4_ = auVar256._16_4_ * 1.442695 + 0.5;
          auVar335._20_4_ = auVar256._20_4_ * 1.442695 + 0.5;
          auVar335._24_4_ = auVar256._24_4_ * 1.442695 + 0.5;
          auVar335._28_4_ = in_ZMM14._28_4_ + 0.5;
          auVar5 = vroundps_avx(auVar335,1);
          auVar70 = vcmpps_avx(auVar335,auVar5,1);
          auVar70 = vandps_avx(auVar70,auVar261);
          auVar70 = vsubps_avx(auVar5,auVar70);
          auVar7._4_4_ = auVar70._4_4_ * 0.6931472;
          auVar7._0_4_ = auVar70._0_4_ * 0.6931472;
          auVar7._8_4_ = auVar70._8_4_ * 0.6931472;
          auVar7._12_4_ = auVar70._12_4_ * 0.6931472;
          auVar7._16_4_ = auVar70._16_4_ * 0.6931472;
          auVar7._20_4_ = auVar70._20_4_ * 0.6931472;
          auVar7._24_4_ = auVar70._24_4_ * 0.6931472;
          auVar7._28_4_ = auVar5._28_4_;
          auVar256 = vsubps_avx(auVar256,auVar7);
          fVar242 = auVar256._0_4_;
          fVar243 = auVar256._4_4_;
          fVar244 = auVar256._8_4_;
          fVar245 = auVar256._12_4_;
          fVar246 = auVar256._16_4_;
          fVar346 = auVar256._20_4_;
          fVar347 = auVar256._24_4_;
          auVar314._0_4_ = (int)auVar70._0_4_;
          auVar314._4_4_ = (int)auVar70._4_4_;
          auVar314._8_4_ = (int)auVar70._8_4_;
          auVar314._12_4_ = (int)auVar70._12_4_;
          auVar320._16_4_ = (int)auVar70._16_4_;
          auVar320._0_16_ = auVar314;
          auVar320._20_4_ = (int)auVar70._20_4_;
          auVar320._24_4_ = (int)auVar70._24_4_;
          auVar320._28_4_ = (int)auVar70._28_4_;
          auVar333 = vpslld_avx(auVar314,0x17);
          auVar315 = vpslld_avx(auVar320._16_16_,0x17);
          auVar35._8_4_ = 0x3f800000;
          auVar35._0_8_ = 0x3f8000003f800000;
          auVar35._12_4_ = 0x3f800000;
          auVar315 = vpaddd_avx(auVar315,auVar35);
          auVar333 = vpaddd_avx(auVar333,auVar35);
          auVar321._0_4_ =
               (fVar242 + 1.0 +
               fVar242 * fVar242 *
               (((((fVar242 * 0.00019875691 + 0.0013981999) * fVar242 + 0.008333452) * fVar242 +
                 0.041665796) * fVar242 + 0.16666666) * fVar242 + 0.5)) * auVar333._0_4_ + 1.0;
          auVar321._4_4_ =
               (fVar243 + 1.0 +
               fVar243 * fVar243 *
               (((((fVar243 * 0.00019875691 + 0.0013981999) * fVar243 + 0.008333452) * fVar243 +
                 0.041665796) * fVar243 + 0.16666666) * fVar243 + 0.5)) * auVar333._4_4_ + 1.0;
          auVar321._8_4_ =
               (fVar244 + 1.0 +
               fVar244 * fVar244 *
               (((((fVar244 * 0.00019875691 + 0.0013981999) * fVar244 + 0.008333452) * fVar244 +
                 0.041665796) * fVar244 + 0.16666666) * fVar244 + 0.5)) * auVar333._8_4_ + 1.0;
          auVar321._12_4_ =
               (fVar245 + 1.0 +
               fVar245 * fVar245 *
               (((((fVar245 * 0.00019875691 + 0.0013981999) * fVar245 + 0.008333452) * fVar245 +
                 0.041665796) * fVar245 + 0.16666666) * fVar245 + 0.5)) * auVar333._12_4_ + 1.0;
          auVar321._16_4_ =
               (fVar246 + 1.0 +
               fVar246 * fVar246 *
               (((((fVar246 * 0.00019875691 + 0.0013981999) * fVar246 + 0.008333452) * fVar246 +
                 0.041665796) * fVar246 + 0.16666666) * fVar246 + 0.5)) * auVar315._0_4_ + 1.0;
          auVar321._20_4_ =
               (fVar346 + 1.0 +
               fVar346 * fVar346 *
               (((((fVar346 * 0.00019875691 + 0.0013981999) * fVar346 + 0.008333452) * fVar346 +
                 0.041665796) * fVar346 + 0.16666666) * fVar346 + 0.5)) * auVar315._4_4_ + 1.0;
          auVar321._24_4_ =
               (fVar347 + 1.0 +
               fVar347 * fVar347 *
               (((((fVar347 * 0.00019875691 + 0.0013981999) * fVar347 + 0.008333452) * fVar347 +
                 0.041665796) * fVar347 + 0.16666666) * fVar347 + 0.5)) * auVar315._8_4_ + 1.0;
          auVar321._28_4_ =
               auVar256._28_4_ + 1.0 +
               in_ZMM11._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 + 0.5 + 1.0;
          auVar172._8_4_ = 0x800000;
          auVar172._0_8_ = 0x80000000800000;
          auVar172._12_4_ = 0x800000;
          auVar172._16_4_ = 0x800000;
          auVar172._20_4_ = 0x800000;
          auVar172._24_4_ = 0x800000;
          auVar172._28_4_ = 0x800000;
          auVar5 = vmaxps_avx(auVar321,auVar172);
          auVar315 = vpsrld_avx(auVar5._16_16_,0x17);
          auVar173._8_4_ = 0x807fffff;
          auVar173._0_8_ = 0x807fffff807fffff;
          auVar173._12_4_ = 0x807fffff;
          auVar173._16_4_ = 0x807fffff;
          auVar173._20_4_ = 0x807fffff;
          auVar173._24_4_ = 0x807fffff;
          auVar173._28_4_ = 0x807fffff;
          auVar70 = vandps_avx(auVar5,auVar173);
          auVar148 = vorps_avx(auVar70,auVar82);
          auVar137._8_4_ = 0x3f3504f3;
          auVar137._0_8_ = 0x3f3504f33f3504f3;
          auVar137._12_4_ = 0x3f3504f3;
          auVar137._16_4_ = 0x3f3504f3;
          auVar137._20_4_ = 0x3f3504f3;
          auVar137._24_4_ = 0x3f3504f3;
          auVar137._28_4_ = 0x3f3504f3;
          auVar256 = vcmpps_avx(auVar137,auVar148,2);
          auVar70 = vandnps_avx(auVar256,auVar148);
          fVar242 = auVar148._0_4_ + -1.0 + auVar70._0_4_;
          fVar243 = auVar148._4_4_ + -1.0 + auVar70._4_4_;
          fVar244 = auVar148._8_4_ + -1.0 + auVar70._8_4_;
          fVar245 = auVar148._12_4_ + -1.0 + auVar70._12_4_;
          fVar246 = auVar148._16_4_ + -1.0 + auVar70._16_4_;
          fVar346 = auVar148._20_4_ + -1.0 + auVar70._20_4_;
          fVar347 = auVar148._24_4_ + -1.0 + auVar70._24_4_;
          fVar348 = auVar148._28_4_ + -1.0 + auVar70._28_4_;
          in_ZMM14 = ZEXT3264(CONCAT428(fVar348,CONCAT424(fVar347,CONCAT420(fVar346,CONCAT416(
                                                  fVar246,CONCAT412(fVar245,CONCAT48(fVar244,
                                                  CONCAT44(fVar243,fVar242))))))));
          auVar315 = vpsubd_avx(auVar315,auVar256._16_16_);
          auVar352 = ZEXT1664(CONCAT412(0xff81ff81,CONCAT48(0xff81ff81,0xff81ff81ff81ff81)));
          auVar333 = vpsrld_avx(auVar5._0_16_,0x17);
          auVar114._8_4_ = 0xffffff81;
          auVar114._0_8_ = 0xffffff81ffffff81;
          auVar114._12_4_ = 0xffffff81;
          auVar315 = vpaddd_avx(auVar315,auVar114);
          auVar333 = vpsubd_avx(auVar333,auVar256._0_16_);
          auVar333 = vpaddd_avx(auVar333,auVar114);
          auVar174._16_16_ = auVar315;
          auVar174._0_16_ = auVar333;
          auVar70 = vcmpps_avx(auVar321,_DAT_005f31a0,2);
          auVar256 = vcvtdq2ps_avx(auVar174);
          auVar8._4_4_ = (fVar243 * fVar243 *
                          (((((((((fVar243 * 0.070376836 + -0.1151461) * fVar243 + 0.116769984) *
                                 fVar243 + -0.12420141) * fVar243 + 0.14249323) * fVar243 +
                              -0.16668057) * fVar243 + 0.20000714) * fVar243 + -0.24999994) *
                            fVar243 + 0.3333333) * fVar243 + -0.5) +
                         fVar243 + auVar256._4_4_ * 0.6931472) * -2.0;
          auVar8._0_4_ = (fVar242 * fVar242 *
                          (((((((((fVar242 * 0.070376836 + -0.1151461) * fVar242 + 0.116769984) *
                                 fVar242 + -0.12420141) * fVar242 + 0.14249323) * fVar242 +
                              -0.16668057) * fVar242 + 0.20000714) * fVar242 + -0.24999994) *
                            fVar242 + 0.3333333) * fVar242 + -0.5) +
                         fVar242 + auVar256._0_4_ * 0.6931472) * -2.0;
          auVar8._8_4_ = (fVar244 * fVar244 *
                          (((((((((fVar244 * 0.070376836 + -0.1151461) * fVar244 + 0.116769984) *
                                 fVar244 + -0.12420141) * fVar244 + 0.14249323) * fVar244 +
                              -0.16668057) * fVar244 + 0.20000714) * fVar244 + -0.24999994) *
                            fVar244 + 0.3333333) * fVar244 + -0.5) +
                         fVar244 + auVar256._8_4_ * 0.6931472) * -2.0;
          auVar8._12_4_ =
               (fVar245 * fVar245 *
                (((((((((fVar245 * 0.070376836 + -0.1151461) * fVar245 + 0.116769984) * fVar245 +
                      -0.12420141) * fVar245 + 0.14249323) * fVar245 + -0.16668057) * fVar245 +
                   0.20000714) * fVar245 + -0.24999994) * fVar245 + 0.3333333) * fVar245 + -0.5) +
               fVar245 + auVar256._12_4_ * 0.6931472) * -2.0;
          auVar8._16_4_ =
               (fVar246 * fVar246 *
                (((((((((fVar246 * 0.070376836 + -0.1151461) * fVar246 + 0.116769984) * fVar246 +
                      -0.12420141) * fVar246 + 0.14249323) * fVar246 + -0.16668057) * fVar246 +
                   0.20000714) * fVar246 + -0.24999994) * fVar246 + 0.3333333) * fVar246 + -0.5) +
               fVar246 + auVar256._16_4_ * 0.6931472) * -2.0;
          auVar8._20_4_ =
               (fVar346 * fVar346 *
                (((((((((fVar346 * 0.070376836 + -0.1151461) * fVar346 + 0.116769984) * fVar346 +
                      -0.12420141) * fVar346 + 0.14249323) * fVar346 + -0.16668057) * fVar346 +
                   0.20000714) * fVar346 + -0.24999994) * fVar346 + 0.3333333) * fVar346 + -0.5) +
               fVar346 + auVar256._20_4_ * 0.6931472) * -2.0;
          auVar8._24_4_ =
               (fVar347 * fVar347 *
                (((((((((fVar347 * 0.070376836 + -0.1151461) * fVar347 + 0.116769984) * fVar347 +
                      -0.12420141) * fVar347 + 0.14249323) * fVar347 + -0.16668057) * fVar347 +
                   0.20000714) * fVar347 + -0.24999994) * fVar347 + 0.3333333) * fVar347 + -0.5) +
               fVar347 + auVar256._24_4_ * 0.6931472) * -2.0;
          auVar8._28_4_ = fVar348 + auVar256._28_4_ + 0.0;
          auVar138._8_4_ = 0x7fffffff;
          auVar138._0_8_ = 0x7fffffff7fffffff;
          auVar138._12_4_ = 0x7fffffff;
          auVar138._16_4_ = 0x7fffffff;
          auVar138._20_4_ = 0x7fffffff;
          auVar138._24_4_ = 0x7fffffff;
          auVar138._28_4_ = 0x7fffffff;
          auVar70 = vblendvps_avx(auVar8,auVar138,auVar70);
          auVar139._8_4_ = 0x42b0c0a5;
          auVar139._0_8_ = 0x42b0c0a542b0c0a5;
          auVar139._12_4_ = 0x42b0c0a5;
          auVar139._16_4_ = 0x42b0c0a5;
          auVar139._20_4_ = 0x42b0c0a5;
          auVar139._24_4_ = 0x42b0c0a5;
          auVar139._28_4_ = 0x42b0c0a5;
          auVar70 = vminps_avx(auVar70,auVar139);
          auVar256 = vmaxps_avx(auVar70,auVar136);
          auVar219._0_4_ = auVar256._0_4_ * 1.442695 + 0.5;
          auVar219._4_4_ = auVar256._4_4_ * 1.442695 + 0.5;
          auVar219._8_4_ = auVar256._8_4_ * 1.442695 + 0.5;
          auVar219._12_4_ = auVar256._12_4_ * 1.442695 + 0.5;
          auVar219._16_4_ = auVar256._16_4_ * 1.442695 + 0.5;
          auVar219._20_4_ = auVar256._20_4_ * 1.442695 + 0.5;
          auVar219._24_4_ = auVar256._24_4_ * 1.442695 + 0.5;
          auVar219._28_4_ = 0x3f000000;
          auVar5 = vroundps_avx(auVar219,1);
          auVar70 = vcmpps_avx(auVar219,auVar5,1);
          auVar70 = vandps_avx(auVar70,auVar261);
          auVar70 = vsubps_avx(auVar5,auVar70);
          auVar9._4_4_ = auVar70._4_4_ * 0.6931472;
          auVar9._0_4_ = auVar70._0_4_ * 0.6931472;
          auVar9._8_4_ = auVar70._8_4_ * 0.6931472;
          auVar9._12_4_ = auVar70._12_4_ * 0.6931472;
          auVar9._16_4_ = auVar70._16_4_ * 0.6931472;
          auVar9._20_4_ = auVar70._20_4_ * 0.6931472;
          auVar9._24_4_ = auVar70._24_4_ * 0.6931472;
          auVar9._28_4_ = auVar5._28_4_;
          auVar256 = vsubps_avx(auVar256,auVar9);
          fVar242 = auVar256._0_4_;
          fVar244 = auVar256._4_4_;
          fVar245 = auVar256._8_4_;
          fVar246 = auVar256._12_4_;
          fVar346 = auVar256._16_4_;
          fVar347 = auVar256._20_4_;
          fVar348 = auVar256._24_4_;
          auVar209._0_4_ = (int)auVar70._0_4_;
          auVar209._4_4_ = (int)auVar70._4_4_;
          auVar209._8_4_ = (int)auVar70._8_4_;
          auVar209._12_4_ = (int)auVar70._12_4_;
          auVar220._16_4_ = (int)auVar70._16_4_;
          auVar220._0_16_ = auVar209;
          auVar220._20_4_ = (int)auVar70._20_4_;
          auVar220._24_4_ = (int)auVar70._24_4_;
          auVar220._28_4_ = (int)auVar70._28_4_;
          auVar333 = vpslld_avx(auVar209,0x17);
          auVar315 = vpslld_avx(auVar220._16_16_,0x17);
          auVar315 = vpaddd_avx(auVar315,auVar35);
          auVar333 = vpaddd_avx(auVar333,auVar35);
          auVar43 = ZEXT3264(auVar66);
          fVar243 = auVar315._12_4_;
          auVar175._0_4_ =
               auVar333._0_4_ *
               (fVar242 * fVar242 *
                (((((fVar242 * 0.00019875691 + 0.0013981999) * fVar242 + 0.008333452) * fVar242 +
                  0.041665796) * fVar242 + 0.16666666) * fVar242 + 0.5) + fVar242 + 1.0) + 1.0;
          auVar175._4_4_ =
               auVar333._4_4_ *
               (fVar244 * fVar244 *
                (((((fVar244 * 0.00019875691 + 0.0013981999) * fVar244 + 0.008333452) * fVar244 +
                  0.041665796) * fVar244 + 0.16666666) * fVar244 + 0.5) + fVar244 + 1.0) + 1.0;
          auVar175._8_4_ =
               auVar333._8_4_ *
               (fVar245 * fVar245 *
                (((((fVar245 * 0.00019875691 + 0.0013981999) * fVar245 + 0.008333452) * fVar245 +
                  0.041665796) * fVar245 + 0.16666666) * fVar245 + 0.5) + fVar245 + 1.0) + 1.0;
          auVar175._12_4_ =
               auVar333._12_4_ *
               (fVar246 * fVar246 *
                (((((fVar246 * 0.00019875691 + 0.0013981999) * fVar246 + 0.008333452) * fVar246 +
                  0.041665796) * fVar246 + 0.16666666) * fVar246 + 0.5) + fVar246 + 1.0) + 1.0;
          auVar175._16_4_ =
               auVar315._0_4_ *
               (fVar346 * fVar346 *
                (((((fVar346 * 0.00019875691 + 0.0013981999) * fVar346 + 0.008333452) * fVar346 +
                  0.041665796) * fVar346 + 0.16666666) * fVar346 + 0.5) + fVar346 + 1.0) + 1.0;
          auVar175._20_4_ =
               auVar315._4_4_ *
               (fVar347 * fVar347 *
                (((((fVar347 * 0.00019875691 + 0.0013981999) * fVar347 + 0.008333452) * fVar347 +
                  0.041665796) * fVar347 + 0.16666666) * fVar347 + 0.5) + fVar347 + 1.0) + 1.0;
          auVar175._24_4_ =
               auVar315._8_4_ *
               (fVar348 * fVar348 *
                (((((fVar348 * 0.00019875691 + 0.0013981999) * fVar348 + 0.008333452) * fVar348 +
                  0.041665796) * fVar348 + 0.16666666) * fVar348 + 0.5) + fVar348 + 1.0) + 1.0;
          auVar175._28_4_ = auVar5._28_4_ + auVar256._28_4_ + 1.0 + 1.0;
          auVar67._8_4_ = 0x40000000;
          auVar67._0_8_ = 0x4000000040000000;
          auVar67._12_4_ = 0x40000000;
          auVar67._16_4_ = 0x40000000;
          auVar67._20_4_ = 0x40000000;
          auVar67._24_4_ = 0x40000000;
          auVar67._28_4_ = 0x40000000;
          auVar70 = vdivps_avx(auVar67,auVar175);
          auVar171._0_4_ = auVar70._0_4_ + -1.0;
          auVar171._4_4_ = auVar70._4_4_ + -1.0;
          auVar171._8_4_ = auVar70._8_4_ + -1.0;
          auVar171._12_4_ = auVar70._12_4_ + -1.0;
          auVar171._16_4_ = auVar70._16_4_ + -1.0;
          auVar171._20_4_ = auVar70._20_4_ + -1.0;
          auVar171._24_4_ = auVar70._24_4_ + -1.0;
          goto LAB_004a5db7;
        case 5:
          fVar242 = *activation_params->data;
          fVar243 = *(float *)((long)activation_params->data + 4);
          auVar176._0_4_ = fVar243 + auVar291._0_4_ * fVar242;
          auVar176._4_4_ = fVar243 + auVar291._4_4_ * fVar242;
          auVar176._8_4_ = fVar243 + auVar291._8_4_ * fVar242;
          auVar176._12_4_ = fVar243 + auVar291._12_4_ * fVar242;
          auVar176._16_4_ = fVar243 + auVar291._16_4_ * fVar242;
          auVar176._20_4_ = fVar243 + auVar291._20_4_ * fVar242;
          auVar176._24_4_ = fVar243 + auVar291._24_4_ * fVar242;
          auVar176._28_4_ = fVar243 + fVar242;
          auVar70 = vmaxps_avx(auVar176,_DAT_005f31a0);
          auVar70 = vminps_avx(auVar261,auVar70);
          auVar171 = auVar70._0_28_;
LAB_004a5db7:
          auVar247 = ZEXT436((uint)fVar243);
          auVar70 = CONCAT428(auVar291._28_4_,
                              CONCAT424(auVar291._24_4_ * auVar171._24_4_,
                                        CONCAT420(auVar291._20_4_ * auVar171._20_4_,
                                                  CONCAT416(auVar291._16_4_ * auVar171._16_4_,
                                                            CONCAT412(auVar291._12_4_ *
                                                                      auVar171._12_4_,
                                                                      CONCAT48(auVar291._8_4_ *
                                                                               auVar171._8_4_,
                                                                               CONCAT44(auVar291.
                                                  _4_4_ * auVar171._4_4_,
                                                  auVar291._0_4_ * auVar171._0_4_)))))));
          in_ZMM12 = ZEXT3264(auVar70);
        }
        auVar70 = vcvtdq2ps_avx(*(undefined1 (*) [32])((long)intptr + 0x20));
        auVar207 = ZEXT436((uint)auVar70._28_4_);
        auVar325._0_4_ = auVar70._0_4_ * (float)local_d8._0_4_ + fVar86;
        auVar325._4_4_ = auVar70._4_4_ * (float)local_d8._4_4_ + fVar111;
        auVar325._8_4_ = auVar70._8_4_ * fStack_d0 + fVar112;
        auVar325._12_4_ = auVar70._12_4_ * fStack_cc + fVar113;
        auVar325._16_4_ = auVar70._16_4_ * fStack_c8 + fVar65;
        auVar325._20_4_ = auVar70._20_4_ * fStack_c4 + fVar345;
        auVar325._24_4_ = auVar70._24_4_ * fStack_c0 + fVar208;
        auVar325._28_4_ = auVar70._28_4_ + fVar241;
        in_ZMM13 = ZEXT3264(auVar325);
        switch(activation_type + -1) {
        case 0:
          auVar70 = vmaxps_avx(auVar325,_DAT_005f31a0);
          in_ZMM13 = ZEXT3264(auVar70);
          break;
        case 1:
          auVar70 = vmaxps_avx(auVar325,ZEXT1632(ZEXT816(0) << 0x40));
          auVar207 = ZEXT436((uint)auVar70._28_4_);
          auVar256 = vminps_avx(auVar325,ZEXT1632(ZEXT816(0) << 0x40));
          fVar242 = *activation_params->data;
          auVar247 = ZEXT436((uint)auVar256._28_4_);
          in_ZMM13 = ZEXT3264(CONCAT428(auVar256._28_4_ + auVar70._28_4_,
                                        CONCAT424(fVar242 * auVar256._24_4_ + auVar70._24_4_,
                                                  CONCAT420(fVar242 * auVar256._20_4_ +
                                                            auVar70._20_4_,
                                                            CONCAT416(fVar242 * auVar256._16_4_ +
                                                                      auVar70._16_4_,
                                                                      CONCAT412(fVar242 * auVar256.
                                                  _12_4_ + auVar70._12_4_,
                                                  CONCAT48(fVar242 * auVar256._8_4_ + auVar70._8_4_,
                                                           CONCAT44(fVar242 * auVar256._4_4_ +
                                                                    auVar70._4_4_,
                                                                    fVar242 * auVar256._0_4_ +
                                                                    auVar70._0_4_))))))));
          break;
        case 2:
          uVar3 = *activation_params->data;
          auVar181._4_4_ = uVar3;
          auVar181._0_4_ = uVar3;
          auVar181._8_4_ = uVar3;
          auVar181._12_4_ = uVar3;
          auVar181._16_4_ = uVar3;
          auVar181._20_4_ = uVar3;
          auVar181._24_4_ = uVar3;
          auVar181._28_4_ = uVar3;
          uVar28 = *(uint *)((long)activation_params->data + 4);
          auVar226._4_4_ = uVar28;
          auVar226._0_4_ = uVar28;
          auVar226._8_4_ = uVar28;
          auVar226._12_4_ = uVar28;
          auVar226._16_4_ = uVar28;
          auVar226._20_4_ = uVar28;
          auVar226._24_4_ = uVar28;
          auVar226._28_4_ = uVar28;
          auVar247 = ZEXT436(uVar28);
          auVar70 = vmaxps_avx(auVar325,auVar181);
          auVar207 = ZEXT436(auVar70._28_4_);
          auVar70 = vminps_avx(auVar226,auVar70);
          in_ZMM13 = ZEXT3264(auVar70);
          break;
        case 3:
          uVar25 = CONCAT44(auVar325._4_4_,auVar325._0_4_);
          auVar182._0_8_ = uVar25 ^ 0x8000000080000000;
          auVar182._8_4_ = -auVar325._8_4_;
          auVar182._12_4_ = -auVar325._12_4_;
          auVar182._16_4_ = -auVar325._16_4_;
          auVar182._20_4_ = -auVar325._20_4_;
          auVar182._24_4_ = -auVar325._24_4_;
          auVar182._28_4_ = -auVar325._28_4_;
          auVar109._8_4_ = 0x42b0c0a5;
          auVar109._0_8_ = 0x42b0c0a542b0c0a5;
          auVar109._12_4_ = 0x42b0c0a5;
          auVar109._16_4_ = 0x42b0c0a5;
          auVar109._20_4_ = 0x42b0c0a5;
          auVar109._24_4_ = 0x42b0c0a5;
          auVar109._28_4_ = 0x42b0c0a5;
          auVar70 = vminps_avx(auVar182,auVar109);
          auVar110 = ZEXT1664(CONCAT412(0x7f007f,CONCAT48(0x7f007f,0x7f007f007f007f)));
          auVar141._8_4_ = 0xc2b0c0a5;
          auVar141._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar141._12_4_ = 0xc2b0c0a5;
          auVar141._16_4_ = 0xc2b0c0a5;
          auVar141._20_4_ = 0xc2b0c0a5;
          auVar141._24_4_ = 0xc2b0c0a5;
          auVar141._28_4_ = 0xc2b0c0a5;
          auVar256 = vmaxps_avx(auVar70,auVar141);
          auVar227._0_4_ = auVar256._0_4_ * 1.442695 + 0.5;
          auVar227._4_4_ = auVar256._4_4_ * 1.442695 + 0.5;
          auVar227._8_4_ = auVar256._8_4_ * 1.442695 + 0.5;
          auVar227._12_4_ = auVar256._12_4_ * 1.442695 + 0.5;
          auVar227._16_4_ = auVar256._16_4_ * 1.442695 + 0.5;
          auVar227._20_4_ = auVar256._20_4_ * 1.442695 + 0.5;
          auVar227._24_4_ = auVar256._24_4_ * 1.442695 + 0.5;
          auVar227._28_4_ = auVar247._0_4_ + 0.5;
          auVar5 = vroundps_avx(auVar227,1);
          auVar70 = vcmpps_avx(auVar227,auVar5,1);
          auVar70 = vandps_avx(auVar70,auVar261);
          auVar70 = vsubps_avx(auVar5,auVar70);
          fVar242 = auVar70._0_4_ * -0.6931472 + auVar256._0_4_;
          fVar243 = auVar70._4_4_ * -0.6931472 + auVar256._4_4_;
          fVar244 = auVar70._8_4_ * -0.6931472 + auVar256._8_4_;
          fVar245 = auVar70._12_4_ * -0.6931472 + auVar256._12_4_;
          fVar246 = auVar70._16_4_ * -0.6931472 + auVar256._16_4_;
          fVar346 = auVar70._20_4_ * -0.6931472 + auVar256._20_4_;
          fVar347 = auVar70._24_4_ * -0.6931472 + auVar256._24_4_;
          auVar212._0_4_ = (int)auVar70._0_4_;
          auVar212._4_4_ = (int)auVar70._4_4_;
          auVar212._8_4_ = (int)auVar70._8_4_;
          auVar212._12_4_ = (int)auVar70._12_4_;
          auVar228._16_4_ = (int)auVar70._16_4_;
          auVar228._0_16_ = auVar212;
          auVar228._20_4_ = (int)auVar70._20_4_;
          auVar228._24_4_ = (int)auVar70._24_4_;
          auVar228._28_4_ = (int)auVar70._28_4_;
          auVar333 = vpslld_avx(auVar212,0x17);
          auVar315 = vpslld_avx(auVar228._16_16_,0x17);
          auVar38._8_4_ = 0x3f800000;
          auVar38._0_8_ = 0x3f8000003f800000;
          auVar38._12_4_ = 0x3f800000;
          auVar315 = vpaddd_avx(auVar315,auVar38);
          auVar333 = vpaddd_avx(auVar333,auVar38);
          auVar43 = ZEXT3264(auVar66);
          auVar247 = ZEXT436(auVar315._12_4_);
          auVar183._0_4_ =
               auVar333._0_4_ *
               (fVar242 * fVar242 *
                (((((fVar242 * 0.00019875691 + 0.0013981999) * fVar242 + 0.008333452) * fVar242 +
                  0.041665796) * fVar242 + 0.16666666) * fVar242 + 0.5) + fVar242 + 1.0) + 1.0;
          auVar183._4_4_ =
               auVar333._4_4_ *
               (fVar243 * fVar243 *
                (((((fVar243 * 0.00019875691 + 0.0013981999) * fVar243 + 0.008333452) * fVar243 +
                  0.041665796) * fVar243 + 0.16666666) * fVar243 + 0.5) + fVar243 + 1.0) + 1.0;
          auVar183._8_4_ =
               auVar333._8_4_ *
               (fVar244 * fVar244 *
                (((((fVar244 * 0.00019875691 + 0.0013981999) * fVar244 + 0.008333452) * fVar244 +
                  0.041665796) * fVar244 + 0.16666666) * fVar244 + 0.5) + fVar244 + 1.0) + 1.0;
          auVar183._12_4_ =
               auVar333._12_4_ *
               (fVar245 * fVar245 *
                (((((fVar245 * 0.00019875691 + 0.0013981999) * fVar245 + 0.008333452) * fVar245 +
                  0.041665796) * fVar245 + 0.16666666) * fVar245 + 0.5) + fVar245 + 1.0) + 1.0;
          auVar183._16_4_ =
               auVar315._0_4_ *
               (fVar246 * fVar246 *
                (((((fVar246 * 0.00019875691 + 0.0013981999) * fVar246 + 0.008333452) * fVar246 +
                  0.041665796) * fVar246 + 0.16666666) * fVar246 + 0.5) + fVar246 + 1.0) + 1.0;
          auVar183._20_4_ =
               auVar315._4_4_ *
               (fVar346 * fVar346 *
                (((((fVar346 * 0.00019875691 + 0.0013981999) * fVar346 + 0.008333452) * fVar346 +
                  0.041665796) * fVar346 + 0.16666666) * fVar346 + 0.5) + fVar346 + 1.0) + 1.0;
          auVar183._24_4_ =
               auVar315._8_4_ *
               (fVar347 * fVar347 *
                (((((fVar347 * 0.00019875691 + 0.0013981999) * fVar347 + 0.008333452) * fVar347 +
                  0.041665796) * fVar347 + 0.16666666) * fVar347 + 0.5) + fVar347 + 1.0) + 1.0;
          auVar183._28_4_ = auVar5._28_4_ + auVar5._28_4_ + auVar256._28_4_ + 1.0 + 1.0;
          auVar207 = ZEXT436((uint)auVar183._28_4_);
          auVar70 = vdivps_avx(auVar261,auVar183);
          in_ZMM13 = ZEXT3264(auVar70);
          break;
        case 4:
          auVar108._8_4_ = 0x42b0c0a5;
          auVar108._0_8_ = 0x42b0c0a542b0c0a5;
          auVar108._12_4_ = 0x42b0c0a5;
          auVar108._16_4_ = 0x42b0c0a5;
          auVar108._20_4_ = 0x42b0c0a5;
          auVar108._24_4_ = 0x42b0c0a5;
          auVar108._28_4_ = 0x42b0c0a5;
          auVar70 = vminps_avx(auVar325,auVar108);
          auVar34._8_4_ = 0xc2b0c0a5;
          auVar34._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar34._12_4_ = 0xc2b0c0a5;
          auVar34._16_4_ = 0xc2b0c0a5;
          auVar34._20_4_ = 0xc2b0c0a5;
          auVar34._24_4_ = 0xc2b0c0a5;
          auVar34._28_4_ = 0xc2b0c0a5;
          auVar256 = vmaxps_avx(auVar70,auVar34);
          auVar221._0_4_ = auVar256._0_4_ * 1.442695 + 0.5;
          auVar221._4_4_ = auVar256._4_4_ * 1.442695 + 0.5;
          auVar221._8_4_ = auVar256._8_4_ * 1.442695 + 0.5;
          auVar221._12_4_ = auVar256._12_4_ * 1.442695 + 0.5;
          auVar221._16_4_ = auVar256._16_4_ * 1.442695 + 0.5;
          auVar221._20_4_ = auVar256._20_4_ * 1.442695 + 0.5;
          auVar221._24_4_ = auVar256._24_4_ * 1.442695 + 0.5;
          auVar221._28_4_ = auVar247._0_4_ + 0.5;
          auVar5 = vroundps_avx(auVar221,1);
          auVar70 = vcmpps_avx(auVar221,auVar5,1);
          auVar70 = vandps_avx(auVar70,auVar261);
          auVar70 = vsubps_avx(auVar5,auVar70);
          auVar10._4_4_ = auVar70._4_4_ * 0.6931472;
          auVar10._0_4_ = auVar70._0_4_ * 0.6931472;
          auVar10._8_4_ = auVar70._8_4_ * 0.6931472;
          auVar10._12_4_ = auVar70._12_4_ * 0.6931472;
          auVar10._16_4_ = auVar70._16_4_ * 0.6931472;
          auVar10._20_4_ = auVar70._20_4_ * 0.6931472;
          auVar10._24_4_ = auVar70._24_4_ * 0.6931472;
          auVar10._28_4_ = auVar5._28_4_;
          auVar256 = vsubps_avx(auVar256,auVar10);
          fVar242 = auVar256._0_4_;
          fVar243 = auVar256._4_4_;
          fVar244 = auVar256._8_4_;
          fVar245 = auVar256._12_4_;
          fVar246 = auVar256._16_4_;
          fVar346 = auVar256._20_4_;
          fVar347 = auVar256._24_4_;
          auVar210._0_4_ = (int)auVar70._0_4_;
          auVar210._4_4_ = (int)auVar70._4_4_;
          auVar210._8_4_ = (int)auVar70._8_4_;
          auVar210._12_4_ = (int)auVar70._12_4_;
          auVar222._16_4_ = (int)auVar70._16_4_;
          auVar222._0_16_ = auVar210;
          auVar222._20_4_ = (int)auVar70._20_4_;
          auVar222._24_4_ = (int)auVar70._24_4_;
          auVar222._28_4_ = (int)auVar70._28_4_;
          auVar333 = vpslld_avx(auVar210,0x17);
          auVar315 = vpslld_avx(auVar222._16_16_,0x17);
          auVar37._8_4_ = 0x3f800000;
          auVar37._0_8_ = 0x3f8000003f800000;
          auVar37._12_4_ = 0x3f800000;
          auVar315 = vpaddd_avx(auVar315,auVar37);
          auVar333 = vpaddd_avx(auVar333,auVar37);
          auVar337._0_4_ =
               auVar333._0_4_ *
               (fVar242 * fVar242 *
                (((((fVar242 * 0.00019875691 + 0.0013981999) * fVar242 + 0.008333452) * fVar242 +
                  0.041665796) * fVar242 + 0.16666666) * fVar242 + 0.5) + fVar242 + 1.0) + 1.0;
          auVar337._4_4_ =
               auVar333._4_4_ *
               (fVar243 * fVar243 *
                (((((fVar243 * 0.00019875691 + 0.0013981999) * fVar243 + 0.008333452) * fVar243 +
                  0.041665796) * fVar243 + 0.16666666) * fVar243 + 0.5) + fVar243 + 1.0) + 1.0;
          auVar337._8_4_ =
               auVar333._8_4_ *
               (fVar244 * fVar244 *
                (((((fVar244 * 0.00019875691 + 0.0013981999) * fVar244 + 0.008333452) * fVar244 +
                  0.041665796) * fVar244 + 0.16666666) * fVar244 + 0.5) + fVar244 + 1.0) + 1.0;
          auVar337._12_4_ =
               auVar333._12_4_ *
               (fVar245 * fVar245 *
                (((((fVar245 * 0.00019875691 + 0.0013981999) * fVar245 + 0.008333452) * fVar245 +
                  0.041665796) * fVar245 + 0.16666666) * fVar245 + 0.5) + fVar245 + 1.0) + 1.0;
          auVar337._16_4_ =
               auVar315._0_4_ *
               (fVar246 * fVar246 *
                (((((fVar246 * 0.00019875691 + 0.0013981999) * fVar246 + 0.008333452) * fVar246 +
                  0.041665796) * fVar246 + 0.16666666) * fVar246 + 0.5) + fVar246 + 1.0) + 1.0;
          auVar337._20_4_ =
               auVar315._4_4_ *
               (fVar346 * fVar346 *
                (((((fVar346 * 0.00019875691 + 0.0013981999) * fVar346 + 0.008333452) * fVar346 +
                  0.041665796) * fVar346 + 0.16666666) * fVar346 + 0.5) + fVar346 + 1.0) + 1.0;
          auVar337._24_4_ =
               auVar315._8_4_ *
               (fVar347 * fVar347 *
                (((((fVar347 * 0.00019875691 + 0.0013981999) * fVar347 + 0.008333452) * fVar347 +
                  0.041665796) * fVar347 + 0.16666666) * fVar347 + 0.5) + fVar347 + 1.0) + 1.0;
          auVar337._28_4_ = auVar5._28_4_ + auVar256._28_4_ + 1.0 + 1.0;
          in_ZMM14 = ZEXT3264(auVar337);
          auVar177._8_4_ = 0x800000;
          auVar177._0_8_ = 0x80000000800000;
          auVar177._12_4_ = 0x800000;
          auVar177._16_4_ = 0x800000;
          auVar177._20_4_ = 0x800000;
          auVar177._24_4_ = 0x800000;
          auVar177._28_4_ = 0x800000;
          auVar5 = vmaxps_avx(auVar337,auVar177);
          auVar315 = vpsrld_avx(auVar5._16_16_,0x17);
          auVar254._8_4_ = 0x807fffff;
          auVar254._0_8_ = 0x807fffff807fffff;
          auVar254._12_4_ = 0x807fffff;
          auVar254._16_4_ = 0x807fffff;
          auVar254._20_4_ = 0x807fffff;
          auVar254._24_4_ = 0x807fffff;
          auVar254._28_4_ = 0x807fffff;
          auVar70 = vandps_avx(auVar254,auVar5);
          auVar148 = vorps_avx(auVar70,auVar82);
          auVar255._8_4_ = 0x3f3504f3;
          auVar255._0_8_ = 0x3f3504f33f3504f3;
          auVar255._12_4_ = 0x3f3504f3;
          auVar255._16_4_ = 0x3f3504f3;
          auVar255._20_4_ = 0x3f3504f3;
          auVar255._24_4_ = 0x3f3504f3;
          auVar255._28_4_ = 0x3f3504f3;
          auVar256 = vcmpps_avx(auVar255,auVar148,2);
          auVar70 = vandnps_avx(auVar256,auVar148);
          fVar242 = auVar148._0_4_ + -1.0 + auVar70._0_4_;
          fVar243 = auVar148._4_4_ + -1.0 + auVar70._4_4_;
          fVar244 = auVar148._8_4_ + -1.0 + auVar70._8_4_;
          fVar245 = auVar148._12_4_ + -1.0 + auVar70._12_4_;
          fVar246 = auVar148._16_4_ + -1.0 + auVar70._16_4_;
          fVar346 = auVar148._20_4_ + -1.0 + auVar70._20_4_;
          fVar347 = auVar148._24_4_ + -1.0 + auVar70._24_4_;
          auVar315 = vpsubd_avx(auVar315,auVar256._16_16_);
          auVar333 = vpsrld_avx(auVar5._0_16_,0x17);
          auVar268._8_4_ = 0xffffff81;
          auVar268._0_8_ = 0xffffff81ffffff81;
          auVar268._12_4_ = 0xffffff81;
          auVar315 = vpaddd_avx(auVar315,auVar268);
          auVar333 = vpsubd_avx(auVar333,auVar256._0_16_);
          auVar333 = vpaddd_avx(auVar268,auVar333);
          auVar178._16_16_ = auVar315;
          auVar178._0_16_ = auVar333;
          auVar256 = vcmpps_avx(auVar337,_DAT_005f31a0,2);
          auVar5 = vcvtdq2ps_avx(auVar178);
          auVar352 = ZEXT1664(CONCAT412(0xff81ff81,CONCAT48(0xff81ff81,0xff81ff81ff81ff81)));
          auVar11._4_4_ =
               (fVar243 * fVar243 *
                (((((((((fVar243 * 0.070376836 + -0.1151461) * fVar243 + 0.116769984) * fVar243 +
                      -0.12420141) * fVar243 + 0.14249323) * fVar243 + -0.16668057) * fVar243 +
                   0.20000714) * fVar243 + -0.24999994) * fVar243 + 0.3333333) * fVar243 + -0.5) +
               fVar243 + auVar5._4_4_ * 0.6931472) * -2.0;
          auVar11._0_4_ =
               (fVar242 * fVar242 *
                (((((((((fVar242 * 0.070376836 + -0.1151461) * fVar242 + 0.116769984) * fVar242 +
                      -0.12420141) * fVar242 + 0.14249323) * fVar242 + -0.16668057) * fVar242 +
                   0.20000714) * fVar242 + -0.24999994) * fVar242 + 0.3333333) * fVar242 + -0.5) +
               fVar242 + auVar5._0_4_ * 0.6931472) * -2.0;
          auVar11._8_4_ =
               (fVar244 * fVar244 *
                (((((((((fVar244 * 0.070376836 + -0.1151461) * fVar244 + 0.116769984) * fVar244 +
                      -0.12420141) * fVar244 + 0.14249323) * fVar244 + -0.16668057) * fVar244 +
                   0.20000714) * fVar244 + -0.24999994) * fVar244 + 0.3333333) * fVar244 + -0.5) +
               fVar244 + auVar5._8_4_ * 0.6931472) * -2.0;
          auVar11._12_4_ =
               (fVar245 * fVar245 *
                (((((((((fVar245 * 0.070376836 + -0.1151461) * fVar245 + 0.116769984) * fVar245 +
                      -0.12420141) * fVar245 + 0.14249323) * fVar245 + -0.16668057) * fVar245 +
                   0.20000714) * fVar245 + -0.24999994) * fVar245 + 0.3333333) * fVar245 + -0.5) +
               fVar245 + auVar5._12_4_ * 0.6931472) * -2.0;
          auVar11._16_4_ =
               (fVar246 * fVar246 *
                (((((((((fVar246 * 0.070376836 + -0.1151461) * fVar246 + 0.116769984) * fVar246 +
                      -0.12420141) * fVar246 + 0.14249323) * fVar246 + -0.16668057) * fVar246 +
                   0.20000714) * fVar246 + -0.24999994) * fVar246 + 0.3333333) * fVar246 + -0.5) +
               fVar246 + auVar5._16_4_ * 0.6931472) * -2.0;
          auVar11._20_4_ =
               (fVar346 * fVar346 *
                (((((((((fVar346 * 0.070376836 + -0.1151461) * fVar346 + 0.116769984) * fVar346 +
                      -0.12420141) * fVar346 + 0.14249323) * fVar346 + -0.16668057) * fVar346 +
                   0.20000714) * fVar346 + -0.24999994) * fVar346 + 0.3333333) * fVar346 + -0.5) +
               fVar346 + auVar5._20_4_ * 0.6931472) * -2.0;
          auVar11._24_4_ =
               (fVar347 * fVar347 *
                (((((((((fVar347 * 0.070376836 + -0.1151461) * fVar347 + 0.116769984) * fVar347 +
                      -0.12420141) * fVar347 + 0.14249323) * fVar347 + -0.16668057) * fVar347 +
                   0.20000714) * fVar347 + -0.24999994) * fVar347 + 0.3333333) * fVar347 + -0.5) +
               fVar347 + auVar5._24_4_ * 0.6931472) * -2.0;
          auVar11._28_4_ = auVar148._28_4_ + -1.0 + auVar70._28_4_ + auVar5._28_4_ + 0.0;
          auVar223._8_4_ = 0x7fffffff;
          auVar223._0_8_ = 0x7fffffff7fffffff;
          auVar223._12_4_ = 0x7fffffff;
          auVar223._16_4_ = 0x7fffffff;
          auVar223._20_4_ = 0x7fffffff;
          auVar223._24_4_ = 0x7fffffff;
          auVar223._28_4_ = 0x7fffffff;
          auVar70 = vblendvps_avx(auVar11,auVar223,auVar256);
          auVar70 = vminps_avx(auVar70,auVar108);
          auVar110 = ZEXT1664(CONCAT412(0x7f007f,CONCAT48(0x7f007f,0x7f007f007f007f)));
          auVar256 = vmaxps_avx(auVar70,auVar34);
          auVar224._0_4_ = auVar256._0_4_ * 1.442695 + 0.5;
          auVar224._4_4_ = auVar256._4_4_ * 1.442695 + 0.5;
          auVar224._8_4_ = auVar256._8_4_ * 1.442695 + 0.5;
          auVar224._12_4_ = auVar256._12_4_ * 1.442695 + 0.5;
          auVar224._16_4_ = auVar256._16_4_ * 1.442695 + 0.5;
          auVar224._20_4_ = auVar256._20_4_ * 1.442695 + 0.5;
          auVar224._24_4_ = auVar256._24_4_ * 1.442695 + 0.5;
          auVar224._28_4_ = 0x7fc00000;
          auVar5 = vroundps_avx(auVar224,1);
          auVar70 = vcmpps_avx(auVar224,auVar5,1);
          auVar70 = vandps_avx(auVar70,auVar261);
          auVar70 = vsubps_avx(auVar5,auVar70);
          auVar12._4_4_ = auVar70._4_4_ * 0.6931472;
          auVar12._0_4_ = auVar70._0_4_ * 0.6931472;
          auVar12._8_4_ = auVar70._8_4_ * 0.6931472;
          auVar12._12_4_ = auVar70._12_4_ * 0.6931472;
          auVar12._16_4_ = auVar70._16_4_ * 0.6931472;
          auVar12._20_4_ = auVar70._20_4_ * 0.6931472;
          auVar12._24_4_ = auVar70._24_4_ * 0.6931472;
          auVar12._28_4_ = auVar5._28_4_;
          auVar256 = vsubps_avx(auVar256,auVar12);
          fVar242 = auVar256._0_4_;
          fVar244 = auVar256._4_4_;
          fVar245 = auVar256._8_4_;
          fVar246 = auVar256._12_4_;
          fVar346 = auVar256._16_4_;
          fVar347 = auVar256._20_4_;
          fVar348 = auVar256._24_4_;
          auVar211._0_4_ = (int)auVar70._0_4_;
          auVar211._4_4_ = (int)auVar70._4_4_;
          auVar211._8_4_ = (int)auVar70._8_4_;
          auVar211._12_4_ = (int)auVar70._12_4_;
          auVar225._16_4_ = (int)auVar70._16_4_;
          auVar225._0_16_ = auVar211;
          auVar225._20_4_ = (int)auVar70._20_4_;
          auVar225._24_4_ = (int)auVar70._24_4_;
          auVar225._28_4_ = (int)auVar70._28_4_;
          auVar333 = vpslld_avx(auVar211,0x17);
          auVar315 = vpslld_avx(auVar225._16_16_,0x17);
          auVar315 = vpaddd_avx(auVar315,auVar37);
          auVar333 = vpaddd_avx(auVar333,auVar37);
          auVar43 = ZEXT3264(auVar66);
          fVar243 = auVar315._12_4_;
          auVar179._0_4_ =
               auVar333._0_4_ *
               (fVar242 * fVar242 *
                (((((fVar242 * 0.00019875691 + 0.0013981999) * fVar242 + 0.008333452) * fVar242 +
                  0.041665796) * fVar242 + 0.16666666) * fVar242 + 0.5) + fVar242 + 1.0) + 1.0;
          auVar179._4_4_ =
               auVar333._4_4_ *
               (fVar244 * fVar244 *
                (((((fVar244 * 0.00019875691 + 0.0013981999) * fVar244 + 0.008333452) * fVar244 +
                  0.041665796) * fVar244 + 0.16666666) * fVar244 + 0.5) + fVar244 + 1.0) + 1.0;
          auVar179._8_4_ =
               auVar333._8_4_ *
               (fVar245 * fVar245 *
                (((((fVar245 * 0.00019875691 + 0.0013981999) * fVar245 + 0.008333452) * fVar245 +
                  0.041665796) * fVar245 + 0.16666666) * fVar245 + 0.5) + fVar245 + 1.0) + 1.0;
          auVar179._12_4_ =
               auVar333._12_4_ *
               (fVar246 * fVar246 *
                (((((fVar246 * 0.00019875691 + 0.0013981999) * fVar246 + 0.008333452) * fVar246 +
                  0.041665796) * fVar246 + 0.16666666) * fVar246 + 0.5) + fVar246 + 1.0) + 1.0;
          auVar179._16_4_ =
               auVar315._0_4_ *
               (fVar346 * fVar346 *
                (((((fVar346 * 0.00019875691 + 0.0013981999) * fVar346 + 0.008333452) * fVar346 +
                  0.041665796) * fVar346 + 0.16666666) * fVar346 + 0.5) + fVar346 + 1.0) + 1.0;
          auVar179._20_4_ =
               auVar315._4_4_ *
               (fVar347 * fVar347 *
                (((((fVar347 * 0.00019875691 + 0.0013981999) * fVar347 + 0.008333452) * fVar347 +
                  0.041665796) * fVar347 + 0.16666666) * fVar347 + 0.5) + fVar347 + 1.0) + 1.0;
          auVar179._24_4_ =
               auVar315._8_4_ *
               (fVar348 * fVar348 *
                (((((fVar348 * 0.00019875691 + 0.0013981999) * fVar348 + 0.008333452) * fVar348 +
                  0.041665796) * fVar348 + 0.16666666) * fVar348 + 0.5) + fVar348 + 1.0) + 1.0;
          auVar179._28_4_ = auVar5._28_4_ + auVar256._28_4_ + 1.0 + 1.0;
          auVar68._8_4_ = 0x40000000;
          auVar68._0_8_ = 0x4000000040000000;
          auVar68._12_4_ = 0x40000000;
          auVar68._16_4_ = 0x40000000;
          auVar68._20_4_ = 0x40000000;
          auVar68._24_4_ = 0x40000000;
          auVar68._28_4_ = 0x40000000;
          auVar70 = vdivps_avx(auVar68,auVar179);
          auVar180._0_4_ = auVar70._0_4_ + -1.0;
          auVar180._4_4_ = auVar70._4_4_ + -1.0;
          auVar180._8_4_ = auVar70._8_4_ + -1.0;
          auVar180._12_4_ = auVar70._12_4_ + -1.0;
          auVar180._16_4_ = auVar70._16_4_ + -1.0;
          auVar180._20_4_ = auVar70._20_4_ + -1.0;
          auVar180._24_4_ = auVar70._24_4_ + -1.0;
          auVar180._28_4_ = auVar70._28_4_ + -1.0;
          goto LAB_004a62b3;
        case 5:
          fVar242 = *activation_params->data;
          fVar243 = *(float *)((long)activation_params->data + 4);
          auVar184._0_4_ = fVar243 + auVar325._0_4_ * fVar242;
          auVar184._4_4_ = fVar243 + auVar325._4_4_ * fVar242;
          auVar184._8_4_ = fVar243 + auVar325._8_4_ * fVar242;
          auVar184._12_4_ = fVar243 + auVar325._12_4_ * fVar242;
          auVar184._16_4_ = fVar243 + auVar325._16_4_ * fVar242;
          auVar184._20_4_ = fVar243 + auVar325._20_4_ * fVar242;
          auVar184._24_4_ = fVar243 + auVar325._24_4_ * fVar242;
          auVar184._28_4_ = fVar243 + fVar242;
          auVar70 = vmaxps_avx(auVar184,_DAT_005f31a0);
          auVar180 = vminps_avx(auVar261,auVar70);
LAB_004a62b3:
          auVar247 = ZEXT436((uint)fVar243);
          auVar207 = ZEXT436(auVar180._28_4_);
          auVar70 = CONCAT428(auVar325._28_4_,
                              CONCAT424(auVar325._24_4_ * auVar180._24_4_,
                                        CONCAT420(auVar325._20_4_ * auVar180._20_4_,
                                                  CONCAT416(auVar325._16_4_ * auVar180._16_4_,
                                                            CONCAT412(auVar325._12_4_ *
                                                                      auVar180._12_4_,
                                                                      CONCAT48(auVar325._8_4_ *
                                                                               auVar180._8_4_,
                                                                               CONCAT44(auVar325.
                                                  _4_4_ * auVar180._4_4_,
                                                  auVar325._0_4_ * auVar180._0_4_)))))));
          in_ZMM13 = ZEXT3264(auVar70);
        }
        auVar135 = auVar43._0_28_;
        auVar332._0_4_ = in_ZMM12._0_4_ * auVar43._0_4_;
        auVar332._4_4_ = in_ZMM12._4_4_ * auVar43._4_4_;
        auVar332._8_4_ = in_ZMM12._8_4_ * auVar43._8_4_;
        auVar332._12_4_ = in_ZMM12._12_4_ * auVar43._12_4_;
        auVar332._16_4_ = in_ZMM12._16_4_ * auVar43._16_4_;
        auVar332._20_4_ = in_ZMM12._20_4_ * auVar43._20_4_;
        auVar332._24_4_ = in_ZMM12._24_4_ * auVar43._24_4_;
        auVar332._28_36_ = auVar207;
        auVar344._0_4_ = in_ZMM13._0_4_ * auVar43._0_4_;
        auVar344._4_4_ = in_ZMM13._4_4_ * auVar43._4_4_;
        auVar344._8_4_ = in_ZMM13._8_4_ * auVar43._8_4_;
        auVar344._12_4_ = in_ZMM13._12_4_ * auVar43._12_4_;
        auVar344._16_4_ = in_ZMM13._16_4_ * auVar43._16_4_;
        auVar344._20_4_ = in_ZMM13._20_4_ * auVar43._20_4_;
        auVar344._24_4_ = in_ZMM13._24_4_ * auVar43._24_4_;
        auVar344._28_36_ = auVar247;
        auVar142._8_4_ = 0x80000000;
        auVar142._0_8_ = 0x8000000080000000;
        auVar142._12_4_ = 0x80000000;
        auVar142._16_4_ = 0x80000000;
        auVar142._20_4_ = 0x80000000;
        auVar142._24_4_ = 0x80000000;
        auVar142._28_4_ = 0x80000000;
        auVar70 = vandps_avx(auVar332._0_32_,auVar142);
        auVar256 = vandps_avx(auVar344._0_32_,auVar142);
        auVar70 = vorps_avx(auVar70,auVar82);
        auVar256 = vorps_avx(auVar256,auVar82);
        auVar158._0_4_ = (int)(auVar70._0_4_ + auVar332._0_4_);
        auVar158._4_4_ = (int)(auVar70._4_4_ + auVar332._4_4_);
        auVar158._8_4_ = (int)(auVar70._8_4_ + auVar332._8_4_);
        auVar158._12_4_ = (int)(auVar70._12_4_ + auVar332._12_4_);
        auVar185._16_4_ = (int)(auVar70._16_4_ + auVar332._16_4_);
        auVar185._0_16_ = auVar158;
        auVar185._20_4_ = (int)(auVar70._20_4_ + auVar332._20_4_);
        auVar185._24_4_ = (int)(auVar70._24_4_ + auVar332._24_4_);
        auVar185._28_4_ = (int)(auVar70._28_4_ + auVar207._0_4_);
        auVar213._0_4_ = (int)(auVar344._0_4_ + auVar256._0_4_);
        auVar213._4_4_ = (int)(auVar344._4_4_ + auVar256._4_4_);
        auVar213._8_4_ = (int)(auVar344._8_4_ + auVar256._8_4_);
        auVar213._12_4_ = (int)(auVar344._12_4_ + auVar256._12_4_);
        auVar229._16_4_ = (int)(auVar344._16_4_ + auVar256._16_4_);
        auVar229._0_16_ = auVar213;
        auVar229._20_4_ = (int)(auVar344._20_4_ + auVar256._20_4_);
        auVar229._24_4_ = (int)(auVar344._24_4_ + auVar256._24_4_);
        auVar229._28_4_ = (int)(auVar247._0_4_ + auVar256._28_4_);
        in_ZMM11 = ZEXT1664(auVar229._16_16_);
        auVar315 = vpackssdw_avx(auVar158,auVar185._16_16_);
        auVar333 = vpackssdw_avx(auVar213,auVar229._16_16_);
        auVar315 = vpminsw_avx(auVar315,auVar110._0_16_);
        auVar333 = vpminsw_avx(auVar333,auVar110._0_16_);
        auVar315 = vpmaxsw_avx(auVar352._0_16_,auVar315);
        auVar333 = vpmaxsw_avx(auVar333,auVar352._0_16_);
        in_ZMM8 = ZEXT1664(auVar333);
        auVar315 = vpacksswb_avx(auVar315,auVar333);
        in_ZMM7 = ZEXT1664(auVar315);
        *(undefined1 (*) [16])ptr = auVar315;
        intptr = (int *)((long)intptr + 0x40);
        ptr = (char *)((long)ptr + 0x10);
        iVar29 = iVar29 + 0x10;
      } while (iVar29 < (int)uVar31);
    }
    if ((int)(uVar27 | 7) < (int)uVar31) {
      pfVar4 = (float *)activation_params->data;
      auVar69._8_4_ = 0x80000000;
      auVar69._0_8_ = 0x8000000080000000;
      auVar69._12_4_ = 0x80000000;
      auVar69._16_4_ = 0x80000000;
      auVar69._20_4_ = 0x80000000;
      auVar69._24_4_ = 0x80000000;
      auVar69._28_4_ = 0x80000000;
      auVar83._8_4_ = 0x3f000000;
      auVar83._0_8_ = 0x3f0000003f000000;
      auVar83._12_4_ = 0x3f000000;
      auVar83._16_4_ = 0x3f000000;
      auVar83._20_4_ = 0x3f000000;
      auVar83._24_4_ = 0x3f000000;
      auVar83._28_4_ = 0x3f000000;
      auVar88._8_4_ = 0x7f007f;
      auVar88._0_8_ = 0x7f007f007f007f;
      auVar88._12_4_ = 0x7f007f;
      auVar115._8_4_ = 0xff81ff81;
      auVar115._0_8_ = 0xff81ff81ff81ff81;
      auVar115._12_4_ = 0xff81ff81;
      auVar262._8_4_ = 0x42b0c0a5;
      auVar262._0_8_ = 0x42b0c0a542b0c0a5;
      auVar262._12_4_ = 0x42b0c0a5;
      auVar262._16_4_ = 0x42b0c0a5;
      auVar262._20_4_ = 0x42b0c0a5;
      auVar262._24_4_ = 0x42b0c0a5;
      auVar262._28_4_ = 0x42b0c0a5;
      auVar43 = ZEXT3264(CONCAT428(0x3f800000,
                                   CONCAT424(0x3f800000,
                                             CONCAT420(0x3f800000,
                                                       CONCAT416(0x3f800000,
                                                                 CONCAT412(0x3f800000,
                                                                           CONCAT48(0x3f800000,
                                                                                                                                                                        
                                                  0x3f8000003f800000)))))));
      uVar28 = uVar27;
      do {
        auVar247 = in_ZMM7._28_36_;
        auVar66 = vcvtdq2ps_avx(*(undefined1 (*) [32])intptr);
        auVar319._0_4_ = auVar66._0_4_ * (float)local_d8._0_4_ + fVar86;
        auVar319._4_4_ = auVar66._4_4_ * (float)local_d8._4_4_ + fVar111;
        auVar319._8_4_ = auVar66._8_4_ * fStack_d0 + fVar112;
        auVar319._12_4_ = auVar66._12_4_ * fStack_cc + fVar113;
        auVar319._16_4_ = auVar66._16_4_ * fStack_c8 + fVar65;
        auVar319._20_4_ = auVar66._20_4_ * fStack_c4 + fVar345;
        auVar319._24_4_ = auVar66._24_4_ * fStack_c0 + fVar208;
        auVar326._28_4_ = auVar66._28_4_ + fVar241;
        auVar326._0_28_ = auVar319;
        auVar66 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar70 = auVar43._0_32_;
        fVar243 = auVar43._4_4_;
        fVar244 = auVar43._8_4_;
        fVar245 = auVar43._12_4_;
        fVar246 = auVar43._16_4_;
        fVar346 = auVar43._20_4_;
        fVar347 = auVar43._24_4_;
        fVar348 = auVar43._28_4_;
        fVar242 = auVar43._0_4_;
        switch(activation_type) {
        case 1:
          auVar66 = vmaxps_avx(auVar326,auVar66);
          auVar319 = auVar66._0_28_;
          break;
        case 2:
          auVar70 = vmaxps_avx(auVar326,auVar66);
          in_ZMM14 = ZEXT3264(auVar70);
          auVar66 = vminps_avx(auVar326,auVar66);
          fVar242 = *pfVar4;
          auVar319._0_4_ = fVar242 * auVar66._0_4_ + auVar70._0_4_;
          auVar319._4_4_ = fVar242 * auVar66._4_4_ + auVar70._4_4_;
          auVar319._8_4_ = fVar242 * auVar66._8_4_ + auVar70._8_4_;
          auVar319._12_4_ = fVar242 * auVar66._12_4_ + auVar70._12_4_;
          auVar319._16_4_ = fVar242 * auVar66._16_4_ + auVar70._16_4_;
          auVar319._20_4_ = fVar242 * auVar66._20_4_ + auVar70._20_4_;
          auVar319._24_4_ = fVar242 * auVar66._24_4_ + auVar70._24_4_;
          break;
        case 3:
          fVar242 = *pfVar4;
          auVar340._4_4_ = fVar242;
          auVar340._0_4_ = fVar242;
          auVar340._8_4_ = fVar242;
          auVar340._12_4_ = fVar242;
          auVar340._16_4_ = fVar242;
          auVar340._20_4_ = fVar242;
          auVar340._24_4_ = fVar242;
          auVar340._28_4_ = fVar242;
          in_ZMM14 = ZEXT3264(auVar340);
          fVar242 = pfVar4[1];
          auVar350._4_4_ = fVar242;
          auVar350._0_4_ = fVar242;
          auVar350._8_4_ = fVar242;
          auVar350._12_4_ = fVar242;
          auVar350._16_4_ = fVar242;
          auVar350._20_4_ = fVar242;
          auVar350._24_4_ = fVar242;
          auVar350._28_4_ = fVar242;
          auVar66 = vmaxps_avx(auVar326,auVar340);
          auVar66 = vminps_avx(auVar66,auVar350);
          auVar319 = auVar66._0_28_;
          break;
        case 4:
          uVar25 = CONCAT44(auVar319._4_4_,auVar319._0_4_);
          auVar327._0_8_ = uVar25 ^ 0x8000000080000000;
          auVar327._8_4_ = -auVar319._8_4_;
          auVar327._12_4_ = -auVar319._12_4_;
          auVar327._16_4_ = -auVar319._16_4_;
          auVar327._20_4_ = -auVar319._20_4_;
          auVar327._24_4_ = -auVar319._24_4_;
          auVar327._28_4_ = -auVar326._28_4_;
          auVar66 = vminps_avx(auVar327,auVar262);
          auVar193._8_4_ = 0xc2b0c0a5;
          auVar193._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar193._12_4_ = 0xc2b0c0a5;
          auVar193._16_4_ = 0xc2b0c0a5;
          auVar193._20_4_ = 0xc2b0c0a5;
          auVar193._24_4_ = 0xc2b0c0a5;
          auVar193._28_4_ = 0xc2b0c0a5;
          auVar256 = vmaxps_avx(auVar66,auVar193);
          auVar341._0_4_ = auVar256._0_4_ * 1.442695 + 0.5;
          auVar341._4_4_ = auVar256._4_4_ * 1.442695 + 0.5;
          auVar341._8_4_ = auVar256._8_4_ * 1.442695 + 0.5;
          auVar341._12_4_ = auVar256._12_4_ * 1.442695 + 0.5;
          auVar341._16_4_ = auVar256._16_4_ * 1.442695 + 0.5;
          auVar341._20_4_ = auVar256._20_4_ * 1.442695 + 0.5;
          auVar341._24_4_ = auVar256._24_4_ * 1.442695 + 0.5;
          auVar341._28_4_ = in_ZMM14._28_4_ + 0.5;
          auVar5 = vroundps_avx(auVar341,1);
          auVar66 = vcmpps_avx(auVar341,auVar5,1);
          auVar66 = vandps_avx(auVar66,auVar70);
          auVar66 = vsubps_avx(auVar5,auVar66);
          fVar349 = auVar256._0_4_ + auVar66._0_4_ * -0.6931472;
          fVar354 = auVar256._4_4_ + auVar66._4_4_ * -0.6931472;
          fVar355 = auVar256._8_4_ + auVar66._8_4_ * -0.6931472;
          fVar356 = auVar256._12_4_ + auVar66._12_4_ * -0.6931472;
          fVar357 = auVar256._16_4_ + auVar66._16_4_ * -0.6931472;
          fVar358 = auVar256._20_4_ + auVar66._20_4_ * -0.6931472;
          fVar359 = auVar256._24_4_ + auVar66._24_4_ * -0.6931472;
          auVar317._0_4_ = (int)auVar66._0_4_;
          auVar317._4_4_ = (int)auVar66._4_4_;
          auVar317._8_4_ = (int)auVar66._8_4_;
          auVar317._12_4_ = (int)auVar66._12_4_;
          auVar328._16_4_ = (int)auVar66._16_4_;
          auVar328._0_16_ = auVar317;
          auVar328._20_4_ = (int)auVar66._20_4_;
          auVar328._24_4_ = (int)auVar66._24_4_;
          auVar328._28_4_ = (int)auVar66._28_4_;
          auVar333 = vpslld_avx(auVar317,0x17);
          auVar315 = vpslld_avx(auVar328._16_16_,0x17);
          auVar159._8_4_ = 0x3f800000;
          auVar159._0_8_ = 0x3f8000003f800000;
          auVar159._12_4_ = 0x3f800000;
          auVar247 = (undefined1  [36])0x0;
          auVar315 = vpaddd_avx(auVar315,auVar159);
          auVar333 = vpaddd_avx(auVar333,auVar159);
          in_ZMM14 = ZEXT1664(auVar333);
          auVar295._0_4_ =
               (fVar349 + fVar242 +
               fVar349 * fVar349 *
               (((((fVar349 * 0.00019875691 + 0.0013981999) * fVar349 + 0.008333452) * fVar349 +
                 0.041665796) * fVar349 + 0.16666666) * fVar349 + 0.5)) * auVar333._0_4_ + fVar242;
          auVar295._4_4_ =
               (fVar354 + fVar243 +
               fVar354 * fVar354 *
               (((((fVar354 * 0.00019875691 + 0.0013981999) * fVar354 + 0.008333452) * fVar354 +
                 0.041665796) * fVar354 + 0.16666666) * fVar354 + 0.5)) * auVar333._4_4_ + fVar243;
          auVar295._8_4_ =
               (fVar355 + fVar244 +
               fVar355 * fVar355 *
               (((((fVar355 * 0.00019875691 + 0.0013981999) * fVar355 + 0.008333452) * fVar355 +
                 0.041665796) * fVar355 + 0.16666666) * fVar355 + 0.5)) * auVar333._8_4_ + fVar244;
          auVar295._12_4_ =
               (fVar356 + fVar245 +
               fVar356 * fVar356 *
               (((((fVar356 * 0.00019875691 + 0.0013981999) * fVar356 + 0.008333452) * fVar356 +
                 0.041665796) * fVar356 + 0.16666666) * fVar356 + 0.5)) * auVar333._12_4_ + fVar245;
          auVar295._16_4_ =
               (fVar357 + fVar246 +
               fVar357 * fVar357 *
               (((((fVar357 * 0.00019875691 + 0.0013981999) * fVar357 + 0.008333452) * fVar357 +
                 0.041665796) * fVar357 + 0.16666666) * fVar357 + 0.5)) * auVar315._0_4_ + fVar246;
          auVar295._20_4_ =
               (fVar358 + fVar346 +
               fVar358 * fVar358 *
               (((((fVar358 * 0.00019875691 + 0.0013981999) * fVar358 + 0.008333452) * fVar358 +
                 0.041665796) * fVar358 + 0.16666666) * fVar358 + 0.5)) * auVar315._4_4_ + fVar346;
          auVar295._24_4_ =
               (fVar359 + fVar347 +
               fVar359 * fVar359 *
               (((((fVar359 * 0.00019875691 + 0.0013981999) * fVar359 + 0.008333452) * fVar359 +
                 0.041665796) * fVar359 + 0.16666666) * fVar359 + 0.5)) * auVar315._8_4_ + fVar347;
          auVar295._28_4_ =
               auVar256._28_4_ + auVar5._28_4_ + fVar348 +
               in_ZMM12._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 + 0.5 +
               fVar348;
          in_ZMM12 = ZEXT3264(auVar295);
          auVar66 = vdivps_avx(auVar70,auVar295);
          auVar319 = auVar66._0_28_;
          break;
        case 5:
          auVar66 = vminps_avx(auVar326,auVar262);
          auVar186._8_4_ = 0xc2b0c0a5;
          auVar186._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar186._12_4_ = 0xc2b0c0a5;
          auVar186._16_4_ = 0xc2b0c0a5;
          auVar186._20_4_ = 0xc2b0c0a5;
          auVar186._24_4_ = 0xc2b0c0a5;
          auVar186._28_4_ = 0xc2b0c0a5;
          auVar256 = vmaxps_avx(auVar66,auVar186);
          auVar338._0_4_ = auVar256._0_4_ * 1.442695 + 0.5;
          auVar338._4_4_ = auVar256._4_4_ * 1.442695 + 0.5;
          auVar338._8_4_ = auVar256._8_4_ * 1.442695 + 0.5;
          auVar338._12_4_ = auVar256._12_4_ * 1.442695 + 0.5;
          auVar338._16_4_ = auVar256._16_4_ * 1.442695 + 0.5;
          auVar338._20_4_ = auVar256._20_4_ * 1.442695 + 0.5;
          auVar338._24_4_ = auVar256._24_4_ * 1.442695 + 0.5;
          auVar338._28_4_ = in_ZMM14._28_4_ + 0.5;
          auVar5 = vroundps_avx(auVar338,1);
          auVar66 = vcmpps_avx(auVar338,auVar5,1);
          auVar66 = vandps_avx(auVar66,auVar70);
          auVar66 = vsubps_avx(auVar5,auVar66);
          auVar13._4_4_ = auVar66._4_4_ * 0.6931472;
          auVar13._0_4_ = auVar66._0_4_ * 0.6931472;
          auVar13._8_4_ = auVar66._8_4_ * 0.6931472;
          auVar13._12_4_ = auVar66._12_4_ * 0.6931472;
          auVar13._16_4_ = auVar66._16_4_ * 0.6931472;
          auVar13._20_4_ = auVar66._20_4_ * 0.6931472;
          auVar13._24_4_ = auVar66._24_4_ * 0.6931472;
          auVar13._28_4_ = auVar5._28_4_;
          auVar256 = vsubps_avx(auVar256,auVar13);
          fVar349 = auVar256._0_4_;
          fVar354 = auVar256._4_4_;
          fVar355 = auVar256._8_4_;
          fVar356 = auVar256._12_4_;
          fVar357 = auVar256._16_4_;
          fVar358 = auVar256._20_4_;
          fVar359 = auVar256._24_4_;
          auVar287._0_4_ = (int)auVar66._0_4_;
          auVar287._4_4_ = (int)auVar66._4_4_;
          auVar287._8_4_ = (int)auVar66._8_4_;
          auVar287._12_4_ = (int)auVar66._12_4_;
          auVar294._16_4_ = (int)auVar66._16_4_;
          auVar294._0_16_ = auVar287;
          auVar294._20_4_ = (int)auVar66._20_4_;
          auVar294._24_4_ = (int)auVar66._24_4_;
          auVar294._28_4_ = (int)auVar66._28_4_;
          auVar333 = vpslld_avx(auVar287,0x17);
          auVar315 = vpslld_avx(auVar294._16_16_,0x17);
          auVar269._8_4_ = 0x3f800000;
          auVar269._0_8_ = 0x3f8000003f800000;
          auVar269._12_4_ = 0x3f800000;
          auVar315 = vpaddd_avx(auVar315,auVar269);
          auVar333 = vpaddd_avx(auVar333,auVar269);
          auVar339._0_4_ =
               (fVar349 + fVar242 +
               fVar349 * fVar349 *
               (((((fVar349 * 0.00019875691 + 0.0013981999) * fVar349 + 0.008333452) * fVar349 +
                 0.041665796) * fVar349 + 0.16666666) * fVar349 + 0.5)) * auVar333._0_4_ + fVar242;
          auVar339._4_4_ =
               (fVar354 + fVar243 +
               fVar354 * fVar354 *
               (((((fVar354 * 0.00019875691 + 0.0013981999) * fVar354 + 0.008333452) * fVar354 +
                 0.041665796) * fVar354 + 0.16666666) * fVar354 + 0.5)) * auVar333._4_4_ + fVar243;
          auVar339._8_4_ =
               (fVar355 + fVar244 +
               fVar355 * fVar355 *
               (((((fVar355 * 0.00019875691 + 0.0013981999) * fVar355 + 0.008333452) * fVar355 +
                 0.041665796) * fVar355 + 0.16666666) * fVar355 + 0.5)) * auVar333._8_4_ + fVar244;
          auVar339._12_4_ =
               (fVar356 + fVar245 +
               fVar356 * fVar356 *
               (((((fVar356 * 0.00019875691 + 0.0013981999) * fVar356 + 0.008333452) * fVar356 +
                 0.041665796) * fVar356 + 0.16666666) * fVar356 + 0.5)) * auVar333._12_4_ + fVar245;
          auVar339._16_4_ =
               (fVar357 + fVar246 +
               fVar357 * fVar357 *
               (((((fVar357 * 0.00019875691 + 0.0013981999) * fVar357 + 0.008333452) * fVar357 +
                 0.041665796) * fVar357 + 0.16666666) * fVar357 + 0.5)) * auVar315._0_4_ + fVar246;
          auVar339._20_4_ =
               (fVar358 + fVar346 +
               fVar358 * fVar358 *
               (((((fVar358 * 0.00019875691 + 0.0013981999) * fVar358 + 0.008333452) * fVar358 +
                 0.041665796) * fVar358 + 0.16666666) * fVar358 + 0.5)) * auVar315._4_4_ + fVar346;
          auVar339._24_4_ =
               (fVar359 + fVar347 +
               fVar359 * fVar359 *
               (((((fVar359 * 0.00019875691 + 0.0013981999) * fVar359 + 0.008333452) * fVar359 +
                 0.041665796) * fVar359 + 0.16666666) * fVar359 + 0.5)) * auVar315._8_4_ + fVar347;
          auVar339._28_4_ =
               auVar256._28_4_ + fVar348 +
               in_ZMM8._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 + 0.5 +
               fVar348;
          in_ZMM14 = ZEXT3264(auVar339);
          auVar187._8_4_ = 0x800000;
          auVar187._0_8_ = 0x80000000800000;
          auVar187._12_4_ = 0x800000;
          auVar187._16_4_ = 0x800000;
          auVar187._20_4_ = 0x800000;
          auVar187._24_4_ = 0x800000;
          auVar187._28_4_ = 0x800000;
          auVar5 = vmaxps_avx(auVar339,auVar187);
          auVar315 = vpsrld_avx(auVar5._16_16_,0x17);
          auVar188._8_4_ = 0x807fffff;
          auVar188._0_8_ = 0x807fffff807fffff;
          auVar188._12_4_ = 0x807fffff;
          auVar188._16_4_ = 0x807fffff;
          auVar188._20_4_ = 0x807fffff;
          auVar188._24_4_ = 0x807fffff;
          auVar188._28_4_ = 0x807fffff;
          auVar66 = vandps_avx(auVar5,auVar188);
          auVar148 = vorps_avx(auVar66,auVar83);
          auVar189._8_4_ = 0x3f3504f3;
          auVar189._0_8_ = 0x3f3504f33f3504f3;
          auVar189._12_4_ = 0x3f3504f3;
          auVar189._16_4_ = 0x3f3504f3;
          auVar189._20_4_ = 0x3f3504f3;
          auVar189._24_4_ = 0x3f3504f3;
          auVar189._28_4_ = 0x3f3504f3;
          auVar256 = vcmpps_avx(auVar189,auVar148,2);
          auVar66 = vandnps_avx(auVar256,auVar148);
          fVar349 = auVar148._0_4_ + -1.0 + auVar66._0_4_;
          fVar354 = auVar148._4_4_ + -1.0 + auVar66._4_4_;
          fVar355 = auVar148._8_4_ + -1.0 + auVar66._8_4_;
          fVar356 = auVar148._12_4_ + -1.0 + auVar66._12_4_;
          fVar357 = auVar148._16_4_ + -1.0 + auVar66._16_4_;
          fVar358 = auVar148._20_4_ + -1.0 + auVar66._20_4_;
          fVar359 = auVar148._24_4_ + -1.0 + auVar66._24_4_;
          auVar315 = vpsubd_avx(auVar315,auVar256._16_16_);
          auVar333 = vpsrld_avx(auVar5._0_16_,0x17);
          auVar288._8_4_ = 0xffffff81;
          auVar288._0_8_ = 0xffffff81ffffff81;
          auVar288._12_4_ = 0xffffff81;
          auVar315 = vpaddd_avx(auVar288,auVar315);
          auVar333 = vpsubd_avx(auVar333,auVar256._0_16_);
          auVar333 = vpaddd_avx(auVar333,auVar288);
          auVar190._16_16_ = auVar315;
          auVar190._0_16_ = auVar333;
          auVar256 = vcmpps_avx(auVar339,_DAT_005f31a0,2);
          auVar5 = vcvtdq2ps_avx(auVar190);
          auVar14._4_4_ =
               (fVar354 * fVar354 *
                (((((((((fVar354 * 0.070376836 + -0.1151461) * fVar354 + 0.116769984) * fVar354 +
                      -0.12420141) * fVar354 + 0.14249323) * fVar354 + -0.16668057) * fVar354 +
                   0.20000714) * fVar354 + -0.24999994) * fVar354 + 0.3333333) * fVar354 + -0.5) +
               fVar354 + auVar5._4_4_ * 0.6931472) * -2.0;
          auVar14._0_4_ =
               (fVar349 * fVar349 *
                (((((((((fVar349 * 0.070376836 + -0.1151461) * fVar349 + 0.116769984) * fVar349 +
                      -0.12420141) * fVar349 + 0.14249323) * fVar349 + -0.16668057) * fVar349 +
                   0.20000714) * fVar349 + -0.24999994) * fVar349 + 0.3333333) * fVar349 + -0.5) +
               fVar349 + auVar5._0_4_ * 0.6931472) * -2.0;
          auVar14._8_4_ =
               (fVar355 * fVar355 *
                (((((((((fVar355 * 0.070376836 + -0.1151461) * fVar355 + 0.116769984) * fVar355 +
                      -0.12420141) * fVar355 + 0.14249323) * fVar355 + -0.16668057) * fVar355 +
                   0.20000714) * fVar355 + -0.24999994) * fVar355 + 0.3333333) * fVar355 + -0.5) +
               fVar355 + auVar5._8_4_ * 0.6931472) * -2.0;
          auVar14._12_4_ =
               (fVar356 * fVar356 *
                (((((((((fVar356 * 0.070376836 + -0.1151461) * fVar356 + 0.116769984) * fVar356 +
                      -0.12420141) * fVar356 + 0.14249323) * fVar356 + -0.16668057) * fVar356 +
                   0.20000714) * fVar356 + -0.24999994) * fVar356 + 0.3333333) * fVar356 + -0.5) +
               fVar356 + auVar5._12_4_ * 0.6931472) * -2.0;
          auVar14._16_4_ =
               (fVar357 * fVar357 *
                (((((((((fVar357 * 0.070376836 + -0.1151461) * fVar357 + 0.116769984) * fVar357 +
                      -0.12420141) * fVar357 + 0.14249323) * fVar357 + -0.16668057) * fVar357 +
                   0.20000714) * fVar357 + -0.24999994) * fVar357 + 0.3333333) * fVar357 + -0.5) +
               fVar357 + auVar5._16_4_ * 0.6931472) * -2.0;
          auVar14._20_4_ =
               (fVar358 * fVar358 *
                (((((((((fVar358 * 0.070376836 + -0.1151461) * fVar358 + 0.116769984) * fVar358 +
                      -0.12420141) * fVar358 + 0.14249323) * fVar358 + -0.16668057) * fVar358 +
                   0.20000714) * fVar358 + -0.24999994) * fVar358 + 0.3333333) * fVar358 + -0.5) +
               fVar358 + auVar5._20_4_ * 0.6931472) * -2.0;
          auVar14._24_4_ =
               (fVar359 * fVar359 *
                (((((((((fVar359 * 0.070376836 + -0.1151461) * fVar359 + 0.116769984) * fVar359 +
                      -0.12420141) * fVar359 + 0.14249323) * fVar359 + -0.16668057) * fVar359 +
                   0.20000714) * fVar359 + -0.24999994) * fVar359 + 0.3333333) * fVar359 + -0.5) +
               fVar359 + auVar5._24_4_ * 0.6931472) * -2.0;
          auVar14._28_4_ = auVar148._28_4_ + -1.0 + auVar66._28_4_ + auVar5._28_4_ + 0.0;
          auVar230._8_4_ = 0x7fffffff;
          auVar230._0_8_ = 0x7fffffff7fffffff;
          auVar230._12_4_ = 0x7fffffff;
          auVar230._16_4_ = 0x7fffffff;
          auVar230._20_4_ = 0x7fffffff;
          auVar230._24_4_ = 0x7fffffff;
          auVar230._28_4_ = 0x7fffffff;
          auVar66 = vblendvps_avx(auVar14,auVar230,auVar256);
          auVar66 = vminps_avx(auVar262,auVar66);
          auVar231._8_4_ = 0xc2b0c0a5;
          auVar231._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar231._12_4_ = 0xc2b0c0a5;
          auVar231._16_4_ = 0xc2b0c0a5;
          auVar231._20_4_ = 0xc2b0c0a5;
          auVar231._24_4_ = 0xc2b0c0a5;
          auVar231._28_4_ = 0xc2b0c0a5;
          auVar256 = vmaxps_avx(auVar231,auVar66);
          auVar232._0_4_ = auVar256._0_4_ * 1.442695 + 0.5;
          auVar232._4_4_ = auVar256._4_4_ * 1.442695 + 0.5;
          auVar232._8_4_ = auVar256._8_4_ * 1.442695 + 0.5;
          auVar232._12_4_ = auVar256._12_4_ * 1.442695 + 0.5;
          auVar232._16_4_ = auVar256._16_4_ * 1.442695 + 0.5;
          auVar232._20_4_ = auVar256._20_4_ * 1.442695 + 0.5;
          auVar232._24_4_ = auVar256._24_4_ * 1.442695 + 0.5;
          auVar232._28_4_ = 0x3ff8aa3b;
          auVar5 = vroundps_avx(auVar232,1);
          auVar66 = vcmpps_avx(auVar232,auVar5,1);
          auVar66 = vandps_avx(auVar66,auVar70);
          auVar66 = vsubps_avx(auVar5,auVar66);
          auVar15._4_4_ = auVar66._4_4_ * 0.6931472;
          auVar15._0_4_ = auVar66._0_4_ * 0.6931472;
          auVar15._8_4_ = auVar66._8_4_ * 0.6931472;
          auVar15._12_4_ = auVar66._12_4_ * 0.6931472;
          auVar15._16_4_ = auVar66._16_4_ * 0.6931472;
          auVar15._20_4_ = auVar66._20_4_ * 0.6931472;
          auVar15._24_4_ = auVar66._24_4_ * 0.6931472;
          auVar15._28_4_ = auVar5._28_4_;
          auVar256 = vsubps_avx(auVar256,auVar15);
          fVar349 = auVar256._0_4_;
          fVar354 = auVar256._4_4_;
          fVar355 = auVar256._8_4_;
          fVar356 = auVar256._12_4_;
          fVar357 = auVar256._16_4_;
          fVar358 = auVar256._20_4_;
          fVar359 = auVar256._24_4_;
          fVar286 = ((((fVar349 * 0.00019875691 + 0.0013981999) * fVar349 + 0.008333452) * fVar349 +
                     0.041665796) * fVar349 + 0.16666666) * fVar349 + 0.5;
          fVar308 = ((((fVar354 * 0.00019875691 + 0.0013981999) * fVar354 + 0.008333452) * fVar354 +
                     0.041665796) * fVar354 + 0.16666666) * fVar354 + 0.5;
          fVar309 = ((((fVar355 * 0.00019875691 + 0.0013981999) * fVar355 + 0.008333452) * fVar355 +
                     0.041665796) * fVar355 + 0.16666666) * fVar355 + 0.5;
          fVar310 = ((((fVar356 * 0.00019875691 + 0.0013981999) * fVar356 + 0.008333452) * fVar356 +
                     0.041665796) * fVar356 + 0.16666666) * fVar356 + 0.5;
          fVar311 = ((((fVar357 * 0.00019875691 + 0.0013981999) * fVar357 + 0.008333452) * fVar357 +
                     0.041665796) * fVar357 + 0.16666666) * fVar357 + 0.5;
          fVar312 = ((((fVar358 * 0.00019875691 + 0.0013981999) * fVar358 + 0.008333452) * fVar358 +
                     0.041665796) * fVar358 + 0.16666666) * fVar358 + 0.5;
          fVar313 = ((((fVar359 * 0.00019875691 + 0.0013981999) * fVar359 + 0.008333452) * fVar359 +
                     0.041665796) * fVar359 + 0.16666666) * fVar359 + 0.5;
          in_ZMM12 = ZEXT3264(CONCAT428(0x3f37d30c,
                                        CONCAT424(fVar313,CONCAT420(fVar312,CONCAT416(fVar311,
                                                  CONCAT412(fVar310,CONCAT48(fVar309,CONCAT44(
                                                  fVar308,fVar286))))))));
          auVar214._0_4_ = (int)auVar66._0_4_;
          auVar214._4_4_ = (int)auVar66._4_4_;
          auVar214._8_4_ = (int)auVar66._8_4_;
          auVar214._12_4_ = (int)auVar66._12_4_;
          auVar233._16_4_ = (int)auVar66._16_4_;
          auVar233._0_16_ = auVar214;
          auVar233._20_4_ = (int)auVar66._20_4_;
          auVar233._24_4_ = (int)auVar66._24_4_;
          auVar233._28_4_ = (int)auVar66._28_4_;
          auVar333 = vpslld_avx(auVar214,0x17);
          auVar315 = vpslld_avx(auVar233._16_16_,0x17);
          auVar270._8_4_ = 0x3f800000;
          auVar270._0_8_ = 0x3f8000003f800000;
          auVar270._12_4_ = 0x3f800000;
          auVar315 = vpaddd_avx(auVar315,auVar270);
          auVar333 = vpaddd_avx(auVar333,auVar270);
          auVar43 = ZEXT3264(auVar70);
          auVar191._0_4_ =
               auVar333._0_4_ * (fVar349 * fVar349 * fVar286 + fVar349 + fVar242) + fVar242;
          auVar191._4_4_ =
               auVar333._4_4_ * (fVar354 * fVar354 * fVar308 + fVar354 + fVar243) + fVar243;
          auVar191._8_4_ =
               auVar333._8_4_ * (fVar355 * fVar355 * fVar309 + fVar355 + fVar244) + fVar244;
          auVar191._12_4_ =
               auVar333._12_4_ * (fVar356 * fVar356 * fVar310 + fVar356 + fVar245) + fVar245;
          auVar191._16_4_ =
               auVar315._0_4_ * (fVar357 * fVar357 * fVar311 + fVar357 + fVar246) + fVar246;
          auVar191._20_4_ =
               auVar315._4_4_ * (fVar358 * fVar358 * fVar312 + fVar358 + fVar346) + fVar346;
          auVar191._24_4_ =
               auVar315._8_4_ * (fVar359 * fVar359 * fVar313 + fVar359 + fVar347) + fVar347;
          auVar191._28_4_ = auVar5._28_4_ + auVar256._28_4_ + fVar348 + fVar348;
          auVar234._8_4_ = 0x40000000;
          auVar234._0_8_ = 0x4000000040000000;
          auVar234._12_4_ = 0x40000000;
          auVar234._16_4_ = 0x40000000;
          auVar234._20_4_ = 0x40000000;
          auVar234._24_4_ = 0x40000000;
          auVar234._28_4_ = 0x40000000;
          auVar66 = vdivps_avx(auVar234,auVar191);
          auVar192._0_4_ = auVar66._0_4_ + -1.0;
          auVar192._4_4_ = auVar66._4_4_ + -1.0;
          auVar192._8_4_ = auVar66._8_4_ + -1.0;
          auVar192._12_4_ = auVar66._12_4_ + -1.0;
          auVar192._16_4_ = auVar66._16_4_ + -1.0;
          auVar192._20_4_ = auVar66._20_4_ + -1.0;
          auVar192._24_4_ = auVar66._24_4_ + -1.0;
          auVar192._28_4_ = auVar66._28_4_ + -1.0;
          goto LAB_004a6875;
        case 6:
          fVar242 = *pfVar4;
          fVar243 = pfVar4[1];
          auVar194._0_4_ = fVar243 + auVar319._0_4_ * fVar242;
          auVar194._4_4_ = fVar243 + auVar319._4_4_ * fVar242;
          auVar194._8_4_ = fVar243 + auVar319._8_4_ * fVar242;
          auVar194._12_4_ = fVar243 + auVar319._12_4_ * fVar242;
          auVar194._16_4_ = fVar243 + auVar319._16_4_ * fVar242;
          auVar194._20_4_ = fVar243 + auVar319._20_4_ * fVar242;
          auVar194._24_4_ = fVar243 + auVar319._24_4_ * fVar242;
          auVar194._28_4_ = fVar243 + fVar242;
          auVar66 = vmaxps_avx(auVar66,auVar194);
          auVar192 = vminps_avx(auVar70,auVar66);
LAB_004a6875:
          auVar247 = ZEXT436(auVar192._28_4_);
          auVar319._0_4_ = auVar319._0_4_ * auVar192._0_4_;
          auVar319._4_4_ = auVar319._4_4_ * auVar192._4_4_;
          auVar319._8_4_ = auVar319._8_4_ * auVar192._8_4_;
          auVar319._12_4_ = auVar319._12_4_ * auVar192._12_4_;
          auVar319._16_4_ = auVar319._16_4_ * auVar192._16_4_;
          auVar319._20_4_ = auVar319._20_4_ * auVar192._20_4_;
          auVar319._24_4_ = auVar319._24_4_ * auVar192._24_4_;
        }
        auVar110._0_4_ = auVar319._0_4_ * auVar135._0_4_;
        auVar110._4_4_ = auVar319._4_4_ * auVar135._4_4_;
        auVar110._8_4_ = auVar319._8_4_ * auVar135._8_4_;
        auVar110._12_4_ = auVar319._12_4_ * auVar135._12_4_;
        auVar110._16_4_ = auVar319._16_4_ * auVar135._16_4_;
        auVar110._20_4_ = auVar319._20_4_ * auVar135._20_4_;
        auVar110._24_4_ = auVar319._24_4_ * auVar135._24_4_;
        auVar110._28_36_ = auVar247;
        auVar66 = vandps_avx(auVar110._0_32_,auVar69);
        auVar66 = vorps_avx(auVar66,auVar83);
        auVar160._0_4_ = (int)(auVar66._0_4_ + auVar110._0_4_);
        auVar160._4_4_ = (int)(auVar66._4_4_ + auVar110._4_4_);
        auVar160._8_4_ = (int)(auVar66._8_4_ + auVar110._8_4_);
        auVar160._12_4_ = (int)(auVar66._12_4_ + auVar110._12_4_);
        auVar195._16_4_ = (int)(auVar66._16_4_ + auVar110._16_4_);
        auVar195._0_16_ = auVar160;
        auVar195._20_4_ = (int)(auVar66._20_4_ + auVar110._20_4_);
        auVar195._24_4_ = (int)(auVar66._24_4_ + auVar110._24_4_);
        auVar195._28_4_ = (int)(auVar66._28_4_ + auVar247._0_4_);
        in_ZMM8 = ZEXT1664(auVar195._16_16_);
        auVar315 = vpackssdw_avx(auVar160,auVar195._16_16_);
        auVar315 = vpminsw_avx(auVar315,auVar88);
        auVar315 = vpmaxsw_avx(auVar315,auVar115);
        auVar315 = vpacksswb_avx(auVar315,auVar315);
        in_ZMM7 = ZEXT1664(auVar315);
        *(long *)*(undefined1 (*) [16])ptr = auVar315._0_8_;
        intptr = (int *)((long)intptr + 0x20);
        ptr = *(undefined1 (*) [16])ptr + 8;
        uVar27 = uVar28 + 8;
        iVar29 = uVar28 + 0xf;
        uVar28 = uVar27;
      } while (iVar29 < (int)uVar31);
    }
    if ((int)(uVar27 | 3) < (int)uVar31) {
      auVar43 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
      auVar39._8_4_ = 0x3f000000;
      auVar39._0_8_ = 0x3f0000003f000000;
      auVar39._12_4_ = 0x3f000000;
      auVar110 = ZEXT1664(CONCAT412(0x7f007f,CONCAT48(0x7f007f,0x7f007f007f007f)));
      auVar352 = ZEXT1664(CONCAT412(0xff81ff81,CONCAT48(0xff81ff81,0xff81ff81ff81ff81)));
      auVar85 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar285 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
      auVar307 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
      auVar332 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
      auVar217._8_4_ = 0x3f800000;
      auVar217._0_8_ = 0x3f8000003f800000;
      auVar217._12_4_ = 0x3f800000;
      auVar344 = ZEXT1664(CONCAT412(0x39506967,CONCAT48(0x39506967,0x3950696739506967)));
      auVar353 = ZEXT1664(CONCAT412(0x3ab743ce,CONCAT48(0x3ab743ce,0x3ab743ce3ab743ce)));
      uVar28 = uVar27;
      do {
        auVar315 = vcvtdq2ps_avx(*(undefined1 (*) [16])*(undefined1 (*) [32])intptr);
        auVar248._0_4_ = fVar1 * auVar315._0_4_ + fVar87;
        auVar248._4_4_ = fVar1 * auVar315._4_4_ + fVar87;
        auVar248._8_4_ = fVar1 * auVar315._8_4_ + fVar87;
        auVar248._12_4_ = fVar1 * auVar315._12_4_ + fVar87;
        auVar315 = auVar85._0_16_;
        fVar86 = auVar332._0_4_;
        fVar111 = auVar332._4_4_;
        fVar112 = auVar332._8_4_;
        fVar113 = auVar332._12_4_;
        fVar65 = auVar344._0_4_;
        fVar345 = auVar344._4_4_;
        fVar208 = auVar344._8_4_;
        fVar241 = auVar344._12_4_;
        auVar259 = auVar307._0_16_;
        auVar333 = auVar285._0_16_;
        fVar242 = auVar353._0_4_;
        fVar243 = auVar353._4_4_;
        fVar244 = auVar353._8_4_;
        fVar245 = auVar353._12_4_;
        switch(activation_type) {
        case 1:
          auVar248 = vmaxps_avx(auVar248,auVar315);
          break;
        case 2:
          auVar333 = vmaxps_avx(auVar248,auVar315);
          auVar315 = vminps_avx(auVar248,auVar315);
          fVar86 = *activation_params->data;
          auVar248._0_4_ = auVar315._0_4_ * fVar86 + auVar333._0_4_;
          auVar248._4_4_ = auVar315._4_4_ * fVar86 + auVar333._4_4_;
          auVar248._8_4_ = auVar315._8_4_ * fVar86 + auVar333._8_4_;
          auVar248._12_4_ = auVar315._12_4_ * fVar86 + auVar333._12_4_;
          break;
        case 3:
          uVar3 = *activation_params->data;
          auVar92._4_4_ = uVar3;
          auVar92._0_4_ = uVar3;
          auVar92._8_4_ = uVar3;
          auVar92._12_4_ = uVar3;
          uVar3 = *(undefined4 *)((long)activation_params->data + 4);
          auVar123._4_4_ = uVar3;
          auVar123._0_4_ = uVar3;
          auVar123._8_4_ = uVar3;
          auVar123._12_4_ = uVar3;
          auVar315 = vmaxps_avx(auVar248,auVar92);
          auVar248 = vminps_avx(auVar315,auVar123);
          break;
        case 4:
          auVar93._0_4_ = (uint)auVar248._0_4_ ^ auVar43._0_4_;
          auVar93._4_4_ = (uint)auVar248._4_4_ ^ auVar43._4_4_;
          auVar93._8_4_ = (uint)auVar248._8_4_ ^ auVar43._8_4_;
          auVar93._12_4_ = (uint)auVar248._12_4_ ^ auVar43._12_4_;
          auVar315 = vminps_avx(auVar333,auVar93);
          auVar259 = vmaxps_avx(auVar259,auVar315);
          auVar124._0_4_ = fVar86 * auVar259._0_4_ + 0.5;
          auVar124._4_4_ = fVar111 * auVar259._4_4_ + 0.5;
          auVar124._8_4_ = fVar112 * auVar259._8_4_ + 0.5;
          auVar124._12_4_ = fVar113 * auVar259._12_4_ + 0.5;
          auVar249._0_4_ = (int)auVar124._0_4_;
          auVar249._4_4_ = (int)auVar124._4_4_;
          auVar249._8_4_ = (int)auVar124._8_4_;
          auVar249._12_4_ = (int)auVar124._12_4_;
          auVar333 = vcvtdq2ps_avx(auVar249);
          auVar315 = vcmpps_avx(auVar124,auVar333,1);
          auVar315 = vandps_avx(auVar217,auVar315);
          auVar315 = vsubps_avx(auVar333,auVar315);
          fVar86 = auVar315._0_4_ * -0.6931472 + auVar259._0_4_;
          fVar111 = auVar315._4_4_ * -0.6931472 + auVar259._4_4_;
          fVar112 = auVar315._8_4_ * -0.6931472 + auVar259._8_4_;
          fVar113 = auVar315._12_4_ * -0.6931472 + auVar259._12_4_;
          auVar110 = ZEXT1664(CONCAT412(0x7f007f,CONCAT48(0x7f007f,0x7f007f007f007f)));
          auVar352 = ZEXT1664(CONCAT412(0xff81ff81,CONCAT48(0xff81ff81,0xff81ff81ff81ff81)));
          auVar43 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
          auVar125._0_4_ = (int)auVar315._0_4_;
          auVar125._4_4_ = (int)auVar315._4_4_;
          auVar125._8_4_ = (int)auVar315._8_4_;
          auVar125._12_4_ = (int)auVar315._12_4_;
          auVar315 = vpslld_avx(auVar125,0x17);
          auVar315 = vpaddd_avx(auVar217,auVar315);
          auVar94._0_4_ =
               (fVar86 + 1.0 +
               fVar86 * fVar86 *
               (((((fVar242 + fVar65 * fVar86) * fVar86 + 0.008333452) * fVar86 + 0.041665796) *
                 fVar86 + 0.16666666) * fVar86 + 0.5)) * auVar315._0_4_ + 1.0;
          auVar94._4_4_ =
               (fVar111 + 1.0 +
               fVar111 * fVar111 *
               (((((fVar243 + fVar345 * fVar111) * fVar111 + 0.008333452) * fVar111 + 0.041665796) *
                 fVar111 + 0.16666666) * fVar111 + 0.5)) * auVar315._4_4_ + 1.0;
          auVar94._8_4_ =
               (fVar112 + 1.0 +
               fVar112 * fVar112 *
               (((((fVar244 + fVar208 * fVar112) * fVar112 + 0.008333452) * fVar112 + 0.041665796) *
                 fVar112 + 0.16666666) * fVar112 + 0.5)) * auVar315._8_4_ + 1.0;
          auVar94._12_4_ =
               (fVar113 + 1.0 +
               fVar113 * fVar113 *
               (((((fVar245 + fVar241 * fVar113) * fVar113 + 0.008333452) * fVar113 + 0.041665796) *
                 fVar113 + 0.16666666) * fVar113 + 0.5)) * auVar315._12_4_ + 1.0;
          auVar248 = vdivps_avx(auVar217,auVar94);
          break;
        case 5:
          auVar315 = vminps_avx(auVar248,auVar333);
          auVar44 = vmaxps_avx(auVar259,auVar315);
          auVar117._0_4_ = fVar86 * auVar44._0_4_ + 0.5;
          auVar117._4_4_ = fVar111 * auVar44._4_4_ + 0.5;
          auVar117._8_4_ = fVar112 * auVar44._8_4_ + 0.5;
          auVar117._12_4_ = fVar113 * auVar44._12_4_ + 0.5;
          auVar162._0_4_ = (int)auVar117._0_4_;
          auVar162._4_4_ = (int)auVar117._4_4_;
          auVar162._8_4_ = (int)auVar117._8_4_;
          auVar162._12_4_ = (int)auVar117._12_4_;
          auVar164 = vcvtdq2ps_avx(auVar162);
          auVar315 = vcmpps_avx(auVar117,auVar164,1);
          auVar315 = vandps_avx(auVar217,auVar315);
          auVar315 = vsubps_avx(auVar164,auVar315);
          auVar163._0_4_ = auVar315._0_4_ * 0.6931472;
          auVar163._4_4_ = auVar315._4_4_ * 0.6931472;
          auVar163._8_4_ = auVar315._8_4_ * 0.6931472;
          auVar163._12_4_ = auVar315._12_4_ * 0.6931472;
          auVar164 = vsubps_avx(auVar44,auVar163);
          fVar246 = auVar164._0_4_;
          fVar346 = auVar164._4_4_;
          fVar347 = auVar164._8_4_;
          fVar348 = auVar164._12_4_;
          auVar118._0_4_ = (int)auVar315._0_4_;
          auVar118._4_4_ = (int)auVar315._4_4_;
          auVar118._8_4_ = (int)auVar315._8_4_;
          auVar118._12_4_ = (int)auVar315._12_4_;
          auVar315 = vpslld_avx(auVar118,0x17);
          auVar315 = vpaddd_avx(auVar217,auVar315);
          auVar89._0_4_ =
               (fVar246 + 1.0 +
               (((((fVar65 * fVar246 + fVar242) * fVar246 + 0.008333452) * fVar246 + 0.041665796) *
                 fVar246 + 0.16666666) * fVar246 + 0.5) * fVar246 * fVar246) * auVar315._0_4_ + 1.0;
          auVar89._4_4_ =
               (fVar346 + 1.0 +
               (((((fVar345 * fVar346 + fVar243) * fVar346 + 0.008333452) * fVar346 + 0.041665796) *
                 fVar346 + 0.16666666) * fVar346 + 0.5) * fVar346 * fVar346) * auVar315._4_4_ + 1.0;
          auVar89._8_4_ =
               (fVar347 + 1.0 +
               (((((fVar208 * fVar347 + fVar244) * fVar347 + 0.008333452) * fVar347 + 0.041665796) *
                 fVar347 + 0.16666666) * fVar347 + 0.5) * fVar347 * fVar347) * auVar315._8_4_ + 1.0;
          auVar89._12_4_ =
               (fVar348 + 1.0 +
               (((((fVar241 * fVar348 + fVar245) * fVar348 + 0.008333452) * fVar348 + 0.041665796) *
                 fVar348 + 0.16666666) * fVar348 + 0.5) * fVar348 * fVar348) * auVar315._12_4_ + 1.0
          ;
          auVar74._8_4_ = 0x800000;
          auVar74._0_8_ = 0x80000000800000;
          auVar74._12_4_ = 0x800000;
          auVar315 = vmaxps_avx(auVar89,auVar74);
          auVar164 = vpsrld_avx(auVar315,0x17);
          auVar75._8_4_ = 0xffffff82;
          auVar75._0_8_ = 0xffffff82ffffff82;
          auVar75._12_4_ = 0xffffff82;
          auVar164 = vpaddd_avx(auVar164,auVar75);
          auVar76._8_4_ = 0x807fffff;
          auVar76._0_8_ = 0x807fffff807fffff;
          auVar76._12_4_ = 0x807fffff;
          auVar315 = vandps_avx(auVar315,auVar76);
          auVar271 = vorps_avx(auVar315,auVar39);
          auVar44 = vcvtdq2ps_avx(auVar164);
          auVar77._8_4_ = 0x3f3504f3;
          auVar77._0_8_ = 0x3f3504f33f3504f3;
          auVar77._12_4_ = 0x3f3504f3;
          auVar164 = vcmpps_avx(auVar271,auVar77,1);
          auVar315 = vandps_avx(auVar164,auVar271);
          fVar246 = auVar315._0_4_ + auVar271._0_4_ + -1.0;
          fVar346 = auVar315._4_4_ + auVar271._4_4_ + -1.0;
          fVar347 = auVar315._8_4_ + auVar271._8_4_ + -1.0;
          fVar348 = auVar315._12_4_ + auVar271._12_4_ + -1.0;
          auVar315 = vandps_avx(auVar164,auVar217);
          auVar164 = vsubps_avx(auVar44,auVar315);
          auVar285 = ZEXT1664(auVar333);
          auVar307 = ZEXT1664(auVar259);
          auVar332 = ZEXT1664(auVar332._0_16_);
          auVar344 = ZEXT1664(auVar344._0_16_);
          auVar353 = ZEXT1664(auVar353._0_16_);
          auVar85 = ZEXT1664(ZEXT816(0));
          auVar315 = vcmpps_avx(auVar89,ZEXT816(0),2);
          auVar119._0_4_ =
               (fVar246 * fVar246 *
                (((((((((fVar246 * 0.070376836 + -0.1151461) * fVar246 + 0.116769984) * fVar246 +
                      -0.12420141) * fVar246 + 0.14249323) * fVar246 + -0.16668057) * fVar246 +
                   0.20000714) * fVar246 + -0.24999994) * fVar246 + 0.3333333) * fVar246 + -0.5) +
               auVar164._0_4_ * 0.6931472 + fVar246) * -2.0;
          auVar119._4_4_ =
               (fVar346 * fVar346 *
                (((((((((fVar346 * 0.070376836 + -0.1151461) * fVar346 + 0.116769984) * fVar346 +
                      -0.12420141) * fVar346 + 0.14249323) * fVar346 + -0.16668057) * fVar346 +
                   0.20000714) * fVar346 + -0.24999994) * fVar346 + 0.3333333) * fVar346 + -0.5) +
               auVar164._4_4_ * 0.6931472 + fVar346) * -2.0;
          auVar119._8_4_ =
               (fVar347 * fVar347 *
                (((((((((fVar347 * 0.070376836 + -0.1151461) * fVar347 + 0.116769984) * fVar347 +
                      -0.12420141) * fVar347 + 0.14249323) * fVar347 + -0.16668057) * fVar347 +
                   0.20000714) * fVar347 + -0.24999994) * fVar347 + 0.3333333) * fVar347 + -0.5) +
               auVar164._8_4_ * 0.6931472 + fVar347) * -2.0;
          auVar119._12_4_ =
               (fVar348 * fVar348 *
                (((((((((fVar348 * 0.070376836 + -0.1151461) * fVar348 + 0.116769984) * fVar348 +
                      -0.12420141) * fVar348 + 0.14249323) * fVar348 + -0.16668057) * fVar348 +
                   0.20000714) * fVar348 + -0.24999994) * fVar348 + 0.3333333) * fVar348 + -0.5) +
               auVar164._12_4_ * 0.6931472 + fVar348) * -2.0;
          auVar47._8_4_ = 0x7fffffff;
          auVar47._0_8_ = 0x7fffffff7fffffff;
          auVar47._12_4_ = 0x7fffffff;
          auVar315 = vblendvps_avx(auVar119,auVar47,auVar315);
          auVar315 = vminps_avx(auVar333,auVar315);
          auVar259 = vmaxps_avx(auVar259,auVar315);
          auVar120._0_4_ = fVar86 * auVar259._0_4_ + 0.5;
          auVar120._4_4_ = fVar111 * auVar259._4_4_ + 0.5;
          auVar120._8_4_ = fVar112 * auVar259._8_4_ + 0.5;
          auVar120._12_4_ = fVar113 * auVar259._12_4_ + 0.5;
          auVar165._0_4_ = (int)auVar120._0_4_;
          auVar165._4_4_ = (int)auVar120._4_4_;
          auVar165._8_4_ = (int)auVar120._8_4_;
          auVar165._12_4_ = (int)auVar120._12_4_;
          auVar333 = vcvtdq2ps_avx(auVar165);
          auVar315 = vcmpps_avx(auVar120,auVar333,1);
          auVar315 = vandps_avx(auVar217,auVar315);
          auVar315 = vsubps_avx(auVar333,auVar315);
          auVar166._0_4_ = auVar315._0_4_ * 0.6931472;
          auVar166._4_4_ = auVar315._4_4_ * 0.6931472;
          auVar166._8_4_ = auVar315._8_4_ * 0.6931472;
          auVar166._12_4_ = auVar315._12_4_ * 0.6931472;
          auVar333 = vsubps_avx(auVar259,auVar166);
          fVar86 = auVar333._0_4_;
          fVar111 = auVar333._4_4_;
          fVar112 = auVar333._8_4_;
          fVar113 = auVar333._12_4_;
          auVar110 = ZEXT1664(CONCAT412(0x7f007f,CONCAT48(0x7f007f,0x7f007f007f007f)));
          auVar352 = ZEXT1664(CONCAT412(0xff81ff81,CONCAT48(0xff81ff81,0xff81ff81ff81ff81)));
          auVar43 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
          auVar121._0_4_ = (int)auVar315._0_4_;
          auVar121._4_4_ = (int)auVar315._4_4_;
          auVar121._8_4_ = (int)auVar315._8_4_;
          auVar121._12_4_ = (int)auVar315._12_4_;
          auVar315 = vpslld_avx(auVar121,0x17);
          auVar315 = vpaddd_avx(auVar217,auVar315);
          auVar90._0_4_ =
               (fVar86 + 1.0 +
               (((((fVar65 * fVar86 + fVar242) * fVar86 + 0.008333452) * fVar86 + 0.041665796) *
                 fVar86 + 0.16666666) * fVar86 + 0.5) * fVar86 * fVar86) * auVar315._0_4_ + 1.0;
          auVar90._4_4_ =
               (fVar111 + 1.0 +
               (((((fVar345 * fVar111 + fVar243) * fVar111 + 0.008333452) * fVar111 + 0.041665796) *
                 fVar111 + 0.16666666) * fVar111 + 0.5) * fVar111 * fVar111) * auVar315._4_4_ + 1.0;
          auVar90._8_4_ =
               (fVar112 + 1.0 +
               (((((fVar208 * fVar112 + fVar244) * fVar112 + 0.008333452) * fVar112 + 0.041665796) *
                 fVar112 + 0.16666666) * fVar112 + 0.5) * fVar112 * fVar112) * auVar315._8_4_ + 1.0;
          auVar90._12_4_ =
               (fVar113 + 1.0 +
               (((((fVar241 * fVar113 + fVar245) * fVar113 + 0.008333452) * fVar113 + 0.041665796) *
                 fVar113 + 0.16666666) * fVar113 + 0.5) * fVar113 * fVar113) * auVar315._12_4_ + 1.0
          ;
          auVar122._8_4_ = 0x40000000;
          auVar122._0_8_ = 0x4000000040000000;
          auVar122._12_4_ = 0x40000000;
          auVar315 = vdivps_avx(auVar122,auVar90);
          auVar91._0_4_ = auVar315._0_4_ + -1.0;
          auVar91._4_4_ = auVar315._4_4_ + -1.0;
          auVar91._8_4_ = auVar315._8_4_ + -1.0;
          auVar91._12_4_ = auVar315._12_4_ + -1.0;
          goto LAB_004a7dce;
        case 6:
          fVar86 = *activation_params->data;
          fVar111 = *(float *)((long)activation_params->data + 4);
          auVar95._0_4_ = auVar248._0_4_ * fVar86 + fVar111;
          auVar95._4_4_ = auVar248._4_4_ * fVar86 + fVar111;
          auVar95._8_4_ = auVar248._8_4_ * fVar86 + fVar111;
          auVar95._12_4_ = auVar248._12_4_ * fVar86 + fVar111;
          auVar315 = vmaxps_avx(auVar95,auVar315);
          auVar91 = vminps_avx(auVar217,auVar315);
LAB_004a7dce:
          auVar248._0_4_ = auVar248._0_4_ * auVar91._0_4_;
          auVar248._4_4_ = auVar248._4_4_ * auVar91._4_4_;
          auVar248._8_4_ = auVar248._8_4_ * auVar91._8_4_;
          auVar248._12_4_ = auVar248._12_4_ * auVar91._12_4_;
        }
        auVar96._0_4_ = auVar248._0_4_ * fVar2;
        auVar96._4_4_ = auVar248._4_4_ * fVar2;
        auVar96._8_4_ = auVar248._8_4_ * fVar2;
        auVar96._12_4_ = auVar248._12_4_ * fVar2;
        auVar315 = vandps_avx(auVar96,auVar43._0_16_);
        auVar315 = vorps_avx(auVar315,auVar39);
        auVar97._0_4_ = (int)(auVar96._0_4_ + auVar315._0_4_);
        auVar97._4_4_ = (int)(auVar96._4_4_ + auVar315._4_4_);
        auVar97._8_4_ = (int)(auVar96._8_4_ + auVar315._8_4_);
        auVar97._12_4_ = (int)(auVar96._12_4_ + auVar315._12_4_);
        auVar315 = vpackssdw_avx(auVar97,auVar97);
        auVar315 = vpminsw_avx(auVar315,auVar110._0_16_);
        auVar315 = vpmaxsw_avx(auVar315,auVar352._0_16_);
        auVar315 = vpacksswb_avx(auVar315,auVar315);
        *(int *)*(undefined1 (*) [16])ptr = auVar315._0_4_;
        intptr = (int *)(*(undefined1 (*) [32])intptr + 0x10);
        ptr = *(undefined1 (*) [16])ptr + 4;
        uVar27 = uVar28 + 4;
        iVar29 = uVar28 + 7;
        uVar28 = uVar27;
      } while (iVar29 < (int)uVar31);
    }
    if (uVar31 - uVar27 != 0 && (int)uVar27 <= (int)uVar31) {
      lVar30 = 0;
      auVar43 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
      auVar110 = ZEXT1664(CONCAT412(0x3effffff,CONCAT48(0x3effffff,0x3effffff3effffff)));
      do {
        fVar86 = fVar1 * (float)*(int *)(*(undefined1 (*) [32])intptr + lVar30 * 4) + fVar87;
        auVar315 = ZEXT416((uint)fVar86);
        fVar111 = fVar86;
        switch(activation_type) {
        case 1:
          auVar315 = vmaxss_avx(auVar315,ZEXT416(0));
          fVar111 = auVar315._0_4_;
          break;
        case 2:
          auVar32._0_12_ = ZEXT812(0);
          auVar32._12_4_ = 0;
          auVar315 = vcmpss_avx(auVar32,auVar315,1);
          auVar49._8_4_ = 0x3f800000;
          auVar49._0_8_ = 0x3f8000003f800000;
          auVar49._12_4_ = 0x3f800000;
          auVar315 = vblendvps_avx(ZEXT416(*activation_params->data),auVar49,auVar315);
          fVar113 = auVar315._0_4_;
LAB_004a7fa6:
          fVar111 = fVar113 * fVar86;
          break;
        case 3:
          fVar86 = *(float *)((long)activation_params->data + 4);
          auVar315 = vmaxss_avx(auVar315,ZEXT416(*activation_params->data));
          fVar111 = auVar315._0_4_;
          if (fVar86 < auVar315._0_4_) {
            fVar111 = fVar86;
          }
          break;
        case 4:
          auVar315 = vminss_avx(auVar315,ZEXT416(0x42b0c0a5));
          auVar40._0_4_ = auVar315._0_4_ ^ auVar43._0_4_;
          auVar40._4_4_ = auVar315._4_4_ ^ auVar43._4_4_;
          auVar40._8_4_ = auVar315._8_4_ ^ auVar43._8_4_;
          auVar40._12_4_ = auVar315._12_4_ ^ auVar43._12_4_;
          auVar315 = vcmpss_avx(auVar315,ZEXT416(0xc2b0c0a5),1);
          auVar48._8_4_ = 0x42b0c0a5;
          auVar48._0_8_ = 0x42b0c0a542b0c0a5;
          auVar48._12_4_ = 0x42b0c0a5;
          auVar315 = vblendvps_avx(auVar40,auVar48,auVar315);
          fVar86 = expf(auVar315._0_4_);
          auVar110 = ZEXT1664(CONCAT412(0x3effffff,CONCAT48(0x3effffff,0x3effffff3effffff)));
          auVar43 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
          fVar111 = 1.0 / (fVar86 + 1.0);
          break;
        case 5:
          fVar111 = expf(fVar86);
          fVar111 = logf(fVar111 + 1.0);
          fVar111 = tanhf(fVar111);
          auVar110 = ZEXT1664(CONCAT412(0x3effffff,CONCAT48(0x3effffff,0x3effffff3effffff)));
          auVar43 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
          fVar111 = fVar111 * fVar86;
          break;
        case 6:
          fVar112 = *activation_params->data;
          fVar113 = *(float *)((long)activation_params->data + 4);
          fVar65 = (float)((uint)fVar113 ^ auVar43._0_4_) / fVar112;
          fVar111 = 0.0;
          if ((fVar65 <= fVar86) && (fVar111 = fVar86, fVar86 <= fVar65 + 1.0 / fVar112)) {
            fVar113 = fVar112 * fVar86 + fVar113;
            goto LAB_004a7fa6;
          }
        }
        auVar315 = vandps_avx(ZEXT416((uint)(fVar111 * fVar2)),auVar43._0_16_);
        auVar315 = vorps_avx(auVar315,auVar110._0_16_);
        auVar315 = ZEXT416((uint)(fVar111 * fVar2 + auVar315._0_4_));
        auVar315 = vroundss_avx(auVar315,auVar315,0xb);
        iVar29 = (int)auVar315._0_4_;
        if (iVar29 < -0x7e) {
          iVar29 = -0x7f;
        }
        uVar26 = (undefined1)iVar29;
        if (0x7e < iVar29) {
          uVar26 = 0x7f;
        }
        (*(undefined1 (*) [16])ptr)[lVar30] = uVar26;
        lVar30 = lVar30 + 1;
      } while (uVar31 - uVar27 != (int)lVar30);
    }
  }
  return;
}

Assistant:

static void requantize(const int* intptr, signed char* ptr, const Mat& scale_in_data, const Mat& bias_data, const Mat& scale_out_data, int activation_type, const Mat& activation_params, int elemcount, int elempack)
{
    const int scale_in_data_size = scale_in_data.w;
    const int bias_data_size = bias_data.w;
    const int scale_out_data_size = scale_out_data.w;
    const int size = elemcount * elempack;

    // NCNN_LOGE("requantize %d %d %d   %d %d", scale_in_data_size, bias_data_size, scale_out_data_size, elemcount, elempack);

    float scale_in = scale_in_data[0];
#if __SSE2__
    __m128 _scale_in0 = _mm_set1_ps(scale_in);
#if __AVX__
    __m256 _scale_in_avx = _mm256_set1_ps(scale_in);
#if __AVX512F__
    __m512 _scale_in_avx512 = _mm512_set1_ps(scale_in);
#endif // __AVX512F__
#else  // __AVX__
    __m128 _scale_in1 = _scale_in0;
#endif // __AVX__
    if (scale_in_data_size > 1)
    {
#if __AVX512F__
        if (elempack == 16)
        {
            _scale_in_avx512 = _mm512_loadu_ps((const float*)scale_in_data);
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
#if __AVX__
            _scale_in_avx = _mm256_loadu_ps((const float*)scale_in_data);
#if __AVX512F__
            _scale_in_avx512 = combine8x2_ps(_scale_in_avx, _scale_in_avx);
#endif // __AVX512F__
#else  // __AVX__
            _scale_in0 = _mm_loadu_ps((const float*)scale_in_data);
            _scale_in1 = _mm_loadu_ps((const float*)scale_in_data + 4);
#endif // __AVX__
        }
    }
#endif // __SSE2__

    float scale_out = scale_out_data[0];
#if __SSE2__
    __m128 _scale_out0 = _mm_set1_ps(scale_out);
#if __AVX__
    __m256 _scale_out_avx = _mm256_set1_ps(scale_out);
#if __AVX512F__
    __m512 _scale_out_avx512 = _mm512_set1_ps(scale_out);
#endif // __AVX512F__
#else  // __AVX__
    __m128 _scale_out1 = _scale_out0;
#endif // __AVX__
    if (scale_out_data_size > 1)
    {
#if __AVX512F__
        if (elempack == 16)
        {
            _scale_out_avx512 = _mm512_loadu_ps((const float*)scale_out_data);
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
#if __AVX__
            _scale_out_avx = _mm256_loadu_ps((const float*)scale_out_data);
#if __AVX512F__
            _scale_out_avx512 = combine8x2_ps(_scale_out_avx, _scale_out_avx);
#endif // __AVX512F__
#else  // __AVX__
            _scale_out0 = _mm_loadu_ps((const float*)scale_out_data);
            _scale_out1 = _mm_loadu_ps((const float*)scale_out_data + 4);
#endif // __AVX__
        }
    }
#endif // __SSE2__

    if (bias_data_size == 0)
    {
        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 15 < size; i += 16)
        {
#if __AVX512F__
            __m512 _v = _mm512_cvtepi32_ps(_mm512_loadu_si512((const __m512i*)intptr));
            _v = _mm512_mul_ps(_v, _scale_in_avx512);
            _v = activation_avx512(_v, activation_type, activation_params);
            _v = _mm512_mul_ps(_v, _scale_out_avx512);
            _mm_storeu_si128((__m128i*)ptr, float2int8_avx512(_v));
#else  // __AVX512F__
            __m256 _v0 = _mm256_cvtepi32_ps(_mm256_loadu_si256((const __m256i*)intptr));
            __m256 _v1 = _mm256_cvtepi32_ps(_mm256_loadu_si256((const __m256i*)(intptr + 8)));
            _v0 = _mm256_mul_ps(_v0, _scale_in_avx);
            _v1 = _mm256_mul_ps(_v1, _scale_in_avx);
            _v0 = activation_avx(_v0, activation_type, activation_params);
            _v1 = activation_avx(_v1, activation_type, activation_params);
            _v0 = _mm256_mul_ps(_v0, _scale_out_avx);
            _v1 = _mm256_mul_ps(_v1, _scale_out_avx);
            _mm_storeu_si128((__m128i*)ptr, float2int8_avx(_v0, _v1));
#endif // __AVX512F__
            intptr += 16;
            ptr += 16;
        }
#endif // __AVX__
        for (; i + 7 < size; i += 8)
        {
#if __AVX__
            __m256 _v = _mm256_cvtepi32_ps(_mm256_loadu_si256((const __m256i*)intptr));
            _v = _mm256_mul_ps(_v, _scale_in_avx);
            _v = activation_avx(_v, activation_type, activation_params);
            _v = _mm256_mul_ps(_v, _scale_out_avx);
            *(int64_t*)ptr = float2int8_avx(_v);
#else  // __AVX__
            __m128 _v0 = _mm_cvtepi32_ps(_mm_loadu_si128((const __m128i*)intptr));
            __m128 _v1 = _mm_cvtepi32_ps(_mm_loadu_si128((const __m128i*)(intptr + 4)));
            _v0 = _mm_mul_ps(_v0, _scale_in0);
            _v1 = _mm_mul_ps(_v1, _scale_in1);
            _v0 = activation_sse(_v0, activation_type, activation_params);
            _v1 = activation_sse(_v1, activation_type, activation_params);
            _v0 = _mm_mul_ps(_v0, _scale_out0);
            _v1 = _mm_mul_ps(_v1, _scale_out1);
            *(int64_t*)ptr = float2int8_sse(_v0, _v1);
#endif // __AVX__
            intptr += 8;
            ptr += 8;
        }
        for (; i + 3 < size; i += 4)
        {
            __m128 _v = _mm_cvtepi32_ps(_mm_loadu_si128((const __m128i*)intptr));
            _v = _mm_mul_ps(_v, _scale_in0);
            _v = activation_sse(_v, activation_type, activation_params);
            _v = _mm_mul_ps(_v, _scale_out0);
            int32_t v = float2int8_sse(_v);
            ptr[0] = (v >> 0) & 0xff;
            ptr[1] = (v >> 8) & 0xff;
            ptr[2] = (v >> 16) & 0xff;
            ptr[3] = (v >> 24) & 0xff;
            intptr += 4;
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            float v = *intptr * scale_in;
            v = activation_ss(v, activation_type, activation_params);
            *ptr = float2int8(v * scale_out);
            intptr++;
            ptr++;
        }
    }
    else
    {
        float bias = bias_data[0];
#if __SSE2__
        __m128 _bias0 = _mm_set1_ps(bias);
#if __AVX__
        __m256 _bias_avx = _mm256_set1_ps(bias);
#if __AVX512F__
        __m512 _bias_avx512 = _mm512_set1_ps(bias);
#endif // __AVX512F__
#else  // __AVX__
        __m128 _bias1 = _bias0;
#endif // __AVX__
        if (bias_data_size > 1)
        {
#if __AVX512F__
            if (elempack == 16)
            {
                _bias_avx512 = _mm512_loadu_ps((const float*)bias_data);
            }
#endif // __AVX512F__
            if (elempack == 8)
            {
#if __AVX__
                _bias_avx = _mm256_loadu_ps((const float*)bias_data);
#if __AVX512F__
                _bias_avx512 = combine8x2_ps(_bias_avx, _bias_avx);
#endif // __AVX512F__
#else  // __AVX__
                _bias0 = _mm_loadu_ps((const float*)bias_data);
                _bias1 = _mm_loadu_ps((const float*)bias_data + 4);
#endif // __AVX__
            }
        }
#endif // __SSE2__

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 15 < size; i += 16)
        {
#if __AVX512F__
            __m512 _v = _mm512_cvtepi32_ps(_mm512_loadu_si512((const __m512i*)intptr));
            _v = _mm512_fmadd_ps(_v, _scale_in_avx512, _bias_avx512);
            _v = activation_avx512(_v, activation_type, activation_params);
            _v = _mm512_mul_ps(_v, _scale_out_avx512);
            _mm_storeu_si128((__m128i*)ptr, float2int8_avx512(_v));
#else  // __AVX512F__
            __m256 _v0 = _mm256_cvtepi32_ps(_mm256_loadu_si256((const __m256i*)intptr));
            __m256 _v1 = _mm256_cvtepi32_ps(_mm256_loadu_si256((const __m256i*)(intptr + 8)));
            _v0 = _mm256_comp_fmadd_ps(_v0, _scale_in_avx, _bias_avx);
            _v1 = _mm256_comp_fmadd_ps(_v1, _scale_in_avx, _bias_avx);
            _v0 = activation_avx(_v0, activation_type, activation_params);
            _v1 = activation_avx(_v1, activation_type, activation_params);
            _v0 = _mm256_mul_ps(_v0, _scale_out_avx);
            _v1 = _mm256_mul_ps(_v1, _scale_out_avx);
            _mm_storeu_si128((__m128i*)ptr, float2int8_avx(_v0, _v1));
#endif // __AVX512F__
            intptr += 16;
            ptr += 16;
        }
#endif // __AVX__
        for (; i + 7 < size; i += 8)
        {
#if __AVX__
            __m256 _v = _mm256_cvtepi32_ps(_mm256_loadu_si256((const __m256i*)intptr));
            _v = _mm256_comp_fmadd_ps(_v, _scale_in_avx, _bias_avx);
            _v = activation_avx(_v, activation_type, activation_params);
            _v = _mm256_mul_ps(_v, _scale_out_avx);
            *(int64_t*)ptr = float2int8_avx(_v);
#else  // __AVX__
            __m128 _v0 = _mm_cvtepi32_ps(_mm_loadu_si128((const __m128i*)intptr));
            __m128 _v1 = _mm_cvtepi32_ps(_mm_loadu_si128((const __m128i*)(intptr + 4)));
            _v0 = _mm_comp_fmadd_ps(_v0, _scale_in0, _bias0);
            _v1 = _mm_comp_fmadd_ps(_v1, _scale_in1, _bias1);
            _v0 = activation_sse(_v0, activation_type, activation_params);
            _v1 = activation_sse(_v1, activation_type, activation_params);
            _v0 = _mm_mul_ps(_v0, _scale_out0);
            _v1 = _mm_mul_ps(_v1, _scale_out1);
            *(int64_t*)ptr = float2int8_sse(_v0, _v1);
#endif // __AVX__
            intptr += 8;
            ptr += 8;
        }
        for (; i + 3 < size; i += 4)
        {
            __m128 _v = _mm_cvtepi32_ps(_mm_loadu_si128((const __m128i*)intptr));
            _v = _mm_comp_fmadd_ps(_v, _scale_in0, _bias0);
            _v = activation_sse(_v, activation_type, activation_params);
            _v = _mm_mul_ps(_v, _scale_out0);
            int32_t v = float2int8_sse(_v);
            ptr[0] = (v >> 0) & 0xff;
            ptr[1] = (v >> 8) & 0xff;
            ptr[2] = (v >> 16) & 0xff;
            ptr[3] = (v >> 24) & 0xff;
            intptr += 4;
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            float v = *intptr * scale_in + bias;
            v = activation_ss(v, activation_type, activation_params);
            *ptr = float2int8(v * scale_out);
            intptr++;
            ptr++;
        }
    }
}